

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [12];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  uint uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  uint uVar105;
  uint uVar106;
  uint uVar107;
  long lVar108;
  undefined4 uVar109;
  undefined8 unaff_R13;
  long lVar110;
  bool bVar111;
  __m128 a;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar147 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar140;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar114 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar144;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar171;
  float fVar172;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar145 [16];
  undefined1 auVar158 [32];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar173;
  undefined1 auVar146 [16];
  undefined1 auVar159 [32];
  float fVar174;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar175;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar195;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar180 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar237;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar235;
  float fVar236;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar241;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar263;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar261;
  float fVar262;
  float fVar264;
  undefined1 auVar257 [64];
  float fVar265;
  float fVar266;
  float fVar280;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar274;
  float fVar277;
  float fVar283;
  float fVar285;
  float fVar289;
  undefined1 auVar270 [32];
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar293;
  float fVar302;
  float fVar303;
  undefined1 auVar294 [16];
  undefined1 auVar295 [28];
  float fVar305;
  float fVar306;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar304;
  float fVar307;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar320;
  float fVar323;
  float fVar329;
  float fVar332;
  float fVar335;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar321;
  float fVar322;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar348;
  float fVar349;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [64];
  float fVar350;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  float fVar367;
  undefined1 auVar368 [16];
  float fVar366;
  float fVar373;
  float fVar375;
  float fVar379;
  float fVar381;
  float fVar383;
  undefined1 auVar369 [32];
  float fVar374;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar380;
  float fVar382;
  float fVar384;
  float fVar385;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [64];
  float fVar386;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [64];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  float fVar407;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar416 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b8c;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  RTCFilterFunctionNArguments local_b18;
  int local_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined8 local_a10;
  float local_a08;
  float local_a04;
  undefined4 local_a00;
  uint local_9fc;
  uint local_9f8;
  uint local_9f4;
  uint local_9f0;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [16];
  Primitive *local_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar19 = prim[1];
  uVar102 = (ulong)(byte)PVar19;
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 4 + 6)));
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 4 + 10)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 5 + 6)));
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 5 + 10)));
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 6 + 6)));
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 6 + 10)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0xf + 6)));
  lVar110 = uVar102 * 0x25;
  auVar368 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0xf + 10)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x11 + 6)));
  _local_8a0 = ZEXT1632(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x11 + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x1a + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x1a + 10)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x1b + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x1b + 10)));
  auVar387._16_16_ = auVar30;
  auVar387._0_16_ = auVar201;
  auVar156._16_16_ = auVar117;
  auVar156._0_16_ = auVar31;
  auVar201 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x1c + 6)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar102 * 0x1c + 10)));
  auVar228._16_16_ = auVar116;
  auVar228._0_16_ = auVar147;
  auVar117 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar110 + 6));
  auVar339._16_16_ = auVar368;
  auVar339._0_16_ = auVar32;
  fVar217 = *(float *)(prim + lVar110 + 0x12);
  local_9e0._4_4_ = fVar217 * auVar117._4_4_;
  local_9e0._0_4_ = fVar217 * auVar117._0_4_;
  fStack_9d8 = fVar217 * auVar117._8_4_;
  fStack_9d4 = fVar217 * auVar117._12_4_;
  auVar147 = _local_9e0;
  _local_9e0 = ZEXT1632(_local_9e0);
  auVar294._0_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar294._4_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar294._8_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar294._12_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar124 = vcvtdq2ps_avx(auVar156);
  auVar163 = vcvtdq2ps_avx(auVar228);
  auVar122._16_16_ = auVar33;
  auVar122._0_16_ = auVar119;
  _local_8c0 = vcvtdq2ps_avx(auVar122);
  auVar123._16_16_ = auVar35;
  auVar123._0_16_ = auVar34;
  auVar26 = vcvtdq2ps_avx(auVar123);
  auVar313._16_16_ = auVar37;
  auVar313._0_16_ = auVar36;
  auVar401._16_16_ = auVar39;
  auVar401._0_16_ = auVar38;
  auVar209._16_16_ = auVar31;
  auVar209._0_16_ = auVar201;
  auVar201 = vshufps_avx(auVar294,auVar294,0x55);
  auVar31 = vshufps_avx(auVar294,auVar294,0xaa);
  fVar238 = auVar31._0_4_;
  fVar283 = auVar31._4_4_;
  fVar239 = auVar31._8_4_;
  fVar285 = auVar31._12_4_;
  fVar236 = auVar201._0_4_;
  fVar277 = auVar201._4_4_;
  fVar237 = auVar201._8_4_;
  fVar280 = auVar201._12_4_;
  auVar119 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar110 + 0x16)) * *(float *)(prim + lVar110 + 0x1a)))
  ;
  _local_9c0 = ZEXT1632(auVar119);
  auVar356 = vcvtdq2ps_avx(auVar387);
  auVar27 = vcvtdq2ps_avx(auVar339);
  auVar213 = vcvtdq2ps_avx(auVar313);
  auVar28 = vcvtdq2ps_avx(auVar401);
  auVar29 = vcvtdq2ps_avx(auVar209);
  auVar201 = vshufps_avx(auVar294,auVar294,0);
  fVar217 = auVar201._0_4_;
  fVar265 = auVar201._4_4_;
  fVar235 = auVar201._8_4_;
  fVar274 = auVar201._12_4_;
  auVar408._0_4_ = auVar356._0_4_ * fVar217 + fVar236 * auVar124._0_4_ + fVar238 * auVar163._0_4_;
  auVar408._4_4_ = auVar356._4_4_ * fVar265 + fVar277 * auVar124._4_4_ + fVar283 * auVar163._4_4_;
  auVar408._8_4_ = auVar356._8_4_ * fVar235 + fVar237 * auVar124._8_4_ + fVar239 * auVar163._8_4_;
  auVar408._12_4_ =
       auVar356._12_4_ * fVar274 + fVar280 * auVar124._12_4_ + fVar285 * auVar163._12_4_;
  auVar408._16_4_ =
       auVar356._16_4_ * fVar217 + fVar236 * auVar124._16_4_ + fVar238 * auVar163._16_4_;
  auVar408._20_4_ =
       auVar356._20_4_ * fVar265 + fVar277 * auVar124._20_4_ + fVar283 * auVar163._20_4_;
  auVar408._24_4_ =
       auVar356._24_4_ * fVar235 + fVar237 * auVar124._24_4_ + fVar239 * auVar163._24_4_;
  auVar408._28_4_ = auVar30._12_4_ + 0.0;
  auVar388._0_4_ = auVar27._0_4_ * fVar217 + fVar238 * auVar26._0_4_ + fVar236 * local_8c0._0_4_;
  auVar388._4_4_ = auVar27._4_4_ * fVar265 + fVar283 * auVar26._4_4_ + fVar277 * local_8c0._4_4_;
  auVar388._8_4_ = auVar27._8_4_ * fVar235 + fVar239 * auVar26._8_4_ + fVar237 * local_8c0._8_4_;
  auVar388._12_4_ = auVar27._12_4_ * fVar274 + fVar285 * auVar26._12_4_ + fVar280 * local_8c0._12_4_
  ;
  auVar388._16_4_ = auVar27._16_4_ * fVar217 + fVar238 * auVar26._16_4_ + fVar236 * local_8c0._16_4_
  ;
  auVar388._20_4_ = auVar27._20_4_ * fVar265 + fVar283 * auVar26._20_4_ + fVar277 * local_8c0._20_4_
  ;
  auVar388._24_4_ = auVar27._24_4_ * fVar235 + fVar239 * auVar26._24_4_ + fVar237 * local_8c0._24_4_
  ;
  auVar388._28_4_ = 0;
  auVar340._0_4_ = fVar236 * auVar28._0_4_ + fVar238 * auVar29._0_4_ + fVar217 * auVar213._0_4_;
  auVar340._4_4_ = fVar277 * auVar28._4_4_ + fVar283 * auVar29._4_4_ + fVar265 * auVar213._4_4_;
  auVar340._8_4_ = fVar237 * auVar28._8_4_ + fVar239 * auVar29._8_4_ + fVar235 * auVar213._8_4_;
  auVar340._12_4_ = fVar280 * auVar28._12_4_ + fVar285 * auVar29._12_4_ + fVar274 * auVar213._12_4_;
  auVar340._16_4_ = fVar236 * auVar28._16_4_ + fVar238 * auVar29._16_4_ + fVar217 * auVar213._16_4_;
  auVar340._20_4_ = fVar277 * auVar28._20_4_ + fVar283 * auVar29._20_4_ + fVar265 * auVar213._20_4_;
  auVar340._24_4_ = fVar237 * auVar28._24_4_ + fVar239 * auVar29._24_4_ + fVar235 * auVar213._24_4_;
  auVar340._28_4_ = auVar30._12_4_ + auVar368._12_4_ + 0.0;
  auVar201 = vshufps_avx(auVar147,auVar147,0x55);
  auVar30 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar236 = auVar30._0_4_;
  fVar277 = auVar30._4_4_;
  fVar237 = auVar30._8_4_;
  fVar280 = auVar30._12_4_;
  fVar238 = auVar201._0_4_;
  fVar283 = auVar201._4_4_;
  fVar239 = auVar201._8_4_;
  fVar285 = auVar201._12_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + uVar102 * 7 + 6);
  auVar201 = vpmovsxwd_avx(auVar201);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar102 * 7 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar31 = vpmovsxwd_avx(auVar31);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 0xe);
  auVar117 = vpmovsxwd_avx(auVar117);
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  fVar217 = auVar147._0_4_;
  fVar265 = auVar147._4_4_;
  fVar235 = auVar147._8_4_;
  fVar274 = auVar147._12_4_;
  auVar184._0_4_ = auVar356._0_4_ * fVar217 + fVar238 * auVar124._0_4_ + fVar236 * auVar163._0_4_;
  auVar184._4_4_ = auVar356._4_4_ * fVar265 + fVar283 * auVar124._4_4_ + fVar277 * auVar163._4_4_;
  auVar184._8_4_ = auVar356._8_4_ * fVar235 + fVar239 * auVar124._8_4_ + fVar237 * auVar163._8_4_;
  auVar184._12_4_ =
       auVar356._12_4_ * fVar274 + fVar285 * auVar124._12_4_ + fVar280 * auVar163._12_4_;
  auVar184._16_4_ =
       auVar356._16_4_ * fVar217 + fVar238 * auVar124._16_4_ + fVar236 * auVar163._16_4_;
  auVar184._20_4_ =
       auVar356._20_4_ * fVar265 + fVar283 * auVar124._20_4_ + fVar277 * auVar163._20_4_;
  auVar184._24_4_ =
       auVar356._24_4_ * fVar235 + fVar239 * auVar124._24_4_ + fVar237 * auVar163._24_4_;
  auVar184._28_4_ = fVar285 + fVar280 + auVar163._28_4_;
  auVar157._0_4_ = auVar27._0_4_ * fVar217 + fVar238 * local_8c0._0_4_ + fVar236 * auVar26._0_4_;
  auVar157._4_4_ = auVar27._4_4_ * fVar265 + fVar283 * local_8c0._4_4_ + fVar277 * auVar26._4_4_;
  auVar157._8_4_ = auVar27._8_4_ * fVar235 + fVar239 * local_8c0._8_4_ + fVar237 * auVar26._8_4_;
  auVar157._12_4_ = auVar27._12_4_ * fVar274 + fVar285 * local_8c0._12_4_ + fVar280 * auVar26._12_4_
  ;
  auVar157._16_4_ = auVar27._16_4_ * fVar217 + fVar238 * local_8c0._16_4_ + fVar236 * auVar26._16_4_
  ;
  auVar157._20_4_ = auVar27._20_4_ * fVar265 + fVar283 * local_8c0._20_4_ + fVar277 * auVar26._20_4_
  ;
  auVar157._24_4_ = auVar27._24_4_ * fVar235 + fVar239 * local_8c0._24_4_ + fVar237 * auVar26._24_4_
  ;
  auVar157._28_4_ = fVar285 + auVar39._12_4_ + auVar26._28_4_;
  auVar270._8_4_ = 0x7fffffff;
  auVar270._0_8_ = 0x7fffffff7fffffff;
  auVar270._12_4_ = 0x7fffffff;
  auVar270._16_4_ = 0x7fffffff;
  auVar270._20_4_ = 0x7fffffff;
  auVar270._24_4_ = 0x7fffffff;
  auVar270._28_4_ = 0x7fffffff;
  auVar369._0_4_ = auVar28._0_4_ * fVar238 + fVar236 * auVar29._0_4_ + fVar217 * auVar213._0_4_;
  auVar369._4_4_ = auVar28._4_4_ * fVar283 + fVar277 * auVar29._4_4_ + fVar265 * auVar213._4_4_;
  auVar369._8_4_ = auVar28._8_4_ * fVar239 + fVar237 * auVar29._8_4_ + fVar235 * auVar213._8_4_;
  auVar369._12_4_ = auVar28._12_4_ * fVar285 + fVar280 * auVar29._12_4_ + fVar274 * auVar213._12_4_;
  auVar369._16_4_ = auVar28._16_4_ * fVar238 + fVar236 * auVar29._16_4_ + fVar217 * auVar213._16_4_;
  auVar369._20_4_ = auVar28._20_4_ * fVar283 + fVar277 * auVar29._20_4_ + fVar265 * auVar213._20_4_;
  auVar369._24_4_ = auVar28._24_4_ * fVar239 + fVar237 * auVar29._24_4_ + fVar235 * auVar213._24_4_;
  auVar369._28_4_ = fVar285 + auVar29._28_4_ + fVar274;
  auVar124 = vandps_avx(auVar408,auVar270);
  auVar314._8_4_ = 0x219392ef;
  auVar314._0_8_ = 0x219392ef219392ef;
  auVar314._12_4_ = 0x219392ef;
  auVar314._16_4_ = 0x219392ef;
  auVar314._20_4_ = 0x219392ef;
  auVar314._24_4_ = 0x219392ef;
  auVar314._28_4_ = 0x219392ef;
  auVar124 = vcmpps_avx(auVar124,auVar314,1);
  auVar163 = vblendvps_avx(auVar408,auVar314,auVar124);
  auVar124 = vandps_avx(auVar388,auVar270);
  auVar124 = vcmpps_avx(auVar124,auVar314,1);
  auVar26 = vblendvps_avx(auVar388,auVar314,auVar124);
  auVar124 = vandps_avx(auVar340,auVar270);
  auVar124 = vcmpps_avx(auVar124,auVar314,1);
  auVar356 = vrcpps_avx(auVar163);
  auVar124 = vblendvps_avx(auVar340,auVar314,auVar124);
  auVar341._8_4_ = 0x3f800000;
  auVar341._0_8_ = 0x3f8000003f800000;
  auVar341._12_4_ = 0x3f800000;
  auVar341._16_4_ = 0x3f800000;
  auVar341._20_4_ = 0x3f800000;
  auVar341._24_4_ = 0x3f800000;
  auVar341._28_4_ = 0x3f800000;
  fVar217 = auVar356._0_4_;
  fVar235 = auVar356._4_4_;
  auVar27._4_4_ = auVar163._4_4_ * fVar235;
  auVar27._0_4_ = auVar163._0_4_ * fVar217;
  fVar236 = auVar356._8_4_;
  auVar27._8_4_ = auVar163._8_4_ * fVar236;
  fVar237 = auVar356._12_4_;
  auVar27._12_4_ = auVar163._12_4_ * fVar237;
  fVar238 = auVar356._16_4_;
  auVar27._16_4_ = auVar163._16_4_ * fVar238;
  fVar239 = auVar356._20_4_;
  auVar27._20_4_ = auVar163._20_4_ * fVar239;
  fVar240 = auVar356._24_4_;
  auVar27._24_4_ = auVar163._24_4_ * fVar240;
  auVar27._28_4_ = auVar163._28_4_;
  auVar213 = vsubps_avx(auVar341,auVar27);
  fVar217 = fVar217 + fVar217 * auVar213._0_4_;
  fVar235 = fVar235 + fVar235 * auVar213._4_4_;
  fVar236 = fVar236 + fVar236 * auVar213._8_4_;
  fVar237 = fVar237 + fVar237 * auVar213._12_4_;
  fVar238 = fVar238 + fVar238 * auVar213._16_4_;
  fVar239 = fVar239 + fVar239 * auVar213._20_4_;
  fVar240 = fVar240 + fVar240 * auVar213._24_4_;
  auVar27 = vrcpps_avx(auVar26);
  fVar241 = auVar27._0_4_;
  fVar258 = auVar27._4_4_;
  auVar163._4_4_ = fVar258 * auVar26._4_4_;
  auVar163._0_4_ = fVar241 * auVar26._0_4_;
  fVar259 = auVar27._8_4_;
  auVar163._8_4_ = fVar259 * auVar26._8_4_;
  fVar260 = auVar27._12_4_;
  auVar163._12_4_ = fVar260 * auVar26._12_4_;
  fVar261 = auVar27._16_4_;
  auVar163._16_4_ = fVar261 * auVar26._16_4_;
  fVar262 = auVar27._20_4_;
  auVar163._20_4_ = fVar262 * auVar26._20_4_;
  fVar264 = auVar27._24_4_;
  auVar163._24_4_ = fVar264 * auVar26._24_4_;
  auVar163._28_4_ = auVar26._28_4_;
  auVar26 = vsubps_avx(auVar341,auVar163);
  auVar163 = vrcpps_avx(auVar124);
  fVar241 = fVar241 + fVar241 * auVar26._0_4_;
  fVar258 = fVar258 + fVar258 * auVar26._4_4_;
  fVar259 = fVar259 + fVar259 * auVar26._8_4_;
  fVar260 = fVar260 + fVar260 * auVar26._12_4_;
  fVar261 = fVar261 + fVar261 * auVar26._16_4_;
  fVar262 = fVar262 + fVar262 * auVar26._20_4_;
  fVar264 = fVar264 + fVar264 * auVar26._24_4_;
  fVar265 = auVar163._0_4_;
  fVar274 = auVar163._4_4_;
  auVar28._4_4_ = auVar124._4_4_ * fVar274;
  auVar28._0_4_ = auVar124._0_4_ * fVar265;
  fVar277 = auVar163._8_4_;
  auVar28._8_4_ = auVar124._8_4_ * fVar277;
  fVar280 = auVar163._12_4_;
  auVar28._12_4_ = auVar124._12_4_ * fVar280;
  fVar283 = auVar163._16_4_;
  auVar28._16_4_ = auVar124._16_4_ * fVar283;
  fVar285 = auVar163._20_4_;
  auVar28._20_4_ = auVar124._20_4_ * fVar285;
  fVar289 = auVar163._24_4_;
  auVar28._24_4_ = auVar124._24_4_ * fVar289;
  auVar28._28_4_ = auVar27._28_4_;
  auVar124 = vsubps_avx(auVar341,auVar28);
  fVar265 = fVar265 + fVar265 * auVar124._0_4_;
  fVar274 = fVar274 + fVar274 * auVar124._4_4_;
  fVar277 = fVar277 + fVar277 * auVar124._8_4_;
  fVar280 = fVar280 + fVar280 * auVar124._12_4_;
  fVar283 = fVar283 + fVar283 * auVar124._16_4_;
  fVar285 = fVar285 + fVar285 * auVar124._20_4_;
  fVar289 = fVar289 + fVar289 * auVar124._24_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar102 * 9 + 6);
  auVar147 = vpmovsxwd_avx(auVar147);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar102 * 9 + 0xe);
  auVar116 = vpmovsxwd_avx(auVar116);
  auVar124._16_16_ = auVar30;
  auVar124._0_16_ = auVar201;
  auVar296._16_16_ = auVar117;
  auVar296._0_16_ = auVar31;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar102 * 0xd + 6);
  auVar201 = vpmovsxwd_avx(auVar32);
  auVar368._8_8_ = 0;
  auVar368._0_8_ = *(ulong *)(prim + uVar102 * 0xd + 0xe);
  auVar30 = vpmovsxwd_avx(auVar368);
  auVar31 = vpermilps_avx(auVar119,0);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar163 = vcvtdq2ps_avx(auVar296);
  auVar163 = vsubps_avx(auVar163,auVar124);
  fVar275 = auVar31._0_4_;
  fVar278 = auVar31._4_4_;
  fVar263 = auVar31._8_4_;
  fVar281 = auVar31._12_4_;
  auVar297._0_4_ = auVar124._0_4_ + fVar275 * auVar163._0_4_;
  auVar297._4_4_ = auVar124._4_4_ + fVar278 * auVar163._4_4_;
  auVar297._8_4_ = auVar124._8_4_ + fVar263 * auVar163._8_4_;
  auVar297._12_4_ = auVar124._12_4_ + fVar281 * auVar163._12_4_;
  auVar297._16_4_ = auVar124._16_4_ + fVar275 * auVar163._16_4_;
  auVar297._20_4_ = auVar124._20_4_ + fVar278 * auVar163._20_4_;
  auVar297._24_4_ = auVar124._24_4_ + fVar263 * auVar163._24_4_;
  auVar297._28_4_ = auVar124._28_4_ + auVar163._28_4_;
  auVar125._16_16_ = auVar116;
  auVar125._0_16_ = auVar147;
  auVar124 = vcvtdq2ps_avx(auVar125);
  auVar315._16_16_ = auVar30;
  auVar315._0_16_ = auVar201;
  auVar163 = vcvtdq2ps_avx(auVar315);
  auVar163 = vsubps_avx(auVar163,auVar124);
  auVar316._0_4_ = auVar163._0_4_ * fVar275 + auVar124._0_4_;
  auVar316._4_4_ = auVar163._4_4_ * fVar278 + auVar124._4_4_;
  auVar316._8_4_ = auVar163._8_4_ * fVar263 + auVar124._8_4_;
  auVar316._12_4_ = auVar163._12_4_ * fVar281 + auVar124._12_4_;
  auVar316._16_4_ = auVar163._16_4_ * fVar275 + auVar124._16_4_;
  auVar316._20_4_ = auVar163._20_4_ * fVar278 + auVar124._20_4_;
  auVar316._24_4_ = auVar163._24_4_ * fVar263 + auVar124._24_4_;
  auVar316._28_4_ = auVar163._28_4_ + auVar124._28_4_;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar102 * 0x12 + 6);
  auVar201 = vpmovsxwd_avx(auVar119);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar102 * 0x12 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar33);
  auVar126._16_16_ = auVar30;
  auVar126._0_16_ = auVar201;
  auVar124 = vcvtdq2ps_avx(auVar126);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar102 * 0x16 + 6);
  auVar201 = vpmovsxwd_avx(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar102 * 0x16 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar35);
  auVar342._16_16_ = auVar30;
  auVar342._0_16_ = auVar201;
  auVar163 = vcvtdq2ps_avx(auVar342);
  auVar163 = vsubps_avx(auVar163,auVar124);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar102 * 0x14 + 6);
  auVar201 = vpmovsxwd_avx(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar102 * 0x14 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar37);
  auVar343._0_4_ = auVar163._0_4_ * fVar275 + auVar124._0_4_;
  auVar343._4_4_ = auVar163._4_4_ * fVar278 + auVar124._4_4_;
  auVar343._8_4_ = auVar163._8_4_ * fVar263 + auVar124._8_4_;
  auVar343._12_4_ = auVar163._12_4_ * fVar281 + auVar124._12_4_;
  auVar343._16_4_ = auVar163._16_4_ * fVar275 + auVar124._16_4_;
  auVar343._20_4_ = auVar163._20_4_ * fVar278 + auVar124._20_4_;
  auVar343._24_4_ = auVar163._24_4_ * fVar263 + auVar124._24_4_;
  auVar343._28_4_ = auVar163._28_4_ + auVar124._28_4_;
  auVar127._16_16_ = auVar30;
  auVar127._0_16_ = auVar201;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar102 * 0x18 + 6);
  auVar201 = vpmovsxwd_avx(auVar38);
  auVar124 = vcvtdq2ps_avx(auVar127);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar102 * 0x18 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar39);
  auVar351._16_16_ = auVar30;
  auVar351._0_16_ = auVar201;
  auVar163 = vcvtdq2ps_avx(auVar351);
  auVar163 = vsubps_avx(auVar163,auVar124);
  auVar352._0_4_ = auVar163._0_4_ * fVar275 + auVar124._0_4_;
  auVar352._4_4_ = auVar163._4_4_ * fVar278 + auVar124._4_4_;
  auVar352._8_4_ = auVar163._8_4_ * fVar263 + auVar124._8_4_;
  auVar352._12_4_ = auVar163._12_4_ * fVar281 + auVar124._12_4_;
  auVar352._16_4_ = auVar163._16_4_ * fVar275 + auVar124._16_4_;
  auVar352._20_4_ = auVar163._20_4_ * fVar278 + auVar124._20_4_;
  auVar352._24_4_ = auVar163._24_4_ * fVar263 + auVar124._24_4_;
  auVar352._28_4_ = auVar163._28_4_ + auVar124._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar102 * 0x1d + 6);
  auVar201 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar102 * 0x1d + 0xe);
  auVar30 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar102 * 0x21 + 6);
  auVar31 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar102 * 0x21 + 0xe);
  auVar117 = vpmovsxwd_avx(auVar14);
  auVar128._16_16_ = auVar30;
  auVar128._0_16_ = auVar201;
  auVar389._16_16_ = auVar117;
  auVar389._0_16_ = auVar31;
  auVar124 = vcvtdq2ps_avx(auVar128);
  auVar163 = vcvtdq2ps_avx(auVar389);
  auVar163 = vsubps_avx(auVar163,auVar124);
  auVar129._0_4_ = auVar163._0_4_ * fVar275 + auVar124._0_4_;
  auVar129._4_4_ = auVar163._4_4_ * fVar278 + auVar124._4_4_;
  auVar129._8_4_ = auVar163._8_4_ * fVar263 + auVar124._8_4_;
  auVar129._12_4_ = auVar163._12_4_ * fVar281 + auVar124._12_4_;
  auVar129._16_4_ = auVar163._16_4_ * fVar275 + auVar124._16_4_;
  auVar129._20_4_ = auVar163._20_4_ * fVar278 + auVar124._20_4_;
  auVar129._24_4_ = auVar163._24_4_ * fVar263 + auVar124._24_4_;
  auVar129._28_4_ = auVar163._28_4_ + auVar124._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar102 * 0x1f + 6);
  auVar201 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar102 * 0x1f + 0xe);
  auVar30 = vpmovsxwd_avx(auVar16);
  auVar390._16_16_ = auVar30;
  auVar390._0_16_ = auVar201;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar102 * 0x23 + 6);
  auVar201 = vpmovsxwd_avx(auVar17);
  local_868 = prim;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar102 * 0x23 + 0xe);
  auVar30 = vpmovsxwd_avx(auVar18);
  auVar402._16_16_ = auVar30;
  auVar402._0_16_ = auVar201;
  auVar124 = vcvtdq2ps_avx(auVar390);
  auVar163 = vcvtdq2ps_avx(auVar402);
  auVar163 = vsubps_avx(auVar163,auVar124);
  auVar391._0_4_ = auVar124._0_4_ + auVar163._0_4_ * fVar275;
  auVar391._4_4_ = auVar124._4_4_ + auVar163._4_4_ * fVar278;
  auVar391._8_4_ = auVar124._8_4_ + auVar163._8_4_ * fVar263;
  auVar391._12_4_ = auVar124._12_4_ + auVar163._12_4_ * fVar281;
  auVar391._16_4_ = auVar124._16_4_ + auVar163._16_4_ * fVar275;
  auVar391._20_4_ = auVar124._20_4_ + auVar163._20_4_ * fVar278;
  auVar391._24_4_ = auVar124._24_4_ + auVar163._24_4_ * fVar263;
  auVar391._28_4_ = auVar124._28_4_ + fVar281;
  auVar124 = vsubps_avx(auVar297,auVar184);
  auVar196._0_4_ = fVar217 * auVar124._0_4_;
  auVar196._4_4_ = fVar235 * auVar124._4_4_;
  auVar196._8_4_ = fVar236 * auVar124._8_4_;
  auVar196._12_4_ = fVar237 * auVar124._12_4_;
  auVar29._16_4_ = fVar238 * auVar124._16_4_;
  auVar29._0_16_ = auVar196;
  auVar29._20_4_ = fVar239 * auVar124._20_4_;
  auVar29._24_4_ = fVar240 * auVar124._24_4_;
  auVar29._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar316,auVar184);
  auVar218._0_4_ = fVar217 * auVar124._0_4_;
  auVar218._4_4_ = fVar235 * auVar124._4_4_;
  auVar218._8_4_ = fVar236 * auVar124._8_4_;
  auVar218._12_4_ = fVar237 * auVar124._12_4_;
  auVar355._16_4_ = fVar238 * auVar124._16_4_;
  auVar355._0_16_ = auVar218;
  auVar355._20_4_ = fVar239 * auVar124._20_4_;
  auVar355._24_4_ = fVar240 * auVar124._24_4_;
  auVar355._28_4_ = auVar356._28_4_ + auVar213._28_4_;
  auVar124 = vsubps_avx(auVar343,auVar157);
  auVar176._0_4_ = fVar241 * auVar124._0_4_;
  auVar176._4_4_ = fVar258 * auVar124._4_4_;
  auVar176._8_4_ = fVar259 * auVar124._8_4_;
  auVar176._12_4_ = fVar260 * auVar124._12_4_;
  auVar356._16_4_ = fVar261 * auVar124._16_4_;
  auVar356._0_16_ = auVar176;
  auVar356._20_4_ = fVar262 * auVar124._20_4_;
  auVar356._24_4_ = fVar264 * auVar124._24_4_;
  auVar356._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar352,auVar157);
  auVar242._0_4_ = fVar241 * auVar124._0_4_;
  auVar242._4_4_ = fVar258 * auVar124._4_4_;
  auVar242._8_4_ = fVar259 * auVar124._8_4_;
  auVar242._12_4_ = fVar260 * auVar124._12_4_;
  auVar213._16_4_ = fVar261 * auVar124._16_4_;
  auVar213._0_16_ = auVar242;
  auVar213._20_4_ = fVar262 * auVar124._20_4_;
  auVar213._24_4_ = fVar264 * auVar124._24_4_;
  auVar213._28_4_ = auVar27._28_4_ + auVar26._28_4_;
  auVar163 = vsubps_avx(auVar129,auVar369);
  auVar145._0_4_ = fVar265 * auVar163._0_4_;
  auVar145._4_4_ = fVar274 * auVar163._4_4_;
  auVar145._8_4_ = fVar277 * auVar163._8_4_;
  auVar145._12_4_ = fVar280 * auVar163._12_4_;
  auVar26._16_4_ = fVar283 * auVar163._16_4_;
  auVar26._0_16_ = auVar145;
  auVar26._20_4_ = fVar285 * auVar163._20_4_;
  auVar26._24_4_ = fVar289 * auVar163._24_4_;
  auVar26._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar391,auVar369);
  auVar112._0_4_ = fVar265 * auVar124._0_4_;
  auVar112._4_4_ = fVar274 * auVar124._4_4_;
  auVar112._8_4_ = fVar277 * auVar124._8_4_;
  auVar112._12_4_ = fVar280 * auVar124._12_4_;
  auVar40._16_4_ = fVar283 * auVar124._16_4_;
  auVar40._0_16_ = auVar112;
  auVar40._20_4_ = fVar285 * auVar124._20_4_;
  auVar40._24_4_ = fVar289 * auVar124._24_4_;
  auVar40._28_4_ = auVar124._28_4_;
  auVar201 = vpminsd_avx(auVar29._16_16_,auVar355._16_16_);
  auVar30 = vpminsd_avx(auVar196,auVar218);
  auVar317._16_16_ = auVar201;
  auVar317._0_16_ = auVar30;
  auVar201 = vpminsd_avx(auVar356._16_16_,auVar213._16_16_);
  auVar30 = vpminsd_avx(auVar176,auVar242);
  auVar344._16_16_ = auVar201;
  auVar344._0_16_ = auVar30;
  auVar124 = vmaxps_avx(auVar317,auVar344);
  auVar201 = vpminsd_avx(auVar26._16_16_,auVar40._16_16_);
  auVar30 = vpminsd_avx(auVar145,auVar112);
  auVar403._16_16_ = auVar201;
  auVar403._0_16_ = auVar30;
  uVar109 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar409._4_4_ = uVar109;
  auVar409._0_4_ = uVar109;
  auVar409._8_4_ = uVar109;
  auVar409._12_4_ = uVar109;
  auVar409._16_4_ = uVar109;
  auVar409._20_4_ = uVar109;
  auVar409._24_4_ = uVar109;
  auVar409._28_4_ = uVar109;
  auVar163 = vmaxps_avx(auVar403,auVar409);
  auVar124 = vmaxps_avx(auVar124,auVar163);
  local_360._4_4_ = auVar124._4_4_ * 0.99999964;
  local_360._0_4_ = auVar124._0_4_ * 0.99999964;
  local_360._8_4_ = auVar124._8_4_ * 0.99999964;
  local_360._12_4_ = auVar124._12_4_ * 0.99999964;
  local_360._16_4_ = auVar124._16_4_ * 0.99999964;
  local_360._20_4_ = auVar124._20_4_ * 0.99999964;
  local_360._24_4_ = auVar124._24_4_ * 0.99999964;
  local_360._28_4_ = auVar124._28_4_;
  auVar394 = ZEXT3264(local_360);
  auVar201 = vpmaxsd_avx(auVar29._16_16_,auVar355._16_16_);
  auVar359 = ZEXT1664(auVar201);
  auVar372 = ZEXT464((uint)(byte)PVar19);
  auVar30 = vpmaxsd_avx(auVar196,auVar218);
  auVar210._16_16_ = auVar201;
  auVar210._0_16_ = auVar30;
  auVar201 = vpmaxsd_avx(auVar356._16_16_,auVar213._16_16_);
  auVar30 = vpmaxsd_avx(auVar176,auVar242);
  auVar185._16_16_ = auVar201;
  auVar185._0_16_ = auVar30;
  auVar124 = vminps_avx(auVar210,auVar185);
  auVar201 = vpmaxsd_avx(auVar26._16_16_,auVar40._16_16_);
  auVar30 = vpmaxsd_avx(auVar145,auVar112);
  auVar130._16_16_ = auVar201;
  auVar130._0_16_ = auVar30;
  fVar217 = (ray->super_RayK<1>).tfar;
  auVar158._4_4_ = fVar217;
  auVar158._0_4_ = fVar217;
  auVar158._8_4_ = fVar217;
  auVar158._12_4_ = fVar217;
  auVar158._16_4_ = fVar217;
  auVar158._20_4_ = fVar217;
  auVar158._24_4_ = fVar217;
  auVar158._28_4_ = fVar217;
  auVar163 = vminps_avx(auVar130,auVar158);
  auVar124 = vminps_avx(auVar124,auVar163);
  auVar41._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar41._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar41._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar41._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar41._16_4_ = auVar124._16_4_ * 1.0000004;
  auVar41._20_4_ = auVar124._20_4_ * 1.0000004;
  auVar41._24_4_ = auVar124._24_4_ * 1.0000004;
  auVar41._28_4_ = auVar124._28_4_;
  auVar124 = vcmpps_avx(local_360,auVar41,2);
  auVar201 = vpshufd_avx(ZEXT416((uint)(byte)PVar19),0);
  auVar159._16_16_ = auVar201;
  auVar159._0_16_ = auVar201;
  auVar163 = vcvtdq2ps_avx(auVar159);
  auVar163 = vcmpps_avx(_DAT_01f7b060,auVar163,1);
  auVar124 = vandps_avx(auVar124,auVar163);
  uVar109 = vmovmskps_avx(auVar124);
  uVar102 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar109);
  auVar131._16_16_ = mm_lookupmask_ps._240_16_;
  auVar131._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
LAB_00ac87d5:
  if (uVar102 == 0) {
    return;
  }
  lVar110 = 0;
  if (uVar102 != 0) {
    for (; (uVar102 >> lVar110 & 1) == 0; lVar110 = lVar110 + 1) {
    }
  }
  uVar106 = *(uint *)(local_868 + 2);
  pGVar20 = (context->scene->geometries).items[uVar106].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                            (ulong)*(uint *)(local_868 + lVar110 * 4 + 6) *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar217 = (pGVar20->time_range).lower;
  fVar217 = pGVar20->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar217) /
            ((pGVar20->time_range).upper - fVar217));
  auVar201 = vroundss_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),9);
  auVar201 = vminss_avx(auVar201,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
  auVar201 = vmaxss_avx(ZEXT816(0) << 0x20,auVar201);
  fVar217 = fVar217 - auVar201._0_4_;
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar108 = (long)(int)auVar201._0_4_ * 0x38;
  lVar22 = *(long *)(_Var21 + 0x10 + lVar108);
  lVar23 = *(long *)(_Var21 + 0x38 + lVar108);
  lVar24 = *(long *)(_Var21 + 0x48 + lVar108);
  auVar201 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
  pfVar1 = (float *)(lVar23 + uVar103 * lVar24);
  fVar236 = auVar201._0_4_;
  fVar277 = auVar201._4_4_;
  fVar237 = auVar201._8_4_;
  fVar280 = auVar201._12_4_;
  pfVar2 = (float *)(lVar23 + (uVar103 + 1) * lVar24);
  pfVar3 = (float *)(lVar23 + (uVar103 + 2) * lVar24);
  pfVar4 = (float *)(lVar23 + lVar24 * (uVar103 + 3));
  lVar23 = *(long *)(_Var21 + lVar108);
  auVar201 = vshufps_avx(ZEXT416((uint)(1.0 - fVar217)),ZEXT416((uint)(1.0 - fVar217)),0);
  pfVar5 = (float *)(lVar23 + lVar22 * uVar103);
  fVar217 = auVar201._0_4_;
  fVar265 = auVar201._4_4_;
  fVar235 = auVar201._8_4_;
  fVar274 = auVar201._12_4_;
  pfVar6 = (float *)(lVar23 + lVar22 * (uVar103 + 1));
  pfVar7 = (float *)(lVar23 + lVar22 * (uVar103 + 2));
  auVar177._0_4_ = fVar236 * *pfVar1 + fVar217 * *pfVar5;
  auVar177._4_4_ = fVar277 * pfVar1[1] + fVar265 * pfVar5[1];
  auVar177._8_4_ = fVar237 * pfVar1[2] + fVar235 * pfVar5[2];
  auVar177._12_4_ = fVar280 * pfVar1[3] + fVar274 * pfVar5[3];
  auVar197._0_4_ = fVar217 * *pfVar6 + fVar236 * *pfVar2;
  auVar197._4_4_ = fVar265 * pfVar6[1] + fVar277 * pfVar2[1];
  auVar197._8_4_ = fVar235 * pfVar6[2] + fVar237 * pfVar2[2];
  auVar197._12_4_ = fVar274 * pfVar6[3] + fVar280 * pfVar2[3];
  auVar219._0_4_ = fVar217 * *pfVar7 + fVar236 * *pfVar3;
  auVar219._4_4_ = fVar265 * pfVar7[1] + fVar277 * pfVar3[1];
  auVar219._8_4_ = fVar235 * pfVar7[2] + fVar237 * pfVar3[2];
  auVar219._12_4_ = fVar274 * pfVar7[3] + fVar280 * pfVar3[3];
  pfVar1 = (float *)(lVar23 + lVar22 * (uVar103 + 3));
  auVar243._0_4_ = fVar217 * *pfVar1 + fVar236 * *pfVar4;
  auVar243._4_4_ = fVar265 * pfVar1[1] + fVar277 * pfVar4[1];
  auVar243._8_4_ = fVar235 * pfVar1[2] + fVar237 * pfVar4[2];
  auVar243._12_4_ = fVar274 * pfVar1[3] + fVar280 * pfVar4[3];
  auVar113._0_4_ = (auVar177._0_4_ + auVar197._0_4_ + auVar219._0_4_ + auVar243._0_4_) * 0.25;
  auVar113._4_4_ = (auVar177._4_4_ + auVar197._4_4_ + auVar219._4_4_ + auVar243._4_4_) * 0.25;
  auVar113._8_4_ = (auVar177._8_4_ + auVar197._8_4_ + auVar219._8_4_ + auVar243._8_4_) * 0.25;
  auVar113._12_4_ = (auVar177._12_4_ + auVar197._12_4_ + auVar219._12_4_ + auVar243._12_4_) * 0.25;
  aVar9 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar201 = vsubps_avx(auVar113,(undefined1  [16])aVar9);
  auVar201 = vdpps_avx(auVar201,(undefined1  [16])aVar10,0x7f);
  auVar30 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar31 = vrcpss_avx(auVar30,auVar30);
  auVar347 = ZEXT464(0x40000000);
  fVar217 = auVar201._0_4_ * auVar31._0_4_ * (2.0 - auVar31._0_4_ * auVar30._0_4_);
  local_880 = ZEXT416((uint)fVar217);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
  fVar217 = aVar10.x;
  fVar265 = aVar10.y;
  fVar235 = aVar10.z;
  aVar173 = aVar10.field_3;
  auVar267._0_4_ = aVar9.x + fVar217 * auVar30._0_4_;
  auVar267._4_4_ = aVar9.y + fVar265 * auVar30._4_4_;
  auVar267._8_4_ = aVar9.z + fVar235 * auVar30._8_4_;
  auVar267._12_4_ = aVar9.field_3.w + aVar173.w * auVar30._12_4_;
  auVar201 = vblendps_avx(auVar267,_DAT_01f45a50,8);
  auVar31 = vsubps_avx(auVar177,auVar201);
  auVar301 = ZEXT1664(auVar31);
  auVar147 = vsubps_avx(auVar219,auVar201);
  auVar117 = vsubps_avx(auVar197,auVar201);
  auVar116 = vsubps_avx(auVar243,auVar201);
  auVar257 = ZEXT1664(auVar116);
  auVar201 = vshufps_avx(auVar31,auVar31,0);
  local_a60._16_16_ = auVar201;
  local_a60._0_16_ = auVar201;
  auVar416 = ZEXT3264(local_a60);
  auVar201 = vshufps_avx(auVar31,auVar31,0x55);
  register0x00001290 = auVar201;
  _local_1e0 = auVar201;
  auVar201 = vshufps_avx(auVar31,auVar31,0xaa);
  register0x00001290 = auVar201;
  _local_200 = auVar201;
  _local_9c0 = auVar31;
  auVar201 = vshufps_avx(auVar31,auVar31,0xff);
  register0x00001290 = auVar201;
  _local_220 = auVar201;
  auVar201 = vshufps_avx(auVar117,auVar117,0);
  register0x00001290 = auVar201;
  _local_240 = auVar201;
  auVar201 = vshufps_avx(auVar117,auVar117,0x55);
  register0x00001290 = auVar201;
  _local_260 = auVar201;
  auVar201 = vshufps_avx(auVar117,auVar117,0xaa);
  register0x00001290 = auVar201;
  _local_280 = auVar201;
  auVar146._0_4_ = fVar217 * fVar217;
  auVar146._4_4_ = fVar265 * fVar265;
  auVar146._8_4_ = fVar235 * fVar235;
  auVar146._12_4_ = aVar173.w * aVar173.w;
  auVar201 = vshufps_avx(auVar146,auVar146,0xaa);
  auVar31 = vshufps_avx(auVar146,auVar146,0x55);
  _local_9e0 = auVar117;
  auVar117 = vshufps_avx(auVar117,auVar117,0xff);
  register0x000012d0 = auVar117;
  _local_400 = auVar117;
  auVar117 = vshufps_avx(auVar146,auVar146,0);
  local_2a0._0_4_ = auVar117._0_4_ + auVar31._0_4_ + auVar201._0_4_;
  local_2a0._4_4_ = auVar117._4_4_ + auVar31._4_4_ + auVar201._4_4_;
  local_2a0._8_4_ = auVar117._8_4_ + auVar31._8_4_ + auVar201._8_4_;
  local_2a0._12_4_ = auVar117._12_4_ + auVar31._12_4_ + auVar201._12_4_;
  local_2a0._16_4_ = auVar117._0_4_ + auVar31._0_4_ + auVar201._0_4_;
  local_2a0._20_4_ = auVar117._4_4_ + auVar31._4_4_ + auVar201._4_4_;
  local_2a0._24_4_ = auVar117._8_4_ + auVar31._8_4_ + auVar201._8_4_;
  local_2a0._28_4_ = auVar117._12_4_ + auVar31._12_4_ + auVar201._12_4_;
  auVar273 = ZEXT3264(local_2a0);
  auVar201 = vshufps_avx(auVar147,auVar147,0);
  register0x00001250 = auVar201;
  _local_420 = auVar201;
  auVar201 = vshufps_avx(auVar147,auVar147,0x55);
  register0x00001250 = auVar201;
  _local_440 = auVar201;
  auVar201 = vshufps_avx(auVar147,auVar147,0xaa);
  register0x00001250 = auVar201;
  _local_460 = auVar201;
  _local_8a0 = auVar147;
  auVar201 = vshufps_avx(auVar147,auVar147,0xff);
  register0x00001250 = auVar201;
  _local_480 = auVar201;
  auVar201 = vshufps_avx(auVar116,auVar116,0);
  register0x00001250 = auVar201;
  _local_4a0 = auVar201;
  auVar201 = vshufps_avx(auVar116,auVar116,0x55);
  register0x00001250 = auVar201;
  _local_4c0 = auVar201;
  auVar201 = vshufps_avx(auVar116,auVar116,0xaa);
  register0x00001250 = auVar201;
  _local_4e0 = auVar201;
  _local_8c0 = auVar116;
  auVar201 = vshufps_avx(auVar116,auVar116,0xff);
  register0x00001250 = auVar201;
  _local_500 = auVar201;
  local_940._16_16_ = auVar30;
  local_940._0_16_ = auVar30;
  uVar105 = 0;
  local_b8c = 1;
  local_660 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  local_680 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_67c = local_680;
  fStack_678 = local_680;
  fStack_674 = local_680;
  fStack_670 = local_680;
  fStack_66c = local_680;
  fStack_668 = local_680;
  fStack_664 = local_680;
  local_800 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_7fc = local_800;
  fStack_7f8 = local_800;
  fStack_7f4 = local_800;
  fStack_7f0 = local_800;
  fStack_7ec = local_800;
  fStack_7e8 = local_800;
  fStack_7e4 = local_800;
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(local_2a0,auVar132);
  local_630 = ZEXT816(0x3f80000000000000);
  uVar103 = (ulong)*(uint *)(local_868 + lVar110 * 4 + 6);
  do {
    auVar229._8_4_ = 0x3f800000;
    auVar229._0_8_ = 0x3f8000003f800000;
    auVar229._12_4_ = 0x3f800000;
    auVar229._16_4_ = 0x3f800000;
    auVar229._20_4_ = 0x3f800000;
    auVar229._24_4_ = 0x3f800000;
    auVar229._28_4_ = 0x3f800000;
    auVar201 = vmovshdup_avx(local_630);
    auVar31 = vsubps_avx(auVar201,local_630);
    auVar201 = vshufps_avx(local_630,local_630,0);
    local_7e0._16_16_ = auVar201;
    local_7e0._0_16_ = auVar201;
    auVar30 = vshufps_avx(auVar31,auVar31,0);
    register0x00001250 = auVar30;
    _local_820 = auVar30;
    fVar144 = auVar30._0_4_;
    fVar171 = auVar30._4_4_;
    fVar172 = auVar30._8_4_;
    fVar174 = auVar30._12_4_;
    fVar175 = auVar201._0_4_;
    auVar211._0_4_ = fVar175 + fVar144 * 0.0;
    fVar193 = auVar201._4_4_;
    auVar211._4_4_ = fVar193 + fVar171 * 0.14285715;
    fVar194 = auVar201._8_4_;
    auVar211._8_4_ = fVar194 + fVar172 * 0.2857143;
    fVar195 = auVar201._12_4_;
    auVar211._12_4_ = fVar195 + fVar174 * 0.42857146;
    auVar211._16_4_ = fVar175 + fVar144 * 0.5714286;
    auVar211._20_4_ = fVar193 + fVar171 * 0.71428573;
    auVar211._24_4_ = fVar194 + fVar172 * 0.8571429;
    auVar211._28_4_ = fVar195 + fVar174;
    auVar124 = vsubps_avx(auVar229,auVar211);
    fVar265 = auVar124._0_4_;
    fVar235 = auVar124._4_4_;
    fVar274 = auVar124._8_4_;
    fVar236 = auVar124._12_4_;
    fVar277 = auVar124._16_4_;
    fVar237 = auVar124._20_4_;
    fVar280 = auVar124._24_4_;
    fVar240 = fVar265 * fVar265 * fVar265;
    fVar241 = fVar235 * fVar235 * fVar235;
    fVar258 = fVar274 * fVar274 * fVar274;
    fVar281 = fVar236 * fVar236 * fVar236;
    fVar262 = fVar277 * fVar277 * fVar277;
    fVar286 = fVar237 * fVar237 * fVar237;
    fVar290 = fVar280 * fVar280 * fVar280;
    fVar293 = auVar211._0_4_ * auVar211._0_4_ * auVar211._0_4_;
    fVar302 = auVar211._4_4_ * auVar211._4_4_ * auVar211._4_4_;
    fVar303 = auVar211._8_4_ * auVar211._8_4_ * auVar211._8_4_;
    fVar304 = auVar211._12_4_ * auVar211._12_4_ * auVar211._12_4_;
    fVar305 = auVar211._16_4_ * auVar211._16_4_ * auVar211._16_4_;
    fVar306 = auVar211._20_4_ * auVar211._20_4_ * auVar211._20_4_;
    fVar307 = auVar211._24_4_ * auVar211._24_4_ * auVar211._24_4_;
    fVar217 = auVar257._28_4_;
    fVar238 = auVar211._0_4_ * fVar265;
    fVar283 = auVar211._4_4_ * fVar235;
    fVar239 = auVar211._8_4_ * fVar274;
    fVar285 = auVar211._12_4_ * fVar236;
    fVar259 = auVar211._16_4_ * fVar277;
    fVar263 = auVar211._20_4_ * fVar237;
    fVar260 = auVar211._24_4_ * fVar280;
    fVar289 = auVar359._28_4_ + auVar394._28_4_;
    fVar338 = auVar301._28_4_ + fVar217 + fVar289;
    fVar348 = fVar289 + auVar273._28_4_ + auVar372._28_4_ + auVar347._28_4_;
    fVar289 = fVar240 * 0.16666667;
    fVar275 = fVar241 * 0.16666667;
    fVar278 = fVar258 * 0.16666667;
    fVar261 = fVar281 * 0.16666667;
    fVar264 = fVar262 * 0.16666667;
    fVar287 = fVar286 * 0.16666667;
    fVar291 = fVar290 * 0.16666667;
    fVar308 = (fVar293 + fVar240 * 4.0 + fVar265 * fVar238 * 12.0 + auVar211._0_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar320 = (fVar302 + fVar241 * 4.0 + fVar235 * fVar283 * 12.0 + auVar211._4_4_ * fVar283 * 6.0)
              * 0.16666667;
    fVar323 = (fVar303 + fVar258 * 4.0 + fVar274 * fVar239 * 12.0 + auVar211._8_4_ * fVar239 * 6.0)
              * 0.16666667;
    fVar326 = (fVar304 + fVar281 * 4.0 + fVar236 * fVar285 * 12.0 + auVar211._12_4_ * fVar285 * 6.0)
              * 0.16666667;
    fVar329 = (fVar305 + fVar262 * 4.0 + fVar277 * fVar259 * 12.0 + auVar211._16_4_ * fVar259 * 6.0)
              * 0.16666667;
    fVar332 = (fVar306 + fVar286 * 4.0 + fVar237 * fVar263 * 12.0 + auVar211._20_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar335 = (fVar307 + fVar290 * 4.0 + fVar280 * fVar260 * 12.0 + auVar211._24_4_ * fVar260 * 6.0)
              * 0.16666667;
    fVar240 = (fVar293 * 4.0 + fVar240 + auVar211._0_4_ * fVar238 * 12.0 + fVar265 * fVar238 * 6.0)
              * 0.16666667;
    fVar241 = (fVar302 * 4.0 + fVar241 + auVar211._4_4_ * fVar283 * 12.0 + fVar235 * fVar283 * 6.0)
              * 0.16666667;
    fVar258 = (fVar303 * 4.0 + fVar258 + auVar211._8_4_ * fVar239 * 12.0 + fVar274 * fVar239 * 6.0)
              * 0.16666667;
    fVar281 = (fVar304 * 4.0 + fVar281 + auVar211._12_4_ * fVar285 * 12.0 + fVar236 * fVar285 * 6.0)
              * 0.16666667;
    fVar262 = (fVar305 * 4.0 + fVar262 + auVar211._16_4_ * fVar259 * 12.0 + fVar277 * fVar259 * 6.0)
              * 0.16666667;
    fVar286 = (fVar306 * 4.0 + fVar286 + auVar211._20_4_ * fVar263 * 12.0 + fVar237 * fVar263 * 6.0)
              * 0.16666667;
    fVar290 = (fVar307 * 4.0 + fVar290 + auVar211._24_4_ * fVar260 * 12.0 + fVar280 * fVar260 * 6.0)
              * 0.16666667;
    fVar293 = fVar293 * 0.16666667;
    fVar302 = fVar302 * 0.16666667;
    fVar303 = fVar303 * 0.16666667;
    fVar304 = fVar304 * 0.16666667;
    fVar305 = fVar305 * 0.16666667;
    fVar306 = fVar306 * 0.16666667;
    fVar307 = fVar307 * 0.16666667;
    fVar385 = auVar372._28_4_ + 12.0;
    fVar349 = fVar348 + 12.166667;
    local_900 = auVar416._0_4_ * fVar289 +
                fVar308 * (float)local_240._0_4_ +
                fVar293 * (float)local_4a0._0_4_ + fVar240 * (float)local_420._0_4_;
    fStack_8fc = auVar416._4_4_ * fVar275 +
                 fVar320 * (float)local_240._4_4_ +
                 fVar302 * (float)local_4a0._4_4_ + fVar241 * (float)local_420._4_4_;
    fStack_8f8 = auVar416._8_4_ * fVar278 +
                 fVar323 * fStack_238 + fVar303 * fStack_498 + fVar258 * fStack_418;
    fStack_8f4 = auVar416._12_4_ * fVar261 +
                 fVar326 * fStack_234 + fVar304 * fStack_494 + fVar281 * fStack_414;
    fStack_8f0 = auVar416._16_4_ * fVar264 +
                 fVar329 * fStack_230 + fVar305 * fStack_490 + fVar262 * fStack_410;
    fStack_8ec = auVar416._20_4_ * fVar287 +
                 fVar332 * fStack_22c + fVar306 * fStack_48c + fVar286 * fStack_40c;
    fStack_8e8 = auVar416._24_4_ * fVar291 +
                 fVar335 * fStack_228 + fVar307 * fStack_488 + fVar290 * fStack_408;
    fStack_8e4 = fVar338 + fVar349;
    local_b80._0_4_ =
         (float)local_1e0._0_4_ * fVar289 +
         (float)local_260._0_4_ * fVar308 +
         fVar293 * (float)local_4c0._0_4_ + fVar240 * (float)local_440._0_4_;
    local_b80._4_4_ =
         (float)local_1e0._4_4_ * fVar275 +
         (float)local_260._4_4_ * fVar320 +
         fVar302 * (float)local_4c0._4_4_ + fVar241 * (float)local_440._4_4_;
    fStack_b78 = fStack_1d8 * fVar278 +
                 fStack_258 * fVar323 + fVar303 * fStack_4b8 + fVar258 * fStack_438;
    fStack_b74 = fStack_1d4 * fVar261 +
                 fStack_254 * fVar326 + fVar304 * fStack_4b4 + fVar281 * fStack_434;
    fStack_b70 = fStack_1d0 * fVar264 +
                 fStack_250 * fVar329 + fVar305 * fStack_4b0 + fVar262 * fStack_430;
    fStack_b6c = fStack_1cc * fVar287 +
                 fStack_24c * fVar332 + fVar306 * fStack_4ac + fVar286 * fStack_42c;
    fStack_b68 = fStack_1c8 * fVar291 +
                 fStack_248 * fVar335 + fVar307 * fStack_4a8 + fVar290 * fStack_428;
    fStack_b64 = fStack_8e4 + fVar385 + 12.166667;
    local_8e0 = (float)local_200._0_4_ * fVar289 +
                (float)local_280._0_4_ * fVar308 +
                fVar293 * (float)local_4e0._0_4_ + fVar240 * (float)local_460._0_4_;
    fStack_8dc = (float)local_200._4_4_ * fVar275 +
                 (float)local_280._4_4_ * fVar320 +
                 fVar302 * (float)local_4e0._4_4_ + fVar241 * (float)local_460._4_4_;
    fStack_8d8 = fStack_1f8 * fVar278 +
                 fStack_278 * fVar323 + fVar303 * fStack_4d8 + fVar258 * fStack_458;
    aStack_8d4.w = fStack_1f4 * fVar261 +
                   fStack_274 * fVar326 + fVar304 * fStack_4d4 + fVar281 * fStack_454;
    fStack_8d0 = fStack_1f0 * fVar264 +
                 fStack_270 * fVar329 + fVar305 * fStack_4d0 + fVar262 * fStack_450;
    fStack_8cc = fStack_1ec * fVar287 +
                 fStack_26c * fVar332 + fVar306 * fStack_4cc + fVar286 * fStack_44c;
    fStack_8c8 = fStack_1e8 * fVar291 +
                 fStack_268 * fVar335 + fVar307 * fStack_4c8 + fVar290 * fStack_448;
    fStack_8c4 = fStack_b64 + fVar385 + auVar394._28_4_ + 12.0;
    local_b60._0_4_ =
         (float)local_220._0_4_ * fVar289 +
         fVar308 * (float)local_400._0_4_ +
         fVar240 * (float)local_480._0_4_ + fVar293 * (float)local_500._0_4_;
    local_b60._4_4_ =
         (float)local_220._4_4_ * fVar275 +
         fVar320 * (float)local_400._4_4_ +
         fVar241 * (float)local_480._4_4_ + fVar302 * (float)local_500._4_4_;
    fStack_b58 = fStack_218 * fVar278 +
                 fVar323 * fStack_3f8 + fVar258 * fStack_478 + fVar303 * fStack_4f8;
    fStack_b54 = fStack_214 * fVar261 +
                 fVar326 * fStack_3f4 + fVar281 * fStack_474 + fVar304 * fStack_4f4;
    fStack_b50 = fStack_210 * fVar264 +
                 fVar329 * fStack_3f0 + fVar262 * fStack_470 + fVar305 * fStack_4f0;
    fStack_b4c = fStack_20c * fVar287 +
                 fVar332 * fStack_3ec + fVar286 * fStack_46c + fVar306 * fStack_4ec;
    fStack_b48 = fStack_208 * fVar291 +
                 fVar335 * fStack_3e8 + fVar290 * fStack_468 + fVar307 * fStack_4e8;
    fStack_b44 = auVar273._28_4_ + fVar338 + fVar348 + auVar301._28_4_;
    auVar42._4_4_ = auVar211._4_4_ * -auVar211._4_4_;
    auVar42._0_4_ = auVar211._0_4_ * -auVar211._0_4_;
    auVar42._8_4_ = auVar211._8_4_ * -auVar211._8_4_;
    auVar42._12_4_ = auVar211._12_4_ * -auVar211._12_4_;
    auVar42._16_4_ = auVar211._16_4_ * -auVar211._16_4_;
    auVar42._20_4_ = auVar211._20_4_ * -auVar211._20_4_;
    auVar42._24_4_ = auVar211._24_4_ * -auVar211._24_4_;
    auVar42._28_4_ = auVar211._28_4_;
    auVar43._4_4_ = fVar283 * 4.0;
    auVar43._0_4_ = fVar238 * 4.0;
    auVar43._8_4_ = fVar239 * 4.0;
    auVar43._12_4_ = fVar285 * 4.0;
    auVar43._16_4_ = fVar259 * 4.0;
    auVar43._20_4_ = fVar263 * 4.0;
    auVar43._24_4_ = fVar260 * 4.0;
    auVar43._28_4_ = fVar217;
    auVar124 = vsubps_avx(auVar42,auVar43);
    fVar290 = fVar265 * -fVar265 * 0.5;
    fVar291 = fVar235 * -fVar235 * 0.5;
    fVar293 = fVar274 * -fVar274 * 0.5;
    fVar302 = fVar236 * -fVar236 * 0.5;
    fVar303 = fVar277 * -fVar277 * 0.5;
    fVar304 = fVar237 * -fVar237 * 0.5;
    fVar305 = fVar280 * -fVar280 * 0.5;
    fVar258 = auVar124._0_4_ * 0.5;
    fVar278 = auVar124._4_4_ * 0.5;
    fVar281 = auVar124._8_4_ * 0.5;
    fVar262 = auVar124._12_4_ * 0.5;
    fVar264 = auVar124._16_4_ * 0.5;
    fVar286 = auVar124._20_4_ * 0.5;
    fVar287 = auVar124._24_4_ * 0.5;
    fVar240 = (fVar265 * fVar265 + fVar238 * 4.0) * 0.5;
    fVar289 = (fVar235 * fVar235 + fVar283 * 4.0) * 0.5;
    fVar241 = (fVar274 * fVar274 + fVar239 * 4.0) * 0.5;
    fVar275 = (fVar236 * fVar236 + fVar285 * 4.0) * 0.5;
    fVar259 = (fVar277 * fVar277 + fVar259 * 4.0) * 0.5;
    fVar263 = (fVar237 * fVar237 + fVar263 * 4.0) * 0.5;
    fVar260 = (fVar280 * fVar280 + fVar260 * 4.0) * 0.5;
    fVar265 = auVar211._0_4_ * auVar211._0_4_ * 0.5;
    fVar235 = auVar211._4_4_ * auVar211._4_4_ * 0.5;
    fVar274 = auVar211._8_4_ * auVar211._8_4_ * 0.5;
    fVar280 = auVar211._12_4_ * auVar211._12_4_ * 0.5;
    fVar238 = auVar211._16_4_ * auVar211._16_4_ * 0.5;
    fVar283 = auVar211._20_4_ * auVar211._20_4_ * 0.5;
    fVar285 = auVar211._24_4_ * auVar211._24_4_ * 0.5;
    fVar261 = auVar124._28_4_ + fVar195 + fVar217 + fVar349 + fVar217;
    auVar201 = vpermilps_avx(ZEXT416((uint)(auVar31._0_4_ * 0.04761905)),0);
    fVar236 = auVar201._0_4_;
    fVar309 = fVar236 * (auVar416._0_4_ * fVar290 +
                        (float)local_240._0_4_ * fVar258 +
                        fVar240 * (float)local_420._0_4_ + fVar265 * (float)local_4a0._0_4_);
    fVar277 = auVar201._4_4_;
    fVar321 = fVar277 * (auVar416._4_4_ * fVar291 +
                        (float)local_240._4_4_ * fVar278 +
                        fVar289 * (float)local_420._4_4_ + fVar235 * (float)local_4a0._4_4_);
    local_a80._4_4_ = fVar321;
    local_a80._0_4_ = fVar309;
    fVar237 = auVar201._8_4_;
    fVar324 = fVar237 * (auVar416._8_4_ * fVar293 +
                        fStack_238 * fVar281 + fVar241 * fStack_418 + fVar274 * fStack_498);
    local_a80._8_4_ = fVar324;
    fVar239 = auVar201._12_4_;
    fVar327 = fVar239 * (auVar416._12_4_ * fVar302 +
                        fStack_234 * fVar262 + fVar275 * fStack_414 + fVar280 * fStack_494);
    local_a80._12_4_ = fVar327;
    fVar330 = fVar236 * (auVar416._16_4_ * fVar303 +
                        fStack_230 * fVar264 + fVar259 * fStack_410 + fVar238 * fStack_490);
    local_a80._16_4_ = fVar330;
    fVar333 = fVar277 * (auVar416._20_4_ * fVar304 +
                        fStack_22c * fVar286 + fVar263 * fStack_40c + fVar283 * fStack_48c);
    local_a80._20_4_ = fVar333;
    fVar336 = fVar237 * (auVar416._24_4_ * fVar305 +
                        fStack_228 * fVar287 + fVar260 * fStack_408 + fVar285 * fStack_488);
    local_a80._24_4_ = fVar336;
    local_a80._28_4_ = fStack_8c4 + fVar349;
    fVar350 = fVar236 * ((float)local_1e0._0_4_ * fVar290 +
                        (float)local_260._0_4_ * fVar258 +
                        fVar240 * (float)local_440._0_4_ + fVar265 * (float)local_4c0._0_4_);
    fVar360 = fVar277 * ((float)local_1e0._4_4_ * fVar291 +
                        (float)local_260._4_4_ * fVar278 +
                        fVar289 * (float)local_440._4_4_ + fVar235 * (float)local_4c0._4_4_);
    local_a40._4_4_ = fVar360;
    local_a40._0_4_ = fVar350;
    fVar361 = fVar237 * (fStack_1d8 * fVar293 +
                        fStack_258 * fVar281 + fVar241 * fStack_438 + fVar274 * fStack_4b8);
    local_a40._8_4_ = fVar361;
    fVar362 = fVar239 * (fStack_1d4 * fVar302 +
                        fStack_254 * fVar262 + fVar275 * fStack_434 + fVar280 * fStack_4b4);
    local_a40._12_4_ = fVar362;
    fVar363 = fVar236 * (fStack_1d0 * fVar303 +
                        fStack_250 * fVar264 + fVar259 * fStack_430 + fVar238 * fStack_4b0);
    local_a40._16_4_ = fVar363;
    fVar364 = fVar277 * (fStack_1cc * fVar304 +
                        fStack_24c * fVar286 + fVar263 * fStack_42c + fVar283 * fStack_4ac);
    local_a40._20_4_ = fVar364;
    fVar365 = fVar237 * (fStack_1c8 * fVar305 +
                        fStack_248 * fVar287 + fVar260 * fStack_428 + fVar285 * fStack_4a8);
    local_a40._24_4_ = fVar365;
    local_a40._28_4_ = uStack_1e4;
    fVar366 = fVar236 * ((float)local_200._0_4_ * fVar290 +
                        fVar265 * (float)local_4e0._0_4_ + fVar240 * (float)local_460._0_4_ +
                        (float)local_280._0_4_ * fVar258);
    fVar373 = fVar277 * ((float)local_200._4_4_ * fVar291 +
                        fVar235 * (float)local_4e0._4_4_ + fVar289 * (float)local_460._4_4_ +
                        (float)local_280._4_4_ * fVar278);
    local_980._4_4_ = fVar373;
    local_980._0_4_ = fVar366;
    fVar375 = fVar237 * (fStack_1f8 * fVar293 +
                        fVar274 * fStack_4d8 + fVar241 * fStack_458 + fStack_278 * fVar281);
    local_980._8_4_ = fVar375;
    fVar377 = fVar239 * (fStack_1f4 * fVar302 +
                        fVar280 * fStack_4d4 + fVar275 * fStack_454 + fStack_274 * fVar262);
    local_980._12_4_ = fVar377;
    fVar379 = fVar236 * (fStack_1f0 * fVar303 +
                        fVar238 * fStack_4d0 + fVar259 * fStack_450 + fStack_270 * fVar264);
    local_980._16_4_ = fVar379;
    fVar381 = fVar277 * (fStack_1ec * fVar304 +
                        fVar283 * fStack_4cc + fVar263 * fStack_44c + fStack_26c * fVar286);
    local_980._20_4_ = fVar381;
    fVar383 = fVar237 * (fStack_1e8 * fVar305 +
                        fVar285 * fStack_4c8 + fVar260 * fStack_448 + fStack_268 * fVar287);
    local_980._24_4_ = fVar383;
    local_980._28_4_ = fStack_204;
    fVar240 = fVar236 * ((float)local_220._0_4_ * fVar290 +
                        fVar258 * (float)local_400._0_4_ +
                        fVar265 * (float)local_500._0_4_ + fVar240 * (float)local_480._0_4_);
    fVar258 = fVar277 * ((float)local_220._4_4_ * fVar291 +
                        fVar278 * (float)local_400._4_4_ +
                        fVar235 * (float)local_500._4_4_ + fVar289 * (float)local_480._4_4_);
    auVar44._4_4_ = fVar258;
    auVar44._0_4_ = fVar240;
    fVar278 = fVar237 * (fStack_218 * fVar293 +
                        fVar281 * fStack_3f8 + fVar274 * fStack_4f8 + fVar241 * fStack_478);
    auVar44._8_4_ = fVar278;
    fVar239 = fVar239 * (fStack_214 * fVar302 +
                        fVar262 * fStack_3f4 + fVar280 * fStack_4f4 + fVar275 * fStack_474);
    auVar44._12_4_ = fVar239;
    fVar236 = fVar236 * (fStack_210 * fVar303 +
                        fVar264 * fStack_3f0 + fVar238 * fStack_4f0 + fVar259 * fStack_470);
    auVar44._16_4_ = fVar236;
    fVar277 = fVar277 * (fStack_20c * fVar304 +
                        fVar286 * fStack_3ec + fVar283 * fStack_4ec + fVar263 * fStack_46c);
    auVar44._20_4_ = fVar277;
    fVar237 = fVar237 * (fStack_208 * fVar305 +
                        fVar287 * fStack_3e8 + fVar285 * fStack_4e8 + fVar260 * fStack_468);
    auVar44._24_4_ = fVar237;
    auVar44._28_4_ = fVar261;
    auVar124 = vperm2f128_avx(_local_b80,_local_b80,1);
    auVar124 = vshufps_avx(auVar124,_local_b80,0x30);
    auVar356 = vshufps_avx(_local_b80,auVar124,0x29);
    auVar98._4_4_ = fStack_8dc;
    auVar98._0_4_ = local_8e0;
    auVar98._8_4_ = fStack_8d8;
    auVar98._12_4_ = aStack_8d4;
    auVar98._16_4_ = fStack_8d0;
    auVar98._20_4_ = fStack_8cc;
    auVar98._24_4_ = fStack_8c8;
    auVar98._28_4_ = fStack_8c4;
    auVar124 = vperm2f128_avx(auVar98,auVar98,1);
    auVar124 = vshufps_avx(auVar124,auVar98,0x30);
    local_920 = vshufps_avx(auVar98,auVar124,0x29);
    auVar163 = vsubps_avx(_local_b60,auVar44);
    auVar124 = vperm2f128_avx(auVar163,auVar163,1);
    auVar124 = vshufps_avx(auVar124,auVar163,0x30);
    _local_840 = vshufps_avx(auVar163,auVar124,0x29);
    local_2c0 = vsubps_avx(auVar356,_local_b80);
    local_700 = vsubps_avx(local_920,auVar98);
    fVar265 = local_2c0._0_4_;
    fVar280 = local_2c0._4_4_;
    auVar45._4_4_ = fVar373 * fVar280;
    auVar45._0_4_ = fVar366 * fVar265;
    fVar289 = local_2c0._8_4_;
    auVar45._8_4_ = fVar375 * fVar289;
    fVar263 = local_2c0._12_4_;
    auVar45._12_4_ = fVar377 * fVar263;
    fVar286 = local_2c0._16_4_;
    auVar45._16_4_ = fVar379 * fVar286;
    fVar303 = local_2c0._20_4_;
    auVar45._20_4_ = fVar381 * fVar303;
    fVar320 = local_2c0._24_4_;
    auVar45._24_4_ = fVar383 * fVar320;
    auVar45._28_4_ = auVar163._28_4_;
    fVar235 = local_700._0_4_;
    fVar238 = local_700._4_4_;
    auVar46._4_4_ = fVar360 * fVar238;
    auVar46._0_4_ = fVar350 * fVar235;
    fVar241 = local_700._8_4_;
    auVar46._8_4_ = fVar361 * fVar241;
    fVar260 = local_700._12_4_;
    auVar46._12_4_ = fVar362 * fVar260;
    fVar287 = local_700._16_4_;
    auVar46._16_4_ = fVar363 * fVar287;
    fVar304 = local_700._20_4_;
    auVar46._20_4_ = fVar364 * fVar304;
    fVar323 = local_700._24_4_;
    auVar46._24_4_ = fVar365 * fVar323;
    auVar46._28_4_ = auVar124._28_4_;
    auVar26 = vsubps_avx(auVar46,auVar45);
    auVar95._4_4_ = fStack_8fc;
    auVar95._0_4_ = local_900;
    auVar95._8_4_ = fStack_8f8;
    auVar95._12_4_ = fStack_8f4;
    auVar95._16_4_ = fStack_8f0;
    auVar95._20_4_ = fStack_8ec;
    auVar95._24_4_ = fStack_8e8;
    auVar95._28_4_ = fStack_8e4;
    auVar124 = vperm2f128_avx(auVar95,auVar95,1);
    auVar124 = vshufps_avx(auVar124,auVar95,0x30);
    local_aa0 = vshufps_avx(auVar95,auVar124,0x29);
    local_760 = vsubps_avx(local_aa0,auVar95);
    auVar47._4_4_ = fVar321 * fVar238;
    auVar47._0_4_ = fVar309 * fVar235;
    auVar47._8_4_ = fVar324 * fVar241;
    auVar47._12_4_ = fVar327 * fVar260;
    auVar47._16_4_ = fVar330 * fVar287;
    auVar47._20_4_ = fVar333 * fVar304;
    auVar47._24_4_ = fVar336 * fVar323;
    auVar47._28_4_ = auVar124._28_4_;
    fVar274 = local_760._0_4_;
    fVar283 = local_760._4_4_;
    auVar48._4_4_ = fVar373 * fVar283;
    auVar48._0_4_ = fVar366 * fVar274;
    fVar275 = local_760._8_4_;
    auVar48._8_4_ = fVar375 * fVar275;
    fVar281 = local_760._12_4_;
    auVar48._12_4_ = fVar377 * fVar281;
    fVar290 = local_760._16_4_;
    auVar48._16_4_ = fVar379 * fVar290;
    fVar305 = local_760._20_4_;
    auVar48._20_4_ = fVar381 * fVar305;
    fVar326 = local_760._24_4_;
    auVar48._24_4_ = fVar383 * fVar326;
    auVar48._28_4_ = local_920._28_4_;
    auVar27 = vsubps_avx(auVar48,auVar47);
    auVar49._4_4_ = fVar360 * fVar283;
    auVar49._0_4_ = fVar350 * fVar274;
    auVar49._8_4_ = fVar361 * fVar275;
    auVar49._12_4_ = fVar362 * fVar281;
    auVar49._16_4_ = fVar363 * fVar290;
    auVar49._20_4_ = fVar364 * fVar305;
    auVar49._24_4_ = fVar365 * fVar326;
    auVar49._28_4_ = local_920._28_4_;
    auVar50._4_4_ = fVar321 * fVar280;
    auVar50._0_4_ = fVar309 * fVar265;
    auVar50._8_4_ = fVar324 * fVar289;
    auVar50._12_4_ = fVar327 * fVar263;
    auVar50._16_4_ = fVar330 * fVar286;
    auVar50._20_4_ = fVar333 * fVar303;
    auVar50._24_4_ = fVar336 * fVar320;
    auVar50._28_4_ = fVar349;
    auVar213 = vsubps_avx(auVar50,auVar49);
    fVar217 = auVar213._28_4_;
    fVar285 = auVar27._28_4_ + fVar217;
    auVar212._0_4_ = fVar274 * fVar274 + fVar265 * fVar265 + fVar235 * fVar235;
    auVar212._4_4_ = fVar283 * fVar283 + fVar280 * fVar280 + fVar238 * fVar238;
    auVar212._8_4_ = fVar275 * fVar275 + fVar289 * fVar289 + fVar241 * fVar241;
    auVar212._12_4_ = fVar281 * fVar281 + fVar263 * fVar263 + fVar260 * fVar260;
    auVar212._16_4_ = fVar290 * fVar290 + fVar286 * fVar286 + fVar287 * fVar287;
    auVar212._20_4_ = fVar305 * fVar305 + fVar303 * fVar303 + fVar304 * fVar304;
    auVar212._24_4_ = fVar326 * fVar326 + fVar320 * fVar320 + fVar323 * fVar323;
    auVar212._28_4_ = fVar217 + fVar217 + fVar285;
    auVar124 = vrcpps_avx(auVar212);
    fVar259 = auVar124._0_4_;
    fVar262 = auVar124._4_4_;
    auVar51._4_4_ = fVar262 * auVar212._4_4_;
    auVar51._0_4_ = fVar259 * auVar212._0_4_;
    fVar264 = auVar124._8_4_;
    auVar51._8_4_ = fVar264 * auVar212._8_4_;
    fVar291 = auVar124._12_4_;
    auVar51._12_4_ = fVar291 * auVar212._12_4_;
    fVar293 = auVar124._16_4_;
    auVar51._16_4_ = fVar293 * auVar212._16_4_;
    fVar302 = auVar124._20_4_;
    auVar51._20_4_ = fVar302 * auVar212._20_4_;
    fVar306 = auVar124._24_4_;
    auVar51._24_4_ = fVar306 * auVar212._24_4_;
    auVar51._28_4_ = fVar349;
    auVar392._8_4_ = 0x3f800000;
    auVar392._0_8_ = 0x3f8000003f800000;
    auVar392._12_4_ = 0x3f800000;
    auVar392._16_4_ = 0x3f800000;
    auVar392._20_4_ = 0x3f800000;
    auVar392._24_4_ = 0x3f800000;
    auVar392._28_4_ = 0x3f800000;
    auVar28 = vsubps_avx(auVar392,auVar51);
    fVar259 = auVar28._0_4_ * fVar259 + fVar259;
    fVar262 = auVar28._4_4_ * fVar262 + fVar262;
    fVar264 = auVar28._8_4_ * fVar264 + fVar264;
    fVar291 = auVar28._12_4_ * fVar291 + fVar291;
    fVar293 = auVar28._16_4_ * fVar293 + fVar293;
    fVar302 = auVar28._20_4_ * fVar302 + fVar302;
    fVar306 = auVar28._24_4_ * fVar306 + fVar306;
    auVar163 = vperm2f128_avx(local_a40,local_a40,1);
    auVar163 = vshufps_avx(auVar163,local_a40,0x30);
    local_ac0 = vshufps_avx(local_a40,auVar163,0x29);
    auVar163 = vperm2f128_avx(local_980,local_980,1);
    auVar163 = vshufps_avx(auVar163,local_980,0x30);
    local_780 = vshufps_avx(local_980,auVar163,0x29);
    fVar367 = local_780._0_4_;
    fVar374 = local_780._4_4_;
    auVar52._4_4_ = fVar374 * fVar280;
    auVar52._0_4_ = fVar367 * fVar265;
    fVar376 = local_780._8_4_;
    auVar52._8_4_ = fVar376 * fVar289;
    fVar378 = local_780._12_4_;
    auVar52._12_4_ = fVar378 * fVar263;
    fVar380 = local_780._16_4_;
    auVar52._16_4_ = fVar380 * fVar286;
    fVar382 = local_780._20_4_;
    auVar52._20_4_ = fVar382 * fVar303;
    fVar384 = local_780._24_4_;
    auVar52._24_4_ = fVar384 * fVar320;
    auVar52._28_4_ = auVar163._28_4_;
    fVar386 = local_ac0._0_4_;
    fVar395 = local_ac0._4_4_;
    auVar53._4_4_ = fVar395 * fVar238;
    auVar53._0_4_ = fVar386 * fVar235;
    fVar396 = local_ac0._8_4_;
    auVar53._8_4_ = fVar396 * fVar241;
    fVar397 = local_ac0._12_4_;
    auVar53._12_4_ = fVar397 * fVar260;
    fVar398 = local_ac0._16_4_;
    auVar53._16_4_ = fVar398 * fVar287;
    fVar399 = local_ac0._20_4_;
    auVar53._20_4_ = fVar399 * fVar304;
    fVar400 = local_ac0._24_4_;
    auVar53._24_4_ = fVar400 * fVar323;
    auVar53._28_4_ = uStack_1e4;
    auVar29 = vsubps_avx(auVar53,auVar52);
    auVar163 = vperm2f128_avx(local_a80,local_a80,1);
    auVar163 = vshufps_avx(auVar163,local_a80,0x30);
    local_9a0 = vshufps_avx(local_a80,auVar163,0x29);
    fVar310 = local_9a0._0_4_;
    fVar322 = local_9a0._4_4_;
    auVar54._4_4_ = fVar322 * fVar238;
    auVar54._0_4_ = fVar310 * fVar235;
    fVar325 = local_9a0._8_4_;
    auVar54._8_4_ = fVar325 * fVar241;
    fVar328 = local_9a0._12_4_;
    auVar54._12_4_ = fVar328 * fVar260;
    fVar331 = local_9a0._16_4_;
    auVar54._16_4_ = fVar331 * fVar287;
    fVar334 = local_9a0._20_4_;
    auVar54._20_4_ = fVar334 * fVar304;
    fVar337 = local_9a0._24_4_;
    auVar54._24_4_ = fVar337 * fVar323;
    auVar54._28_4_ = auVar163._28_4_;
    auVar55._4_4_ = fVar374 * fVar283;
    auVar55._0_4_ = fVar367 * fVar274;
    auVar55._8_4_ = fVar376 * fVar275;
    auVar55._12_4_ = fVar378 * fVar281;
    auVar55._16_4_ = fVar380 * fVar290;
    auVar55._20_4_ = fVar382 * fVar305;
    uVar107 = local_780._28_4_;
    auVar55._24_4_ = fVar384 * fVar326;
    auVar55._28_4_ = uVar107;
    auVar163 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ = fVar395 * fVar283;
    auVar56._0_4_ = fVar386 * fVar274;
    auVar56._8_4_ = fVar396 * fVar275;
    auVar56._12_4_ = fVar397 * fVar281;
    auVar56._16_4_ = fVar398 * fVar290;
    auVar56._20_4_ = fVar399 * fVar305;
    auVar56._24_4_ = fVar400 * fVar326;
    auVar56._28_4_ = uVar107;
    auVar57._4_4_ = fVar322 * fVar280;
    auVar57._0_4_ = fVar310 * fVar265;
    auVar57._8_4_ = fVar325 * fVar289;
    auVar57._12_4_ = fVar328 * fVar263;
    auVar57._16_4_ = fVar331 * fVar286;
    auVar57._20_4_ = fVar334 * fVar303;
    auVar57._24_4_ = fVar337 * fVar320;
    auVar57._28_4_ = local_ac0._28_4_;
    auVar355 = vsubps_avx(auVar57,auVar56);
    fVar217 = auVar355._28_4_;
    fVar308 = auVar163._28_4_ + fVar217;
    auVar58._4_4_ =
         (auVar26._4_4_ * auVar26._4_4_ +
         auVar27._4_4_ * auVar27._4_4_ + auVar213._4_4_ * auVar213._4_4_) * fVar262;
    auVar58._0_4_ =
         (auVar26._0_4_ * auVar26._0_4_ +
         auVar27._0_4_ * auVar27._0_4_ + auVar213._0_4_ * auVar213._0_4_) * fVar259;
    auVar58._8_4_ =
         (auVar26._8_4_ * auVar26._8_4_ +
         auVar27._8_4_ * auVar27._8_4_ + auVar213._8_4_ * auVar213._8_4_) * fVar264;
    auVar58._12_4_ =
         (auVar26._12_4_ * auVar26._12_4_ +
         auVar27._12_4_ * auVar27._12_4_ + auVar213._12_4_ * auVar213._12_4_) * fVar291;
    auVar58._16_4_ =
         (auVar26._16_4_ * auVar26._16_4_ +
         auVar27._16_4_ * auVar27._16_4_ + auVar213._16_4_ * auVar213._16_4_) * fVar293;
    auVar58._20_4_ =
         (auVar26._20_4_ * auVar26._20_4_ +
         auVar27._20_4_ * auVar27._20_4_ + auVar213._20_4_ * auVar213._20_4_) * fVar302;
    auVar58._24_4_ =
         (auVar26._24_4_ * auVar26._24_4_ +
         auVar27._24_4_ * auVar27._24_4_ + auVar213._24_4_ * auVar213._24_4_) * fVar306;
    auVar58._28_4_ = auVar26._28_4_ + fVar285;
    auVar59._4_4_ =
         (auVar29._4_4_ * auVar29._4_4_ +
         auVar163._4_4_ * auVar163._4_4_ + auVar355._4_4_ * auVar355._4_4_) * fVar262;
    auVar59._0_4_ =
         (auVar29._0_4_ * auVar29._0_4_ +
         auVar163._0_4_ * auVar163._0_4_ + auVar355._0_4_ * auVar355._0_4_) * fVar259;
    auVar59._8_4_ =
         (auVar29._8_4_ * auVar29._8_4_ +
         auVar163._8_4_ * auVar163._8_4_ + auVar355._8_4_ * auVar355._8_4_) * fVar264;
    auVar59._12_4_ =
         (auVar29._12_4_ * auVar29._12_4_ +
         auVar163._12_4_ * auVar163._12_4_ + auVar355._12_4_ * auVar355._12_4_) * fVar291;
    auVar59._16_4_ =
         (auVar29._16_4_ * auVar29._16_4_ +
         auVar163._16_4_ * auVar163._16_4_ + auVar355._16_4_ * auVar355._16_4_) * fVar293;
    auVar59._20_4_ =
         (auVar29._20_4_ * auVar29._20_4_ +
         auVar163._20_4_ * auVar163._20_4_ + auVar355._20_4_ * auVar355._20_4_) * fVar302;
    auVar59._24_4_ =
         (auVar29._24_4_ * auVar29._24_4_ +
         auVar163._24_4_ * auVar163._24_4_ + auVar355._24_4_ * auVar355._24_4_) * fVar306;
    auVar59._28_4_ = auVar28._28_4_ + auVar124._28_4_;
    auVar124 = vmaxps_avx(auVar58,auVar59);
    auVar163 = vperm2f128_avx(_local_b60,_local_b60,1);
    auVar163 = vshufps_avx(auVar163,_local_b60,0x30);
    local_960 = vshufps_avx(_local_b60,auVar163,0x29);
    local_6a0._0_4_ = (float)local_b60._0_4_ + fVar240;
    local_6a0._4_4_ = (float)local_b60._4_4_ + fVar258;
    local_6a0._8_4_ = fStack_b58 + fVar278;
    local_6a0._12_4_ = fStack_b54 + fVar239;
    local_6a0._16_4_ = fStack_b50 + fVar236;
    local_6a0._20_4_ = fStack_b4c + fVar277;
    local_6a0._24_4_ = fStack_b48 + fVar237;
    local_6a0._28_4_ = fStack_b44 + fVar261;
    auVar163 = vmaxps_avx(_local_b60,local_6a0);
    auVar26 = vmaxps_avx(_local_840,local_960);
    auVar163 = vmaxps_avx(auVar163,auVar26);
    auVar26 = vrsqrtps_avx(auVar212);
    fVar236 = auVar26._0_4_;
    fVar277 = auVar26._4_4_;
    fVar237 = auVar26._8_4_;
    fVar239 = auVar26._12_4_;
    fVar285 = auVar26._16_4_;
    fVar240 = auVar26._20_4_;
    fVar258 = auVar26._24_4_;
    auVar60._4_4_ = fVar277 * fVar277 * fVar277 * auVar212._4_4_ * 0.5;
    auVar60._0_4_ = fVar236 * fVar236 * fVar236 * auVar212._0_4_ * 0.5;
    auVar60._8_4_ = fVar237 * fVar237 * fVar237 * auVar212._8_4_ * 0.5;
    auVar60._12_4_ = fVar239 * fVar239 * fVar239 * auVar212._12_4_ * 0.5;
    auVar60._16_4_ = fVar285 * fVar285 * fVar285 * auVar212._16_4_ * 0.5;
    auVar60._20_4_ = fVar240 * fVar240 * fVar240 * auVar212._20_4_ * 0.5;
    auVar60._24_4_ = fVar258 * fVar258 * fVar258 * auVar212._24_4_ * 0.5;
    auVar60._28_4_ = auVar212._28_4_;
    auVar61._4_4_ = fVar277 * 1.5;
    auVar61._0_4_ = fVar236 * 1.5;
    auVar61._8_4_ = fVar237 * 1.5;
    auVar61._12_4_ = fVar239 * 1.5;
    auVar61._16_4_ = fVar285 * 1.5;
    auVar61._20_4_ = fVar240 * 1.5;
    auVar61._24_4_ = fVar258 * 1.5;
    auVar61._28_4_ = auVar26._28_4_;
    local_560 = vsubps_avx(auVar61,auVar60);
    local_7a0 = vsubps_avx(ZEXT832(0) << 0x20,_local_b80);
    local_7c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
    fVar407 = local_7c0._0_4_;
    fVar410 = local_7c0._4_4_;
    fVar411 = local_7c0._8_4_;
    fVar412 = local_7c0._12_4_;
    fVar413 = local_7c0._16_4_;
    fVar414 = local_7c0._20_4_;
    fVar415 = local_7c0._24_4_;
    fVar236 = local_7a0._0_4_;
    fVar239 = local_7a0._4_4_;
    fVar258 = local_7a0._8_4_;
    fVar261 = local_7a0._12_4_;
    fVar291 = local_7a0._16_4_;
    fVar306 = local_7a0._20_4_;
    fVar329 = local_7a0._24_4_;
    auVar213 = ZEXT832(0) << 0x20;
    auVar27 = vsubps_avx(auVar213,auVar95);
    fVar277 = auVar27._0_4_;
    fVar285 = auVar27._4_4_;
    fVar278 = auVar27._8_4_;
    fVar262 = auVar27._12_4_;
    fVar293 = auVar27._16_4_;
    fVar307 = auVar27._20_4_;
    fVar332 = auVar27._24_4_;
    auVar345._0_4_ = local_660 * fVar277 + local_680 * fVar236 + fVar407 * local_800;
    auVar345._4_4_ = fStack_65c * fVar285 + fStack_67c * fVar239 + fVar410 * fStack_7fc;
    auVar345._8_4_ = fStack_658 * fVar278 + fStack_678 * fVar258 + fVar411 * fStack_7f8;
    auVar345._12_4_ = fStack_654 * fVar262 + fStack_674 * fVar261 + fVar412 * fStack_7f4;
    auVar345._16_4_ = fStack_650 * fVar293 + fStack_670 * fVar291 + fVar413 * fStack_7f0;
    auVar345._20_4_ = fStack_64c * fVar307 + fStack_66c * fVar306 + fVar414 * fStack_7ec;
    auVar345._24_4_ = fStack_648 * fVar332 + fStack_668 * fVar329 + fVar415 * fStack_7e8;
    auVar345._28_4_ = fVar308 + auVar29._28_4_ + fVar308 + auVar26._28_4_;
    auVar353._0_4_ = fVar277 * fVar277 + fVar236 * fVar236 + fVar407 * fVar407;
    auVar353._4_4_ = fVar285 * fVar285 + fVar239 * fVar239 + fVar410 * fVar410;
    auVar353._8_4_ = fVar278 * fVar278 + fVar258 * fVar258 + fVar411 * fVar411;
    auVar353._12_4_ = fVar262 * fVar262 + fVar261 * fVar261 + fVar412 * fVar412;
    auVar353._16_4_ = fVar293 * fVar293 + fVar291 * fVar291 + fVar413 * fVar413;
    auVar353._20_4_ = fVar307 * fVar307 + fVar306 * fVar306 + fVar414 * fVar414;
    auVar353._24_4_ = fVar332 * fVar332 + fVar329 * fVar329 + fVar415 * fVar415;
    auVar353._28_4_ = fVar217 + fVar217 + fVar308;
    fVar237 = local_560._0_4_;
    fVar240 = local_560._4_4_;
    fVar259 = local_560._8_4_;
    fVar264 = local_560._12_4_;
    fVar302 = local_560._16_4_;
    fVar308 = local_560._20_4_;
    fVar335 = local_560._24_4_;
    fVar338 = local_700._28_4_;
    local_580 = local_660 * fVar237 * fVar274 +
                fVar265 * fVar237 * local_680 + fVar237 * fVar235 * local_800;
    fStack_57c = fStack_65c * fVar240 * fVar283 +
                 fVar280 * fVar240 * fStack_67c + fVar240 * fVar238 * fStack_7fc;
    fStack_578 = fStack_658 * fVar259 * fVar275 +
                 fVar289 * fVar259 * fStack_678 + fVar259 * fVar241 * fStack_7f8;
    fStack_574 = fStack_654 * fVar264 * fVar281 +
                 fVar263 * fVar264 * fStack_674 + fVar264 * fVar260 * fStack_7f4;
    fStack_570 = fStack_650 * fVar302 * fVar290 +
                 fVar286 * fVar302 * fStack_670 + fVar302 * fVar287 * fStack_7f0;
    fStack_56c = fStack_64c * fVar308 * fVar305 +
                 fVar303 * fVar308 * fStack_66c + fVar308 * fVar304 * fStack_7ec;
    fStack_568 = fStack_648 * fVar335 * fVar326 +
                 fVar320 * fVar335 * fStack_668 + fVar335 * fVar323 * fStack_7e8;
    fVar217 = fStack_644 + fVar338 + fStack_7e4;
    local_5a0._0_4_ =
         fVar277 * fVar237 * fVar274 + fVar265 * fVar237 * fVar236 + fVar407 * fVar237 * fVar235;
    local_5a0._4_4_ =
         fVar285 * fVar240 * fVar283 + fVar280 * fVar240 * fVar239 + fVar410 * fVar240 * fVar238;
    local_5a0._8_4_ =
         fVar278 * fVar259 * fVar275 + fVar289 * fVar259 * fVar258 + fVar411 * fVar259 * fVar241;
    local_5a0._12_4_ =
         fVar262 * fVar264 * fVar281 + fVar263 * fVar264 * fVar261 + fVar412 * fVar264 * fVar260;
    local_5a0._16_4_ =
         fVar293 * fVar302 * fVar290 + fVar286 * fVar302 * fVar291 + fVar413 * fVar302 * fVar287;
    local_5a0._20_4_ =
         fVar307 * fVar308 * fVar305 + fVar303 * fVar308 * fVar306 + fVar414 * fVar308 * fVar304;
    local_5a0._24_4_ =
         fVar332 * fVar335 * fVar326 + fVar320 * fVar335 * fVar329 + fVar415 * fVar335 * fVar323;
    local_5a0._28_4_ = fVar338 + fVar217;
    auVar62._4_4_ = fStack_57c * local_5a0._4_4_;
    auVar62._0_4_ = local_580 * local_5a0._0_4_;
    auVar62._8_4_ = fStack_578 * local_5a0._8_4_;
    auVar62._12_4_ = fStack_574 * local_5a0._12_4_;
    auVar62._16_4_ = fStack_570 * local_5a0._16_4_;
    auVar62._20_4_ = fStack_56c * local_5a0._20_4_;
    auVar62._24_4_ = fStack_568 * local_5a0._24_4_;
    auVar62._28_4_ = fVar217;
    auVar26 = vsubps_avx(auVar345,auVar62);
    auVar63._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
    auVar63._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
    auVar63._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
    auVar63._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
    auVar63._16_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auVar63._20_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    auVar63._24_4_ = local_5a0._24_4_ * local_5a0._24_4_;
    auVar63._28_4_ = fVar338;
    _local_ae0 = vsubps_avx(auVar353,auVar63);
    local_6e0 = vsqrtps_avx(auVar124);
    fVar217 = (local_6e0._0_4_ + auVar163._0_4_) * 1.0000002;
    fVar348 = (local_6e0._4_4_ + auVar163._4_4_) * 1.0000002;
    fVar385 = (local_6e0._8_4_ + auVar163._8_4_) * 1.0000002;
    fVar140 = (local_6e0._12_4_ + auVar163._12_4_) * 1.0000002;
    fVar141 = (local_6e0._16_4_ + auVar163._16_4_) * 1.0000002;
    fVar142 = (local_6e0._20_4_ + auVar163._20_4_) * 1.0000002;
    fVar143 = (local_6e0._24_4_ + auVar163._24_4_) * 1.0000002;
    auVar64._4_4_ = fVar348 * fVar348;
    auVar64._0_4_ = fVar217 * fVar217;
    auVar64._8_4_ = fVar385 * fVar385;
    auVar64._12_4_ = fVar140 * fVar140;
    auVar64._16_4_ = fVar141 * fVar141;
    auVar64._20_4_ = fVar142 * fVar142;
    auVar64._24_4_ = fVar143 * fVar143;
    auVar64._28_4_ = local_6e0._28_4_ + auVar163._28_4_;
    local_300._0_4_ = auVar26._0_4_ + auVar26._0_4_;
    local_300._4_4_ = auVar26._4_4_ + auVar26._4_4_;
    local_300._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_300._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_300._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_300._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_300._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    fVar217 = auVar26._28_4_;
    local_300._28_4_ = fVar217 + fVar217;
    auVar163 = vsubps_avx(_local_ae0,auVar64);
    auVar65._4_4_ = fStack_57c * fStack_57c;
    auVar65._0_4_ = local_580 * local_580;
    auVar65._8_4_ = fStack_578 * fStack_578;
    auVar65._12_4_ = fStack_574 * fStack_574;
    auVar65._16_4_ = fStack_570 * fStack_570;
    auVar65._20_4_ = fStack_56c * fStack_56c;
    auVar65._24_4_ = fStack_568 * fStack_568;
    auVar65._28_4_ = fVar217;
    auVar271 = vsubps_avx(local_2a0,auVar65);
    local_6c0._4_4_ = local_300._4_4_ * local_300._4_4_;
    local_6c0._0_4_ = local_300._0_4_ * local_300._0_4_;
    local_6c0._8_4_ = local_300._8_4_ * local_300._8_4_;
    local_6c0._12_4_ = local_300._12_4_ * local_300._12_4_;
    local_6c0._16_4_ = local_300._16_4_ * local_300._16_4_;
    local_6c0._20_4_ = local_300._20_4_ * local_300._20_4_;
    local_6c0._24_4_ = local_300._24_4_ * local_300._24_4_;
    local_6c0._28_4_ = local_7a0._28_4_;
    fVar217 = auVar271._0_4_;
    local_860._0_4_ = fVar217 * 4.0;
    fVar348 = auVar271._4_4_;
    local_860._4_4_ = fVar348 * 4.0;
    fVar385 = auVar271._8_4_;
    fStack_858 = fVar385 * 4.0;
    fVar140 = auVar271._12_4_;
    fStack_854 = fVar140 * 4.0;
    fVar141 = auVar271._16_4_;
    fStack_850 = fVar141 * 4.0;
    fVar142 = auVar271._20_4_;
    fStack_84c = fVar142 * 4.0;
    fVar143 = auVar271._24_4_;
    fStack_848 = fVar143 * 4.0;
    uStack_844 = 0x40800000;
    auVar66._4_4_ = auVar163._4_4_ * (float)local_860._4_4_;
    auVar66._0_4_ = auVar163._0_4_ * (float)local_860._0_4_;
    auVar66._8_4_ = auVar163._8_4_ * fStack_858;
    auVar66._12_4_ = auVar163._12_4_ * fStack_854;
    auVar66._16_4_ = auVar163._16_4_ * fStack_850;
    auVar66._20_4_ = auVar163._20_4_ * fStack_84c;
    auVar66._24_4_ = auVar163._24_4_ * fStack_848;
    auVar66._28_4_ = 0x40800000;
    auVar26 = vsubps_avx(local_6c0,auVar66);
    auVar124 = vcmpps_avx(auVar26,auVar213,5);
    auVar298._8_4_ = 0x7fffffff;
    auVar298._0_8_ = 0x7fffffff7fffffff;
    auVar298._12_4_ = 0x7fffffff;
    auVar298._16_4_ = 0x7fffffff;
    auVar298._20_4_ = 0x7fffffff;
    auVar298._24_4_ = 0x7fffffff;
    auVar298._28_4_ = 0x7fffffff;
    local_3c0 = vandps_avx(auVar65,auVar298);
    local_340._0_4_ = fVar217 + fVar217;
    local_340._4_4_ = fVar348 + fVar348;
    local_340._8_4_ = fVar385 + fVar385;
    local_340._12_4_ = fVar140 + fVar140;
    local_340._16_4_ = fVar141 + fVar141;
    local_340._20_4_ = fVar142 + fVar142;
    local_340._24_4_ = fVar143 + fVar143;
    local_340._28_4_ = auVar271._28_4_ + auVar271._28_4_;
    local_2e0 = vandps_avx(auVar271,auVar298);
    uVar104 = CONCAT44(local_300._4_4_,local_300._0_4_);
    local_320._0_8_ = uVar104 ^ 0x8000000080000000;
    local_320._8_4_ = -local_300._8_4_;
    local_320._12_4_ = -local_300._12_4_;
    local_320._16_4_ = -local_300._16_4_;
    local_320._20_4_ = -local_300._20_4_;
    local_320._24_4_ = -local_300._24_4_;
    local_320._28_4_ = -local_300._28_4_;
    auVar216 = local_320;
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      auVar346._8_4_ = 0x7f800000;
      auVar346._0_8_ = 0x7f8000007f800000;
      auVar346._12_4_ = 0x7f800000;
      auVar346._16_4_ = 0x7f800000;
      auVar346._20_4_ = 0x7f800000;
      auVar346._24_4_ = 0x7f800000;
      auVar346._28_4_ = 0x7f800000;
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      auVar133._16_4_ = 0xff800000;
      auVar133._20_4_ = 0xff800000;
      auVar133._24_4_ = 0xff800000;
      auVar133._28_4_ = 0xff800000;
    }
    else {
      auVar29 = vsqrtps_avx(auVar26);
      auVar28 = vrcpps_avx(local_340);
      auVar213 = vcmpps_avx(auVar26,auVar213,5);
      fVar217 = auVar28._0_4_;
      fVar348 = auVar28._4_4_;
      auVar67._4_4_ = local_340._4_4_ * fVar348;
      auVar67._0_4_ = local_340._0_4_ * fVar217;
      fVar385 = auVar28._8_4_;
      auVar67._8_4_ = local_340._8_4_ * fVar385;
      fVar140 = auVar28._12_4_;
      auVar67._12_4_ = local_340._12_4_ * fVar140;
      fVar141 = auVar28._16_4_;
      auVar67._16_4_ = local_340._16_4_ * fVar141;
      fVar142 = auVar28._20_4_;
      auVar67._20_4_ = local_340._20_4_ * fVar142;
      fVar143 = auVar28._24_4_;
      auVar67._24_4_ = local_340._24_4_ * fVar143;
      auVar67._28_4_ = auVar26._28_4_;
      auVar160._8_4_ = 0x3f800000;
      auVar160._0_8_ = 0x3f8000003f800000;
      auVar160._12_4_ = 0x3f800000;
      auVar160._16_4_ = 0x3f800000;
      auVar160._20_4_ = 0x3f800000;
      auVar160._24_4_ = 0x3f800000;
      auVar160._28_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar160,auVar67);
      fVar217 = fVar217 + fVar217 * auVar26._0_4_;
      fVar348 = fVar348 + fVar348 * auVar26._4_4_;
      fVar385 = fVar385 + fVar385 * auVar26._8_4_;
      fVar140 = fVar140 + fVar140 * auVar26._12_4_;
      fVar141 = fVar141 + fVar141 * auVar26._16_4_;
      fVar142 = fVar142 + fVar142 * auVar26._20_4_;
      fVar143 = fVar143 + fVar143 * auVar26._24_4_;
      auVar355 = vsubps_avx(local_320,auVar29);
      fVar266 = auVar355._0_4_ * fVar217;
      fVar276 = auVar355._4_4_ * fVar348;
      auVar68._4_4_ = fVar276;
      auVar68._0_4_ = fVar266;
      fVar279 = auVar355._8_4_ * fVar385;
      auVar68._8_4_ = fVar279;
      fVar282 = auVar355._12_4_ * fVar140;
      auVar68._12_4_ = fVar282;
      fVar284 = auVar355._16_4_ * fVar141;
      auVar68._16_4_ = fVar284;
      fVar288 = auVar355._20_4_ * fVar142;
      auVar68._20_4_ = fVar288;
      fVar292 = auVar355._24_4_ * fVar143;
      auVar68._24_4_ = fVar292;
      auVar68._28_4_ = auVar355._28_4_;
      auVar29 = vsubps_avx(auVar29,local_300);
      fVar217 = auVar29._0_4_ * fVar217;
      fVar348 = auVar29._4_4_ * fVar348;
      auVar69._4_4_ = fVar348;
      auVar69._0_4_ = fVar217;
      fVar385 = auVar29._8_4_ * fVar385;
      auVar69._8_4_ = fVar385;
      fVar140 = auVar29._12_4_ * fVar140;
      auVar69._12_4_ = fVar140;
      fVar141 = auVar29._16_4_ * fVar141;
      auVar69._16_4_ = fVar141;
      fVar142 = auVar29._20_4_ * fVar142;
      auVar69._20_4_ = fVar142;
      fVar143 = auVar29._24_4_ * fVar143;
      auVar69._24_4_ = fVar143;
      auVar69._28_4_ = auVar28._28_4_ + auVar26._28_4_;
      local_3a0 = fVar237 * (local_5a0._0_4_ + local_580 * fVar266);
      fStack_39c = fVar240 * (local_5a0._4_4_ + fStack_57c * fVar276);
      fStack_398 = fVar259 * (local_5a0._8_4_ + fStack_578 * fVar279);
      fStack_394 = fVar264 * (local_5a0._12_4_ + fStack_574 * fVar282);
      fStack_390 = fVar302 * (local_5a0._16_4_ + fStack_570 * fVar284);
      fStack_38c = fVar308 * (local_5a0._20_4_ + fStack_56c * fVar288);
      fStack_388 = fVar335 * (local_5a0._24_4_ + fStack_568 * fVar292);
      uStack_384 = 0x3f800000;
      local_380 = fVar237 * (local_5a0._0_4_ + local_580 * fVar217);
      fStack_37c = fVar240 * (local_5a0._4_4_ + fStack_57c * fVar348);
      fStack_378 = fVar259 * (local_5a0._8_4_ + fStack_578 * fVar385);
      fStack_374 = fVar264 * (local_5a0._12_4_ + fStack_574 * fVar140);
      fStack_370 = fVar302 * (local_5a0._16_4_ + fStack_570 * fVar141);
      fStack_36c = fVar308 * (local_5a0._20_4_ + fStack_56c * fVar142);
      fStack_368 = fVar335 * (local_5a0._24_4_ + fStack_568 * fVar143);
      fStack_364 = local_300._28_4_;
      auVar248._8_4_ = 0x7f800000;
      auVar248._0_8_ = 0x7f8000007f800000;
      auVar248._12_4_ = 0x7f800000;
      auVar248._16_4_ = 0x7f800000;
      auVar248._20_4_ = 0x7f800000;
      auVar248._24_4_ = 0x7f800000;
      auVar248._28_4_ = 0x7f800000;
      auVar346 = vblendvps_avx(auVar248,auVar68,auVar213);
      auVar249._8_4_ = 0xff800000;
      auVar249._0_8_ = 0xff800000ff800000;
      auVar249._12_4_ = 0xff800000;
      auVar249._16_4_ = 0xff800000;
      auVar249._20_4_ = 0xff800000;
      auVar249._24_4_ = 0xff800000;
      auVar249._28_4_ = 0xff800000;
      auVar133 = vblendvps_avx(auVar249,auVar69,auVar213);
      auVar26 = vmaxps_avx(local_540,local_3c0);
      auVar271._8_4_ = 0x36000000;
      auVar271._0_8_ = 0x3600000036000000;
      auVar271._12_4_ = 0x36000000;
      auVar271._16_4_ = 0x36000000;
      auVar271._20_4_ = 0x36000000;
      auVar271._24_4_ = 0x36000000;
      auVar271._28_4_ = 0x36000000;
      auVar70._4_4_ = auVar26._4_4_ * 1.9073486e-06;
      auVar70._0_4_ = auVar26._0_4_ * 1.9073486e-06;
      auVar70._8_4_ = auVar26._8_4_ * 1.9073486e-06;
      auVar70._12_4_ = auVar26._12_4_ * 1.9073486e-06;
      auVar70._16_4_ = auVar26._16_4_ * 1.9073486e-06;
      auVar70._20_4_ = auVar26._20_4_ * 1.9073486e-06;
      auVar70._24_4_ = auVar26._24_4_ * 1.9073486e-06;
      auVar70._28_4_ = auVar26._28_4_;
      auVar26 = vcmpps_avx(local_2e0,auVar70,1);
      auVar28 = auVar213 & auVar26;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar28 >> 0x7f,0) != '\0') ||
            (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0xbf,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar28[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar26,auVar213);
        auVar201 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar271 = vcmpps_avx(auVar163,_DAT_01f7b000,2);
        auVar216._8_4_ = 0xff800000;
        auVar216._0_8_ = 0xff800000ff800000;
        auVar216._12_4_ = 0xff800000;
        auVar216._16_4_ = 0xff800000;
        auVar216._20_4_ = 0xff800000;
        auVar216._24_4_ = 0xff800000;
        auVar216._28_4_ = 0xff800000;
        auVar371._8_4_ = 0x7f800000;
        auVar371._0_8_ = 0x7f8000007f800000;
        auVar371._12_4_ = 0x7f800000;
        auVar371._16_4_ = 0x7f800000;
        auVar371._20_4_ = 0x7f800000;
        auVar371._24_4_ = 0x7f800000;
        auVar371._28_4_ = 0x7f800000;
        auVar163 = vblendvps_avx(auVar371,auVar216,auVar271);
        auVar30 = vpmovsxwd_avx(auVar201);
        auVar201 = vpunpckhwd_avx(auVar201,auVar201);
        auVar256._16_16_ = auVar201;
        auVar256._0_16_ = auVar30;
        auVar346 = vblendvps_avx(auVar346,auVar163,auVar256);
        auVar163 = vblendvps_avx(auVar216,auVar371,auVar271);
        auVar133 = vblendvps_avx(auVar133,auVar163,auVar256);
        auVar191._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
        auVar191._8_4_ = auVar124._8_4_ ^ 0xffffffff;
        auVar191._12_4_ = auVar124._12_4_ ^ 0xffffffff;
        auVar191._16_4_ = auVar124._16_4_ ^ 0xffffffff;
        auVar191._20_4_ = auVar124._20_4_ ^ 0xffffffff;
        auVar191._24_4_ = auVar124._24_4_ ^ 0xffffffff;
        auVar191._28_4_ = auVar124._28_4_ ^ 0xffffffff;
        auVar124 = vorps_avx(auVar271,auVar191);
        auVar124 = vandps_avx(auVar213,auVar124);
      }
    }
    auVar347 = ZEXT3264(auVar346);
    auVar273 = ZEXT3264(auVar271);
    auVar394 = ZEXT3264(local_5a0);
    auVar372 = ZEXT3264(CONCAT428(fStack_7e4,
                                  CONCAT424(fStack_7e8,
                                            CONCAT420(fStack_7ec,
                                                      CONCAT416(fStack_7f0,
                                                                CONCAT412(fStack_7f4,
                                                                          CONCAT48(fStack_7f8,
                                                                                   CONCAT44(
                                                  fStack_7fc,local_800))))))));
    auVar359 = ZEXT3264(local_3c0);
    auVar301 = ZEXT3264(local_940);
    auVar257 = ZEXT3264(local_520);
    auVar163 = local_520 & auVar124;
    local_960._0_8_ = uVar103;
    if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar163 >> 0x7f,0) == '\0') &&
          (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar163 >> 0xbf,0) == '\0') &&
        (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar163[0x1f])
    {
      auVar416 = ZEXT3264(local_a60);
    }
    else {
      fStack_564 = fStack_644 + fVar338 + fStack_7e4;
      auVar201 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_880._0_4_));
      auVar201 = vshufps_avx(auVar201,auVar201,0);
      auVar250._16_16_ = auVar201;
      auVar250._0_16_ = auVar201;
      auVar213 = vmaxps_avx(auVar250,auVar346);
      auVar201 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_880._0_4_));
      auVar201 = vshufps_avx(auVar201,auVar201,0);
      auVar251._16_16_ = auVar201;
      auVar251._0_16_ = auVar201;
      auVar28 = vminps_avx(auVar251,auVar133);
      fVar143 = auVar27._28_4_;
      auVar161._0_4_ = local_660 * fVar309 + local_680 * fVar350 + local_800 * fVar366;
      auVar161._4_4_ = fStack_65c * fVar321 + fStack_67c * fVar360 + fStack_7fc * fVar373;
      auVar161._8_4_ = fStack_658 * fVar324 + fStack_678 * fVar361 + fStack_7f8 * fVar375;
      auVar161._12_4_ = fStack_654 * fVar327 + fStack_674 * fVar362 + fStack_7f4 * fVar377;
      auVar161._16_4_ = fStack_650 * fVar330 + fStack_670 * fVar363 + fStack_7f0 * fVar379;
      auVar161._20_4_ = fStack_64c * fVar333 + fStack_66c * fVar364 + fStack_7ec * fVar381;
      auVar161._24_4_ = fStack_648 * fVar336 + fStack_668 * fVar365 + fStack_7e8 * fVar383;
      auVar161._28_4_ = fVar143 + fVar143 + fStack_204;
      auVar163 = vrcpps_avx(auVar161);
      fVar217 = auVar163._0_4_;
      fVar338 = auVar163._4_4_;
      auVar71._4_4_ = auVar161._4_4_ * fVar338;
      auVar71._0_4_ = auVar161._0_4_ * fVar217;
      fVar348 = auVar163._8_4_;
      auVar71._8_4_ = auVar161._8_4_ * fVar348;
      fVar385 = auVar163._12_4_;
      auVar71._12_4_ = auVar161._12_4_ * fVar385;
      fVar140 = auVar163._16_4_;
      auVar71._16_4_ = auVar161._16_4_ * fVar140;
      fVar141 = auVar163._20_4_;
      auVar71._20_4_ = auVar161._20_4_ * fVar141;
      fVar142 = auVar163._24_4_;
      auVar71._24_4_ = auVar161._24_4_ * fVar142;
      auVar71._28_4_ = fStack_8c4 + fVar349;
      auVar404._8_4_ = 0x3f800000;
      auVar404._0_8_ = 0x3f8000003f800000;
      auVar404._12_4_ = 0x3f800000;
      auVar404._16_4_ = 0x3f800000;
      auVar404._20_4_ = 0x3f800000;
      auVar404._24_4_ = 0x3f800000;
      auVar404._28_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar404,auVar71);
      auVar299._8_4_ = 0x7fffffff;
      auVar299._0_8_ = 0x7fffffff7fffffff;
      auVar299._12_4_ = 0x7fffffff;
      auVar299._16_4_ = 0x7fffffff;
      auVar299._20_4_ = 0x7fffffff;
      auVar299._24_4_ = 0x7fffffff;
      auVar299._28_4_ = 0x7fffffff;
      auVar163 = vandps_avx(auVar161,auVar299);
      auVar354._8_4_ = 0x219392ef;
      auVar354._0_8_ = 0x219392ef219392ef;
      auVar354._12_4_ = 0x219392ef;
      auVar354._16_4_ = 0x219392ef;
      auVar354._20_4_ = 0x219392ef;
      auVar354._24_4_ = 0x219392ef;
      auVar354._28_4_ = 0x219392ef;
      auVar163 = vcmpps_avx(auVar163,auVar354,1);
      auVar72._4_4_ =
           (fVar338 + fVar338 * auVar26._4_4_) *
           -(fVar321 * fVar285 + fVar360 * fVar239 + fVar373 * fVar410);
      auVar72._0_4_ =
           (fVar217 + fVar217 * auVar26._0_4_) *
           -(fVar309 * fVar277 + fVar350 * fVar236 + fVar366 * fVar407);
      auVar72._8_4_ =
           (fVar348 + fVar348 * auVar26._8_4_) *
           -(fVar324 * fVar278 + fVar361 * fVar258 + fVar375 * fVar411);
      auVar72._12_4_ =
           (fVar385 + fVar385 * auVar26._12_4_) *
           -(fVar327 * fVar262 + fVar362 * fVar261 + fVar377 * fVar412);
      auVar72._16_4_ =
           (fVar140 + fVar140 * auVar26._16_4_) *
           -(fVar330 * fVar293 + fVar363 * fVar291 + fVar379 * fVar413);
      auVar72._20_4_ =
           (fVar141 + fVar141 * auVar26._20_4_) *
           -(fVar333 * fVar307 + fVar364 * fVar306 + fVar381 * fVar414);
      auVar72._24_4_ =
           (fVar142 + fVar142 * auVar26._24_4_) *
           -(fVar336 * fVar332 + fVar365 * fVar329 + fVar383 * fVar415);
      auVar72._28_4_ = -(fVar143 + auVar216._28_4_ + auVar201._12_4_);
      auVar94 = ZEXT812(0);
      auVar359 = ZEXT1264(auVar94) << 0x20;
      auVar26 = vcmpps_avx(auVar161,ZEXT1232(auVar94) << 0x20,1);
      auVar27 = vorps_avx(auVar163,auVar26);
      auVar26 = vcmpps_avx(auVar161,ZEXT1232(auVar94) << 0x20,6);
      auVar26 = vorps_avx(auVar163,auVar26);
      auVar370._8_4_ = 0xff800000;
      auVar370._0_8_ = 0xff800000ff800000;
      auVar370._12_4_ = 0xff800000;
      auVar370._16_4_ = 0xff800000;
      auVar370._20_4_ = 0xff800000;
      auVar370._24_4_ = 0xff800000;
      auVar370._28_4_ = 0xff800000;
      auVar372 = ZEXT3264(auVar370);
      auVar163 = vblendvps_avx(auVar72,auVar370,auVar27);
      auVar393._8_4_ = 0x7f800000;
      auVar393._0_8_ = 0x7f8000007f800000;
      auVar393._12_4_ = 0x7f800000;
      auVar393._16_4_ = 0x7f800000;
      auVar393._20_4_ = 0x7f800000;
      auVar393._24_4_ = 0x7f800000;
      auVar393._28_4_ = 0x7f800000;
      auVar394 = ZEXT3264(auVar393);
      auVar26 = vblendvps_avx(auVar72,auVar393,auVar26);
      auVar27 = vmaxps_avx(auVar213,auVar163);
      auVar347 = ZEXT3264(CONCAT428(fStack_664,
                                    CONCAT424(fStack_668,
                                              CONCAT420(fStack_66c,
                                                        CONCAT416(fStack_670,
                                                                  CONCAT412(fStack_674,
                                                                            CONCAT48(fStack_678,
                                                                                     CONCAT44(
                                                  fStack_67c,local_680))))))));
      auVar213 = vminps_avx(auVar28,auVar26);
      auVar355 = ZEXT1232(auVar94) << 0x20;
      auVar163 = vsubps_avx(auVar355,auVar356);
      auVar26 = vsubps_avx(auVar355,local_920);
      auVar73._4_4_ = auVar26._4_4_ * -fVar374;
      auVar73._0_4_ = auVar26._0_4_ * -fVar367;
      auVar73._8_4_ = auVar26._8_4_ * -fVar376;
      auVar73._12_4_ = auVar26._12_4_ * -fVar378;
      auVar73._16_4_ = auVar26._16_4_ * -fVar380;
      auVar73._20_4_ = auVar26._20_4_ * -fVar382;
      auVar73._24_4_ = auVar26._24_4_ * -fVar384;
      auVar73._28_4_ = auVar26._28_4_;
      auVar74._4_4_ = fVar395 * auVar163._4_4_;
      auVar74._0_4_ = fVar386 * auVar163._0_4_;
      auVar74._8_4_ = fVar396 * auVar163._8_4_;
      auVar74._12_4_ = fVar397 * auVar163._12_4_;
      auVar74._16_4_ = fVar398 * auVar163._16_4_;
      auVar74._20_4_ = fVar399 * auVar163._20_4_;
      auVar74._24_4_ = fVar400 * auVar163._24_4_;
      auVar74._28_4_ = auVar163._28_4_;
      auVar163 = vsubps_avx(auVar73,auVar74);
      auVar26 = vsubps_avx(auVar355,local_aa0);
      auVar75._4_4_ = fVar322 * auVar26._4_4_;
      auVar75._0_4_ = fVar310 * auVar26._0_4_;
      auVar75._8_4_ = fVar325 * auVar26._8_4_;
      auVar75._12_4_ = fVar328 * auVar26._12_4_;
      auVar75._16_4_ = fVar331 * auVar26._16_4_;
      auVar75._20_4_ = fVar334 * auVar26._20_4_;
      uVar109 = auVar26._28_4_;
      auVar75._24_4_ = fVar337 * auVar26._24_4_;
      auVar75._28_4_ = uVar109;
      auVar356 = vsubps_avx(auVar163,auVar75);
      auVar76._4_4_ = fStack_7fc * -fVar374;
      auVar76._0_4_ = local_800 * -fVar367;
      auVar76._8_4_ = fStack_7f8 * -fVar376;
      auVar76._12_4_ = fStack_7f4 * -fVar378;
      auVar76._16_4_ = fStack_7f0 * -fVar380;
      auVar76._20_4_ = fStack_7ec * -fVar382;
      auVar76._24_4_ = fStack_7e8 * -fVar384;
      auVar76._28_4_ = uVar107 ^ 0x80000000;
      auVar405._8_4_ = 0x3f800000;
      auVar405._0_8_ = 0x3f8000003f800000;
      auVar405._12_4_ = 0x3f800000;
      auVar405._16_4_ = 0x3f800000;
      auVar405._20_4_ = 0x3f800000;
      auVar405._24_4_ = 0x3f800000;
      auVar405._28_4_ = 0x3f800000;
      auVar77._4_4_ = fStack_67c * fVar395;
      auVar77._0_4_ = local_680 * fVar386;
      auVar77._8_4_ = fStack_678 * fVar396;
      auVar77._12_4_ = fStack_674 * fVar397;
      auVar77._16_4_ = fStack_670 * fVar398;
      auVar77._20_4_ = fStack_66c * fVar399;
      auVar77._24_4_ = fStack_668 * fVar400;
      auVar77._28_4_ = uVar109;
      auVar163 = vsubps_avx(auVar76,auVar77);
      auVar78._4_4_ = fVar322 * fStack_65c;
      auVar78._0_4_ = fVar310 * local_660;
      auVar78._8_4_ = fVar325 * fStack_658;
      auVar78._12_4_ = fVar328 * fStack_654;
      auVar78._16_4_ = fVar331 * fStack_650;
      auVar78._20_4_ = fVar334 * fStack_64c;
      auVar78._24_4_ = fVar337 * fStack_648;
      auVar78._28_4_ = uVar109;
      auVar28 = vsubps_avx(auVar163,auVar78);
      auVar163 = vrcpps_avx(auVar28);
      fVar217 = auVar163._0_4_;
      fVar236 = auVar163._4_4_;
      auVar79._4_4_ = auVar28._4_4_ * fVar236;
      auVar79._0_4_ = auVar28._0_4_ * fVar217;
      fVar277 = auVar163._8_4_;
      auVar79._8_4_ = auVar28._8_4_ * fVar277;
      fVar239 = auVar163._12_4_;
      auVar79._12_4_ = auVar28._12_4_ * fVar239;
      fVar285 = auVar163._16_4_;
      auVar79._16_4_ = auVar28._16_4_ * fVar285;
      fVar258 = auVar163._20_4_;
      auVar79._20_4_ = auVar28._20_4_ * fVar258;
      fVar278 = auVar163._24_4_;
      auVar79._24_4_ = auVar28._24_4_ * fVar278;
      auVar79._28_4_ = fStack_644;
      auVar29 = vsubps_avx(auVar405,auVar79);
      auVar163 = vandps_avx(auVar28,auVar299);
      auVar300._8_4_ = 0x219392ef;
      auVar300._0_8_ = 0x219392ef219392ef;
      auVar300._12_4_ = 0x219392ef;
      auVar300._16_4_ = 0x219392ef;
      auVar300._20_4_ = 0x219392ef;
      auVar300._24_4_ = 0x219392ef;
      auVar300._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar163,auVar300,1);
      auVar273 = ZEXT3264(auVar26);
      auVar80._4_4_ = (fVar236 + fVar236 * auVar29._4_4_) * -auVar356._4_4_;
      auVar80._0_4_ = (fVar217 + fVar217 * auVar29._0_4_) * -auVar356._0_4_;
      auVar80._8_4_ = (fVar277 + fVar277 * auVar29._8_4_) * -auVar356._8_4_;
      auVar80._12_4_ = (fVar239 + fVar239 * auVar29._12_4_) * -auVar356._12_4_;
      auVar80._16_4_ = (fVar285 + fVar285 * auVar29._16_4_) * -auVar356._16_4_;
      auVar80._20_4_ = (fVar258 + fVar258 * auVar29._20_4_) * -auVar356._20_4_;
      auVar80._24_4_ = (fVar278 + fVar278 * auVar29._24_4_) * -auVar356._24_4_;
      auVar80._28_4_ = auVar356._28_4_ ^ 0x80000000;
      auVar163 = vcmpps_avx(auVar28,auVar355,1);
      auVar163 = vorps_avx(auVar26,auVar163);
      auVar163 = vblendvps_avx(auVar80,auVar370,auVar163);
      local_740 = vmaxps_avx(auVar27,auVar163);
      auVar257 = ZEXT3264(local_520);
      auVar356 = ZEXT1232(auVar94) << 0x20;
      auVar163 = vcmpps_avx(auVar28,auVar356,6);
      auVar163 = vorps_avx(auVar26,auVar163);
      auVar163 = vblendvps_avx(auVar80,auVar393,auVar163);
      auVar124 = vandps_avx(auVar124,local_520);
      local_600 = vminps_avx(auVar213,auVar163);
      auVar163 = vcmpps_avx(local_740,local_600,2);
      auVar26 = auVar124 & auVar163;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar26 = vminps_avx(_local_b60,local_6a0);
        auVar27 = vminps_avx(_local_840,local_960);
        auVar26 = vminps_avx(auVar26,auVar27);
        auVar26 = vsubps_avx(auVar26,local_6e0);
        auVar124 = vandps_avx(auVar163,auVar124);
        auVar99._4_4_ = fStack_39c;
        auVar99._0_4_ = local_3a0;
        auVar99._8_4_ = fStack_398;
        auVar99._12_4_ = fStack_394;
        auVar99._16_4_ = fStack_390;
        auVar99._20_4_ = fStack_38c;
        auVar99._24_4_ = fStack_388;
        auVar99._28_4_ = uStack_384;
        auVar163 = vminps_avx(auVar99,auVar405);
        auVar213 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar163 = vmaxps_avx(auVar163,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar175 + fVar144 * (auVar163._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar193 + fVar171 * (auVar163._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar194 + fVar172 * (auVar163._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar195 + fVar174 * (auVar163._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar175 + fVar144 * (auVar163._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar193 + fVar171 * (auVar163._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar194 + fVar172 * (auVar163._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar195 + auVar163._28_4_ + 7.0;
        auVar100._4_4_ = fStack_37c;
        auVar100._0_4_ = local_380;
        auVar100._8_4_ = fStack_378;
        auVar100._12_4_ = fStack_374;
        auVar100._16_4_ = fStack_370;
        auVar100._20_4_ = fStack_36c;
        auVar100._24_4_ = fStack_368;
        auVar100._28_4_ = fStack_364;
        auVar163 = vminps_avx(auVar100,auVar405);
        auVar163 = vmaxps_avx(auVar163,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar175 + fVar144 * (auVar163._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar193 + fVar171 * (auVar163._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar194 + fVar172 * (auVar163._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar195 + fVar174 * (auVar163._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar175 + fVar144 * (auVar163._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar193 + fVar171 * (auVar163._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar194 + fVar172 * (auVar163._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar195 + auVar163._28_4_ + 7.0;
        auVar81._4_4_ = auVar26._4_4_ * 0.99999976;
        auVar81._0_4_ = auVar26._0_4_ * 0.99999976;
        auVar81._8_4_ = auVar26._8_4_ * 0.99999976;
        auVar81._12_4_ = auVar26._12_4_ * 0.99999976;
        auVar81._16_4_ = auVar26._16_4_ * 0.99999976;
        auVar81._20_4_ = auVar26._20_4_ * 0.99999976;
        auVar81._24_4_ = auVar26._24_4_ * 0.99999976;
        auVar81._28_4_ = 0x3f7ffffc;
        auVar163 = vmaxps_avx(auVar356,auVar81);
        auVar82._4_4_ = auVar163._4_4_ * auVar163._4_4_;
        auVar82._0_4_ = auVar163._0_4_ * auVar163._0_4_;
        auVar82._8_4_ = auVar163._8_4_ * auVar163._8_4_;
        auVar82._12_4_ = auVar163._12_4_ * auVar163._12_4_;
        auVar82._16_4_ = auVar163._16_4_ * auVar163._16_4_;
        auVar82._20_4_ = auVar163._20_4_ * auVar163._20_4_;
        auVar82._24_4_ = auVar163._24_4_ * auVar163._24_4_;
        auVar82._28_4_ = auVar163._28_4_;
        auVar26 = vsubps_avx(_local_ae0,auVar82);
        auVar83._4_4_ = auVar26._4_4_ * (float)local_860._4_4_;
        auVar83._0_4_ = auVar26._0_4_ * (float)local_860._0_4_;
        auVar83._8_4_ = auVar26._8_4_ * fStack_858;
        auVar83._12_4_ = auVar26._12_4_ * fStack_854;
        auVar83._16_4_ = auVar26._16_4_ * fStack_850;
        auVar83._20_4_ = auVar26._20_4_ * fStack_84c;
        auVar83._24_4_ = auVar26._24_4_ * fStack_848;
        auVar83._28_4_ = auVar163._28_4_;
        auVar27 = vsubps_avx(local_6c0,auVar83);
        auVar163 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
        if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar163 >> 0x7f,0) == '\0') &&
              (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar163 >> 0xbf,0) == '\0') &&
            (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar163[0x1f]) {
          auVar273 = ZEXT864(0) << 0x20;
          auVar257 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar295 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar347 = ZEXT864(0) << 0x20;
          _local_b60 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar318._8_4_ = 0x7f800000;
          auVar318._0_8_ = 0x7f8000007f800000;
          auVar318._12_4_ = 0x7f800000;
          auVar318._16_4_ = 0x7f800000;
          auVar318._20_4_ = 0x7f800000;
          auVar318._24_4_ = 0x7f800000;
          auVar318._28_4_ = 0x7f800000;
          auVar357._8_4_ = 0xff800000;
          auVar357._0_8_ = 0xff800000ff800000;
          auVar357._12_4_ = 0xff800000;
          auVar357._16_4_ = 0xff800000;
          auVar357._20_4_ = 0xff800000;
          auVar357._24_4_ = 0xff800000;
          auVar357._28_4_ = 0xff800000;
        }
        else {
          local_a40 = auVar26;
          local_a80 = auVar163;
          _local_ae0 = auVar124;
          auVar213 = vrcpps_avx(local_340);
          fVar217 = auVar213._0_4_;
          fVar236 = auVar213._4_4_;
          auVar84._4_4_ = local_340._4_4_ * fVar236;
          auVar84._0_4_ = local_340._0_4_ * fVar217;
          fVar277 = auVar213._8_4_;
          auVar84._8_4_ = local_340._8_4_ * fVar277;
          fVar239 = auVar213._12_4_;
          auVar84._12_4_ = local_340._12_4_ * fVar239;
          fVar285 = auVar213._16_4_;
          auVar84._16_4_ = local_340._16_4_ * fVar285;
          fVar258 = auVar213._20_4_;
          auVar84._20_4_ = local_340._20_4_ * fVar258;
          fVar278 = auVar213._24_4_;
          auVar84._24_4_ = local_340._24_4_ * fVar278;
          auVar84._28_4_ = auVar26._28_4_;
          auVar29 = vsubps_avx(auVar405,auVar84);
          auVar28 = vsqrtps_avx(auVar27);
          fVar217 = fVar217 + fVar217 * auVar29._0_4_;
          fVar236 = fVar236 + fVar236 * auVar29._4_4_;
          fVar277 = fVar277 + fVar277 * auVar29._8_4_;
          fVar239 = fVar239 + fVar239 * auVar29._12_4_;
          fVar285 = fVar285 + fVar285 * auVar29._16_4_;
          fVar258 = fVar258 + fVar258 * auVar29._20_4_;
          fVar278 = fVar278 + fVar278 * auVar29._24_4_;
          auVar355 = vsubps_avx(local_320,auVar28);
          fVar332 = auVar355._0_4_ * fVar217;
          fVar338 = auVar355._4_4_ * fVar236;
          auVar85._4_4_ = fVar338;
          auVar85._0_4_ = fVar332;
          fVar348 = auVar355._8_4_ * fVar277;
          auVar85._8_4_ = fVar348;
          fVar385 = auVar355._12_4_ * fVar239;
          auVar85._12_4_ = fVar385;
          fVar140 = auVar355._16_4_ * fVar285;
          auVar85._16_4_ = fVar140;
          fVar141 = auVar355._20_4_ * fVar258;
          auVar85._20_4_ = fVar141;
          fVar142 = auVar355._24_4_ * fVar278;
          auVar85._24_4_ = fVar142;
          auVar85._28_4_ = local_ac0._28_4_;
          auVar355 = vsubps_avx(auVar28,local_300);
          fVar217 = auVar355._0_4_ * fVar217;
          fVar236 = auVar355._4_4_ * fVar236;
          auVar86._4_4_ = fVar236;
          auVar86._0_4_ = fVar217;
          fVar277 = auVar355._8_4_ * fVar277;
          auVar86._8_4_ = fVar277;
          fVar239 = auVar355._12_4_ * fVar239;
          auVar86._12_4_ = fVar239;
          fVar285 = auVar355._16_4_ * fVar285;
          auVar86._16_4_ = fVar285;
          fVar258 = auVar355._20_4_ * fVar258;
          auVar86._20_4_ = fVar258;
          fVar278 = auVar355._24_4_ * fVar278;
          auVar86._24_4_ = fVar278;
          auVar86._28_4_ = 0x3f800000;
          fVar261 = (fVar332 * local_580 + local_5a0._0_4_) * fVar237;
          fVar262 = (fVar338 * fStack_57c + local_5a0._4_4_) * fVar240;
          fVar291 = (fVar348 * fStack_578 + local_5a0._8_4_) * fVar259;
          fVar293 = (fVar385 * fStack_574 + local_5a0._12_4_) * fVar264;
          fVar306 = (fVar140 * fStack_570 + local_5a0._16_4_) * fVar302;
          fVar307 = (fVar141 * fStack_56c + local_5a0._20_4_) * fVar308;
          fVar329 = (fVar142 * fStack_568 + local_5a0._24_4_) * fVar335;
          auVar230._0_4_ = local_900 + fVar261 * fVar274;
          auVar230._4_4_ = fStack_8fc + fVar262 * fVar283;
          auVar230._8_4_ = fStack_8f8 + fVar291 * fVar275;
          auVar230._12_4_ = fStack_8f4 + fVar293 * fVar281;
          auVar230._16_4_ = fStack_8f0 + fVar306 * fVar290;
          auVar230._20_4_ = fStack_8ec + fVar307 * fVar305;
          auVar230._24_4_ = fStack_8e8 + fVar329 * fVar326;
          auVar230._28_4_ = fStack_8e4 + auVar355._28_4_;
          auVar87._4_4_ = fStack_65c * fVar338;
          auVar87._0_4_ = local_660 * fVar332;
          auVar87._8_4_ = fStack_658 * fVar348;
          auVar87._12_4_ = fStack_654 * fVar385;
          auVar87._16_4_ = fStack_650 * fVar140;
          auVar87._20_4_ = fStack_64c * fVar141;
          auVar87._24_4_ = fStack_648 * fVar142;
          auVar87._28_4_ = auVar28._28_4_;
          auVar355 = vsubps_avx(auVar87,auVar230);
          auVar252._0_4_ = (float)local_b80._0_4_ + fVar265 * fVar261;
          auVar252._4_4_ = (float)local_b80._4_4_ + fVar280 * fVar262;
          auVar252._8_4_ = fStack_b78 + fVar289 * fVar291;
          auVar252._12_4_ = fStack_b74 + fVar263 * fVar293;
          auVar252._16_4_ = fStack_b70 + fVar286 * fVar306;
          auVar252._20_4_ = fStack_b6c + fVar303 * fVar307;
          auVar252._24_4_ = fStack_b68 + fVar320 * fVar329;
          auVar252._28_4_ = fStack_b64 + auVar28._28_4_;
          auVar88._4_4_ = fStack_67c * fVar338;
          auVar88._0_4_ = local_680 * fVar332;
          auVar88._8_4_ = fStack_678 * fVar348;
          auVar88._12_4_ = fStack_674 * fVar385;
          auVar88._16_4_ = fStack_670 * fVar140;
          auVar88._20_4_ = fStack_66c * fVar141;
          auVar88._24_4_ = fStack_668 * fVar142;
          auVar88._28_4_ = 0x3e000000;
          local_920 = vsubps_avx(auVar88,auVar252);
          auVar214._0_4_ = local_8e0 + fVar235 * fVar261;
          auVar214._4_4_ = fStack_8dc + fVar238 * fVar262;
          auVar214._8_4_ = fStack_8d8 + fVar241 * fVar291;
          auVar214._12_4_ = aStack_8d4.w + fVar260 * fVar293;
          auVar214._16_4_ = fStack_8d0 + fVar287 * fVar306;
          auVar214._20_4_ = fStack_8cc + fVar304 * fVar307;
          auVar214._24_4_ = fStack_8c8 + fVar323 * fVar329;
          auVar214._28_4_ = fStack_8c4 + auVar213._28_4_ + auVar29._28_4_ + local_5a0._28_4_;
          auVar89._4_4_ = fVar338 * fStack_7fc;
          auVar89._0_4_ = fVar332 * local_800;
          auVar89._8_4_ = fVar348 * fStack_7f8;
          auVar89._12_4_ = fVar385 * fStack_7f4;
          auVar89._16_4_ = fVar140 * fStack_7f0;
          auVar89._20_4_ = fVar141 * fStack_7ec;
          auVar89._24_4_ = fVar142 * fStack_7e8;
          auVar89._28_4_ = auVar252._28_4_;
          auVar213 = vsubps_avx(auVar89,auVar214);
          _local_b60 = auVar213._0_28_;
          fVar237 = (fVar217 * local_580 + local_5a0._0_4_) * fVar237;
          fVar240 = (fVar236 * fStack_57c + local_5a0._4_4_) * fVar240;
          fVar259 = (fVar277 * fStack_578 + local_5a0._8_4_) * fVar259;
          fVar264 = (fVar239 * fStack_574 + local_5a0._12_4_) * fVar264;
          fVar302 = (fVar285 * fStack_570 + local_5a0._16_4_) * fVar302;
          fVar308 = (fVar258 * fStack_56c + local_5a0._20_4_) * fVar308;
          fVar335 = (fVar278 * fStack_568 + local_5a0._24_4_) * fVar335;
          auVar215._0_4_ = local_900 + fVar237 * fVar274;
          auVar215._4_4_ = fStack_8fc + fVar240 * fVar283;
          auVar215._8_4_ = fStack_8f8 + fVar259 * fVar275;
          auVar215._12_4_ = fStack_8f4 + fVar264 * fVar281;
          auVar215._16_4_ = fStack_8f0 + fVar302 * fVar290;
          auVar215._20_4_ = fStack_8ec + fVar308 * fVar305;
          auVar215._24_4_ = fStack_8e8 + fVar335 * fVar326;
          auVar215._28_4_ = fStack_8e4 + auVar213._28_4_ + local_5a0._28_4_;
          auVar90._4_4_ = fStack_65c * fVar236;
          auVar90._0_4_ = local_660 * fVar217;
          auVar90._8_4_ = fStack_658 * fVar277;
          auVar90._12_4_ = fStack_654 * fVar239;
          auVar90._16_4_ = fStack_650 * fVar285;
          auVar90._20_4_ = fStack_64c * fVar258;
          auVar90._24_4_ = fStack_648 * fVar278;
          auVar90._28_4_ = 0x3e000000;
          auVar213 = vsubps_avx(auVar90,auVar215);
          auVar272._0_4_ = (float)local_b80._0_4_ + fVar265 * fVar237;
          auVar272._4_4_ = (float)local_b80._4_4_ + fVar280 * fVar240;
          auVar272._8_4_ = fStack_b78 + fVar289 * fVar259;
          auVar272._12_4_ = fStack_b74 + fVar263 * fVar264;
          auVar272._16_4_ = fStack_b70 + fVar286 * fVar302;
          auVar272._20_4_ = fStack_b6c + fVar303 * fVar308;
          auVar272._24_4_ = fStack_b68 + fVar320 * fVar335;
          auVar272._28_4_ = fStack_b64 + 0.125;
          auVar91._4_4_ = fStack_67c * fVar236;
          auVar91._0_4_ = local_680 * fVar217;
          auVar91._8_4_ = fStack_678 * fVar277;
          auVar91._12_4_ = fStack_674 * fVar239;
          auVar91._16_4_ = fStack_670 * fVar285;
          auVar91._20_4_ = fStack_66c * fVar258;
          auVar91._24_4_ = fStack_668 * fVar278;
          auVar91._28_4_ = fStack_644;
          auVar28 = vsubps_avx(auVar91,auVar272);
          auVar273 = ZEXT3264(auVar28);
          auVar253._0_4_ = local_8e0 + fVar235 * fVar237;
          auVar253._4_4_ = fStack_8dc + fVar238 * fVar240;
          auVar253._8_4_ = fStack_8d8 + fVar241 * fVar259;
          auVar253._12_4_ = aStack_8d4.w + fVar260 * fVar264;
          auVar253._16_4_ = fStack_8d0 + fVar287 * fVar302;
          auVar253._20_4_ = fStack_8cc + fVar304 * fVar308;
          auVar253._24_4_ = fStack_8c8 + fVar323 * fVar335;
          auVar253._28_4_ = fStack_8c4 + auVar252._28_4_;
          auVar92._4_4_ = fVar236 * fStack_7fc;
          auVar92._0_4_ = fVar217 * local_800;
          auVar92._8_4_ = fVar277 * fStack_7f8;
          auVar92._12_4_ = fVar239 * fStack_7f4;
          auVar92._16_4_ = fVar285 * fStack_7f0;
          auVar92._20_4_ = fVar258 * fStack_7ec;
          auVar92._24_4_ = fVar278 * fStack_7e8;
          auVar92._28_4_ = fStack_644;
          auVar28 = vsubps_avx(auVar92,auVar253);
          auVar257 = ZEXT3264(auVar28);
          auVar356 = vcmpps_avx(auVar27,auVar356,5);
          auVar319._8_4_ = 0x7f800000;
          auVar319._0_8_ = 0x7f8000007f800000;
          auVar319._12_4_ = 0x7f800000;
          auVar319._16_4_ = 0x7f800000;
          auVar319._20_4_ = 0x7f800000;
          auVar319._24_4_ = 0x7f800000;
          auVar319._28_4_ = 0x7f800000;
          auVar318 = vblendvps_avx(auVar319,auVar85,auVar356);
          auVar27 = vmaxps_avx(local_540,local_3c0);
          auVar93._4_4_ = auVar27._4_4_ * 1.9073486e-06;
          auVar93._0_4_ = auVar27._0_4_ * 1.9073486e-06;
          auVar93._8_4_ = auVar27._8_4_ * 1.9073486e-06;
          auVar93._12_4_ = auVar27._12_4_ * 1.9073486e-06;
          auVar93._16_4_ = auVar27._16_4_ * 1.9073486e-06;
          auVar93._20_4_ = auVar27._20_4_ * 1.9073486e-06;
          auVar93._24_4_ = auVar27._24_4_ * 1.9073486e-06;
          auVar93._28_4_ = auVar27._28_4_;
          auVar27 = vcmpps_avx(local_2e0,auVar93,1);
          auVar358._8_4_ = 0xff800000;
          auVar358._0_8_ = 0xff800000ff800000;
          auVar358._12_4_ = 0xff800000;
          auVar358._16_4_ = 0xff800000;
          auVar358._20_4_ = 0xff800000;
          auVar358._24_4_ = 0xff800000;
          auVar358._28_4_ = 0xff800000;
          auVar357 = vblendvps_avx(auVar358,auVar86,auVar356);
          auVar28 = auVar356 & auVar27;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            auVar163 = vandps_avx(auVar27,auVar356);
            auVar201 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
            auVar27 = vcmpps_avx(auVar26,_DAT_01f7b000,2);
            auVar170._8_4_ = 0xff800000;
            auVar170._0_8_ = 0xff800000ff800000;
            auVar170._12_4_ = 0xff800000;
            auVar170._16_4_ = 0xff800000;
            auVar170._20_4_ = 0xff800000;
            auVar170._24_4_ = 0xff800000;
            auVar170._28_4_ = 0xff800000;
            auVar234._8_4_ = 0x7f800000;
            auVar234._0_8_ = 0x7f8000007f800000;
            auVar234._12_4_ = 0x7f800000;
            auVar234._16_4_ = 0x7f800000;
            auVar234._20_4_ = 0x7f800000;
            auVar234._24_4_ = 0x7f800000;
            auVar234._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar234,auVar170,auVar27);
            auVar30 = vpmovsxwd_avx(auVar201);
            auVar201 = vpunpckhwd_avx(auVar201,auVar201);
            auVar406._16_16_ = auVar201;
            auVar406._0_16_ = auVar30;
            auVar318 = vblendvps_avx(auVar318,auVar26,auVar406);
            auVar26 = vblendvps_avx(auVar170,auVar234,auVar27);
            auVar357 = vblendvps_avx(auVar357,auVar26,auVar406);
            auVar192._0_8_ = auVar163._0_8_ ^ 0xffffffffffffffff;
            auVar192._8_4_ = auVar163._8_4_ ^ 0xffffffff;
            auVar192._12_4_ = auVar163._12_4_ ^ 0xffffffff;
            auVar192._16_4_ = auVar163._16_4_ ^ 0xffffffff;
            auVar192._20_4_ = auVar163._20_4_ ^ 0xffffffff;
            auVar192._24_4_ = auVar163._24_4_ ^ 0xffffffff;
            auVar192._28_4_ = auVar163._28_4_ ^ 0xffffffff;
            auVar163 = vorps_avx(auVar27,auVar192);
            auVar163 = vandps_avx(auVar356,auVar163);
          }
          auVar295 = auVar355._0_28_;
          auVar347 = ZEXT3264(local_920);
        }
        auVar359 = ZEXT3264(auVar357);
        fVar217 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar394 = ZEXT3264(CONCAT428(fVar217,CONCAT424(fVar217,CONCAT420(fVar217,CONCAT416(fVar217,
                                                  CONCAT412(fVar217,CONCAT48(fVar217,CONCAT44(
                                                  fVar217,fVar217))))))));
        fVar265 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar235 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar372 = ZEXT3264(CONCAT428(fVar235,CONCAT424(fVar235,CONCAT420(fVar235,CONCAT416(fVar235,
                                                  CONCAT412(fVar235,CONCAT48(fVar235,CONCAT44(
                                                  fVar235,fVar235))))))));
        local_5e0 = local_740;
        local_5c0 = vminps_avx(local_600,auVar318);
        _local_620 = vmaxps_avx(local_740,auVar357);
        auVar26 = vcmpps_avx(local_740,local_5c0,2);
        local_6a0 = vandps_avx(auVar26,auVar124);
        auVar26 = vcmpps_avx(_local_620,local_600,2);
        _local_860 = vandps_avx(auVar124,auVar26);
        auVar124 = vorps_avx(local_6a0,_local_860);
        auVar416 = ZEXT3264(local_a60);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          _local_820 = _local_620;
          fVar274 = local_860._28_4_;
          auVar136._0_4_ =
               fVar217 * auVar213._0_4_ + fVar265 * auVar273._0_4_ + fVar235 * auVar257._0_4_;
          auVar136._4_4_ =
               fVar217 * auVar213._4_4_ + fVar265 * auVar273._4_4_ + fVar235 * auVar257._4_4_;
          auVar136._8_4_ =
               fVar217 * auVar213._8_4_ + fVar265 * auVar273._8_4_ + fVar235 * auVar257._8_4_;
          auVar136._12_4_ =
               fVar217 * auVar213._12_4_ + fVar265 * auVar273._12_4_ + fVar235 * auVar257._12_4_;
          auVar136._16_4_ =
               fVar217 * auVar213._16_4_ + fVar265 * auVar273._16_4_ + fVar235 * auVar257._16_4_;
          auVar136._20_4_ =
               fVar217 * auVar213._20_4_ + fVar265 * auVar273._20_4_ + fVar235 * auVar257._20_4_;
          auVar136._24_4_ =
               fVar217 * auVar213._24_4_ + fVar265 * auVar273._24_4_ + fVar235 * auVar257._24_4_;
          auVar136._28_4_ = fVar274 + fVar274 + auVar124._28_4_;
          auVar186._0_8_ = auVar163._0_8_ ^ 0xffffffffffffffff;
          auVar186._8_4_ = auVar163._8_4_ ^ 0xffffffff;
          auVar186._12_4_ = auVar163._12_4_ ^ 0xffffffff;
          auVar186._16_4_ = auVar163._16_4_ ^ 0xffffffff;
          auVar186._20_4_ = auVar163._20_4_ ^ 0xffffffff;
          auVar186._24_4_ = auVar163._24_4_ ^ 0xffffffff;
          auVar186._28_4_ = auVar163._28_4_ ^ 0xffffffff;
          auVar231._8_4_ = 0x7fffffff;
          auVar231._0_8_ = 0x7fffffff7fffffff;
          auVar231._12_4_ = 0x7fffffff;
          auVar231._16_4_ = 0x7fffffff;
          auVar231._20_4_ = 0x7fffffff;
          auVar231._24_4_ = 0x7fffffff;
          auVar231._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar136,auVar231);
          auVar254._8_4_ = 0x3e99999a;
          auVar254._0_8_ = 0x3e99999a3e99999a;
          auVar254._12_4_ = 0x3e99999a;
          auVar254._16_4_ = 0x3e99999a;
          auVar254._20_4_ = 0x3e99999a;
          auVar254._24_4_ = 0x3e99999a;
          auVar254._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar254,1);
          local_6e0 = vorps_avx(auVar124,auVar186);
          auVar137._0_4_ =
               fVar217 * auVar295._0_4_ +
               auVar347._0_4_ * fVar265 + fVar235 * (float)local_b60._0_4_;
          auVar137._4_4_ =
               fVar217 * auVar295._4_4_ +
               auVar347._4_4_ * fVar265 + fVar235 * (float)local_b60._4_4_;
          auVar137._8_4_ =
               fVar217 * auVar295._8_4_ + auVar347._8_4_ * fVar265 + fVar235 * fStack_b58;
          auVar137._12_4_ =
               fVar217 * auVar295._12_4_ + auVar347._12_4_ * fVar265 + fVar235 * fStack_b54;
          auVar137._16_4_ =
               fVar217 * auVar295._16_4_ + auVar347._16_4_ * fVar265 + fVar235 * fStack_b50;
          auVar137._20_4_ =
               fVar217 * auVar295._20_4_ + auVar347._20_4_ * fVar265 + fVar235 * fStack_b4c;
          auVar137._24_4_ =
               fVar217 * auVar295._24_4_ + auVar347._24_4_ * fVar265 + fVar235 * fStack_b48;
          auVar137._28_4_ = fVar274 + auVar213._28_4_ + local_6e0._28_4_;
          auVar124 = vandps_avx(auVar137,auVar231);
          auVar124 = vcmpps_avx(auVar124,auVar254,1);
          auVar124 = vorps_avx(auVar124,auVar186);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar187,auVar164,auVar124);
          local_760 = ZEXT432(local_b8c);
          auVar30 = vpshufd_avx(ZEXT416(local_b8c),0);
          auVar201 = vpcmpgtd_avx(auVar124._16_16_,auVar30);
          local_700._0_16_ = auVar30;
          auVar30 = vpcmpgtd_avx(auVar124._0_16_,auVar30);
          auVar165._16_16_ = auVar201;
          auVar165._0_16_ = auVar30;
          local_6c0 = vblendps_avx(ZEXT1632(auVar30),auVar165,0xf0);
          auVar124 = vandnps_avx(local_6c0,local_6a0);
          local_840._4_4_ = local_740._4_4_ + local_940._4_4_;
          local_840._0_4_ = local_740._0_4_ + local_940._0_4_;
          fStack_838 = local_740._8_4_ + local_940._8_4_;
          fStack_834 = local_740._12_4_ + local_940._12_4_;
          fStack_830 = local_740._16_4_ + local_940._16_4_;
          fStack_82c = local_740._20_4_ + local_940._20_4_;
          fStack_828 = local_740._24_4_ + local_940._24_4_;
          fStack_824 = local_740._28_4_ + local_940._28_4_;
          while( true ) {
            local_3e0 = auVar124;
            if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar124 >> 0x7f,0) == '\0') &&
                  (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0xbf,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar124[0x1f]) break;
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar163 = vblendvps_avx(auVar166,local_740,auVar124);
            auVar26 = vshufps_avx(auVar163,auVar163,0xb1);
            auVar26 = vminps_avx(auVar163,auVar26);
            auVar356 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar356);
            auVar356 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar356);
            auVar163 = vcmpps_avx(auVar163,auVar26,0);
            auVar26 = auVar124 & auVar163;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar124 = vandps_avx(auVar163,auVar124);
            }
            uVar101 = vmovmskps_avx(auVar124);
            uVar107 = 0;
            if (uVar101 != 0) {
              for (; (uVar101 >> uVar107 & 1) == 0; uVar107 = uVar107 + 1) {
              }
            }
            uVar103 = (ulong)uVar107;
            *(undefined4 *)(local_3e0 + uVar103 * 4) = 0;
            aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
            local_8e0 = aVar9.x;
            fStack_8dc = aVar9.y;
            fStack_8d8 = aVar9.z;
            aStack_8d4 = aVar9.field_3;
            auVar201 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
            fVar217 = local_1a0[uVar103];
            uVar107 = *(uint *)(local_5e0 + uVar103 * 4);
            if (auVar201._0_4_ < 0.0) {
              auVar359 = ZEXT1664(auVar359._0_16_);
              auVar372 = ZEXT1664(auVar372._0_16_);
              auVar394 = ZEXT1664(auVar394._0_16_);
              fVar265 = sqrtf(auVar201._0_4_);
              auVar416 = ZEXT3264(local_a60);
            }
            else {
              auVar201 = vsqrtss_avx(auVar201,auVar201);
              fVar265 = auVar201._0_4_;
            }
            auVar273 = ZEXT464((uint)fVar217);
            auVar30 = vminps_avx(_local_9c0,_local_9e0);
            auVar201 = vmaxps_avx(_local_9c0,_local_9e0);
            auVar31 = vminps_avx(_local_8a0,_local_8c0);
            auVar117 = vminps_avx(auVar30,auVar31);
            auVar30 = vmaxps_avx(_local_8a0,_local_8c0);
            auVar31 = vmaxps_avx(auVar201,auVar30);
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar201 = vandps_avx(auVar117,auVar198);
            auVar30 = vandps_avx(auVar31,auVar198);
            auVar201 = vmaxps_avx(auVar201,auVar30);
            auVar30 = vmovshdup_avx(auVar201);
            auVar30 = vmaxss_avx(auVar30,auVar201);
            auVar201 = vshufpd_avx(auVar201,auVar201,1);
            auVar201 = vmaxss_avx(auVar201,auVar30);
            local_900 = auVar201._0_4_ * 1.9073486e-06;
            local_a40._0_4_ = fVar265 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar31,auVar31,0xff);
            auVar201 = vinsertps_avx(ZEXT416(uVar107),ZEXT416((uint)fVar217),0x10);
            auVar347 = ZEXT1664(auVar201);
            lVar110 = 5;
            do {
              do {
                auVar201 = auVar347._0_16_;
                bVar111 = lVar110 == 0;
                lVar110 = lVar110 + -1;
                if (bVar111) goto LAB_00aca370;
                auVar31 = vmovshdup_avx(auVar201);
                fVar217 = auVar31._0_4_;
                fVar237 = 1.0 - fVar217;
                fVar265 = fVar237 * fVar237;
                fVar235 = fVar237 * fVar265;
                fVar274 = fVar217 * fVar217;
                fVar236 = fVar217 * fVar274;
                fVar277 = fVar217 * fVar237;
                auVar30 = vshufps_avx(ZEXT416((uint)(fVar236 * 0.16666667)),
                                      ZEXT416((uint)(fVar236 * 0.16666667)),0);
                auVar117 = ZEXT416((uint)((fVar236 * 4.0 + fVar235 +
                                          fVar217 * fVar277 * 12.0 + fVar237 * fVar277 * 6.0) *
                                         0.16666667));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar147 = ZEXT416((uint)((fVar235 * 4.0 + fVar236 +
                                          fVar237 * fVar277 * 12.0 + fVar217 * fVar277 * 6.0) *
                                         0.16666667));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar116 = vshufps_avx(auVar201,auVar201,0);
                auVar178._0_4_ = auVar116._0_4_ * local_8e0 + 0.0;
                auVar178._4_4_ = auVar116._4_4_ * fStack_8dc + 0.0;
                auVar178._8_4_ = auVar116._8_4_ * fStack_8d8 + 0.0;
                auVar178._12_4_ = auVar116._12_4_ * aStack_8d4.w + 0.0;
                auVar116 = vshufps_avx(ZEXT416((uint)(fVar235 * 0.16666667)),
                                       ZEXT416((uint)(fVar235 * 0.16666667)),0);
                auVar115._0_4_ =
                     auVar116._0_4_ * (float)local_9c0._0_4_ +
                     auVar147._0_4_ * (float)local_9e0._0_4_ +
                     auVar30._0_4_ * (float)local_8c0._0_4_ +
                     auVar117._0_4_ * (float)local_8a0._0_4_;
                auVar115._4_4_ =
                     auVar116._4_4_ * (float)local_9c0._4_4_ +
                     auVar147._4_4_ * (float)local_9e0._4_4_ +
                     auVar30._4_4_ * (float)local_8c0._4_4_ +
                     auVar117._4_4_ * (float)local_8a0._4_4_;
                auVar115._8_4_ =
                     auVar116._8_4_ * fStack_9b8 +
                     auVar147._8_4_ * fStack_9d8 +
                     auVar30._8_4_ * fStack_8b8 + auVar117._8_4_ * fStack_898;
                auVar115._12_4_ =
                     auVar116._12_4_ * fStack_9b4 +
                     auVar147._12_4_ * fStack_9d4 +
                     auVar30._12_4_ * fStack_8b4 + auVar117._12_4_ * fStack_894;
                local_920._0_16_ = auVar115;
                auVar30 = vsubps_avx(auVar178,auVar115);
                _local_ae0 = auVar30;
                auVar30 = vdpps_avx(auVar30,auVar30,0x7f);
                fVar235 = auVar30._0_4_;
                if (fVar235 < 0.0) {
                  local_a80._0_16_ = auVar31;
                  local_980._0_4_ = fVar274;
                  local_aa0._0_4_ = fVar265;
                  local_ac0._0_4_ = fVar277;
                  fVar236 = sqrtf(fVar235);
                  fVar274 = (float)local_980._0_4_;
                  fVar265 = (float)local_aa0._0_4_;
                  fVar277 = (float)local_ac0._0_4_;
                  fVar217 = (float)local_a80._0_4_;
                }
                else {
                  auVar31 = vsqrtss_avx(auVar30,auVar30);
                  fVar236 = auVar31._0_4_;
                }
                auVar31 = vshufps_avx(ZEXT416((uint)(fVar274 * 0.5)),ZEXT416((uint)(fVar274 * 0.5)),
                                      0);
                auVar117 = ZEXT416((uint)((fVar265 + fVar277 * 4.0) * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar147 = ZEXT416((uint)((fVar217 * -fVar217 - fVar277 * 4.0) * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar116 = ZEXT416((uint)(fVar237 * -fVar237 * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar311._0_4_ =
                     (float)local_9c0._0_4_ * auVar116._0_4_ +
                     (float)local_9e0._0_4_ * auVar147._0_4_ +
                     (float)local_8c0._0_4_ * auVar31._0_4_ +
                     (float)local_8a0._0_4_ * auVar117._0_4_;
                auVar311._4_4_ =
                     (float)local_9c0._4_4_ * auVar116._4_4_ +
                     (float)local_9e0._4_4_ * auVar147._4_4_ +
                     (float)local_8c0._4_4_ * auVar31._4_4_ +
                     (float)local_8a0._4_4_ * auVar117._4_4_;
                auVar311._8_4_ =
                     fStack_9b8 * auVar116._8_4_ +
                     fStack_9d8 * auVar147._8_4_ +
                     fStack_8b8 * auVar31._8_4_ + fStack_898 * auVar117._8_4_;
                auVar311._12_4_ =
                     fStack_9b4 * auVar116._12_4_ +
                     fStack_9d4 * auVar147._12_4_ +
                     fStack_8b4 * auVar31._12_4_ + fStack_894 * auVar117._12_4_;
                auVar31 = vshufps_avx(auVar201,auVar201,0x55);
                auVar117 = ZEXT416((uint)(fVar237 - (fVar217 + fVar217)));
                auVar147 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)(fVar217 - (fVar237 + fVar237)));
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar32 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
                auVar117 = vdpps_avx(auVar311,auVar311,0x7f);
                auVar148._0_4_ =
                     (float)local_9c0._0_4_ * auVar32._0_4_ +
                     (float)local_9e0._0_4_ * auVar116._0_4_ +
                     (float)local_8c0._0_4_ * auVar31._0_4_ +
                     (float)local_8a0._0_4_ * auVar147._0_4_;
                auVar148._4_4_ =
                     (float)local_9c0._4_4_ * auVar32._4_4_ +
                     (float)local_9e0._4_4_ * auVar116._4_4_ +
                     (float)local_8c0._4_4_ * auVar31._4_4_ +
                     (float)local_8a0._4_4_ * auVar147._4_4_;
                auVar148._8_4_ =
                     fStack_9b8 * auVar32._8_4_ +
                     fStack_9d8 * auVar116._8_4_ +
                     fStack_8b8 * auVar31._8_4_ + fStack_898 * auVar147._8_4_;
                auVar148._12_4_ =
                     fStack_9b4 * auVar32._12_4_ +
                     fStack_9d4 * auVar116._12_4_ +
                     fStack_8b4 * auVar31._12_4_ + fStack_894 * auVar147._12_4_;
                auVar31 = vblendps_avx(auVar117,_DAT_01f45a50,0xe);
                auVar147 = vrsqrtss_avx(auVar31,auVar31);
                fVar265 = auVar147._0_4_;
                fVar217 = auVar117._0_4_;
                auVar147 = vdpps_avx(auVar311,auVar148,0x7f);
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar149._0_4_ = auVar148._0_4_ * auVar116._0_4_;
                auVar149._4_4_ = auVar148._4_4_ * auVar116._4_4_;
                auVar149._8_4_ = auVar148._8_4_ * auVar116._8_4_;
                auVar149._12_4_ = auVar148._12_4_ * auVar116._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar220._0_4_ = auVar311._0_4_ * auVar147._0_4_;
                auVar220._4_4_ = auVar311._4_4_ * auVar147._4_4_;
                auVar220._8_4_ = auVar311._8_4_ * auVar147._8_4_;
                auVar220._12_4_ = auVar311._12_4_ * auVar147._12_4_;
                auVar32 = vsubps_avx(auVar149,auVar220);
                auVar147 = vrcpss_avx(auVar31,auVar31);
                auVar31 = vmaxss_avx(ZEXT416((uint)local_900),
                                     ZEXT416((uint)(auVar347._0_4_ * (float)local_a40._0_4_)));
                auVar359 = ZEXT1664(auVar31);
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar217 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar103 = CONCAT44(auVar311._4_4_,auVar311._0_4_);
                auVar244._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar244._8_4_ = -auVar311._8_4_;
                auVar244._12_4_ = -auVar311._12_4_;
                auVar116 = ZEXT416((uint)(fVar265 * 1.5 +
                                         fVar217 * -0.5 * fVar265 * fVar265 * fVar265));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar199._0_4_ = auVar116._0_4_ * auVar32._0_4_ * auVar147._0_4_;
                auVar199._4_4_ = auVar116._4_4_ * auVar32._4_4_ * auVar147._4_4_;
                auVar199._8_4_ = auVar116._8_4_ * auVar32._8_4_ * auVar147._8_4_;
                auVar199._12_4_ = auVar116._12_4_ * auVar32._12_4_ * auVar147._12_4_;
                auVar268._0_4_ = auVar311._0_4_ * auVar116._0_4_;
                auVar268._4_4_ = auVar311._4_4_ * auVar116._4_4_;
                auVar268._8_4_ = auVar311._8_4_ * auVar116._8_4_;
                auVar268._12_4_ = auVar311._12_4_ * auVar116._12_4_;
                local_a80._0_4_ = auVar31._0_4_;
                if (fVar217 < 0.0) {
                  local_980._0_4_ = fVar236;
                  local_aa0._0_16_ = auVar244;
                  local_ac0._0_16_ = auVar268;
                  local_9a0._0_16_ = auVar199;
                  fVar217 = sqrtf(fVar217);
                  auVar359 = ZEXT464((uint)local_a80._0_4_);
                  auVar199 = local_9a0._0_16_;
                  auVar244 = local_aa0._0_16_;
                  auVar268 = local_ac0._0_16_;
                  fVar236 = (float)local_980._0_4_;
                }
                else {
                  auVar31 = vsqrtss_avx(auVar117,auVar117);
                  fVar217 = auVar31._0_4_;
                }
                auVar31 = vdpps_avx(_local_ae0,auVar268,0x7f);
                fVar217 = (local_900 / fVar217) * (fVar236 + 1.0) +
                          auVar359._0_4_ + fVar236 * local_900;
                auVar117 = vdpps_avx(auVar244,auVar268,0x7f);
                auVar147 = vdpps_avx(_local_ae0,auVar199,0x7f);
                auVar96._4_4_ = fStack_8dc;
                auVar96._0_4_ = local_8e0;
                auVar96._8_4_ = fStack_8d8;
                auVar96._12_4_ = aStack_8d4.a;
                auVar116 = vdpps_avx(auVar96,auVar268,0x7f);
                auVar32 = vdpps_avx(_local_ae0,auVar244,0x7f);
                fVar265 = auVar117._0_4_ + auVar147._0_4_;
                fVar274 = auVar31._0_4_;
                auVar118._0_4_ = fVar274 * fVar274;
                auVar118._4_4_ = auVar31._4_4_ * auVar31._4_4_;
                auVar118._8_4_ = auVar31._8_4_ * auVar31._8_4_;
                auVar118._12_4_ = auVar31._12_4_ * auVar31._12_4_;
                auVar147 = vsubps_avx(auVar30,auVar118);
                auVar117 = vdpps_avx(_local_ae0,auVar96,0x7f);
                fVar236 = auVar32._0_4_ - fVar274 * fVar265;
                fVar277 = auVar117._0_4_ - fVar274 * auVar116._0_4_;
                auVar117 = vrsqrtss_avx(auVar147,auVar147);
                fVar237 = auVar147._0_4_;
                fVar274 = auVar117._0_4_;
                fVar274 = fVar274 * 1.5 + fVar237 * -0.5 * fVar274 * fVar274 * fVar274;
                if (fVar237 < 0.0) {
                  local_980._0_16_ = auVar31;
                  local_aa0._0_4_ = fVar217;
                  local_ac0._0_16_ = auVar116;
                  local_9a0._0_16_ = ZEXT416((uint)fVar265);
                  local_780._0_4_ = fVar236;
                  local_7a0._0_4_ = fVar277;
                  local_7c0._0_4_ = fVar274;
                  fVar237 = sqrtf(fVar237);
                  auVar359 = ZEXT464((uint)local_a80._0_4_);
                  fVar274 = (float)local_7c0._0_4_;
                  fVar236 = (float)local_780._0_4_;
                  fVar277 = (float)local_7a0._0_4_;
                  auVar116 = local_ac0._0_16_;
                  fVar217 = (float)local_aa0._0_4_;
                  auVar31 = local_980._0_16_;
                  auVar117 = local_9a0._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar147,auVar147);
                  fVar237 = auVar117._0_4_;
                  auVar117 = ZEXT416((uint)fVar265);
                }
                auVar394 = ZEXT1664(auVar31);
                auVar372 = ZEXT464((uint)fVar217);
                auVar416 = ZEXT3264(local_a60);
                auVar32 = vpermilps_avx(local_920._0_16_,0xff);
                auVar368 = vshufps_avx(auVar311,auVar311,0xff);
                fVar236 = fVar236 * fVar274 - auVar368._0_4_;
                auVar221._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar221._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar221._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar245._0_4_ = -fVar236;
                auVar245._4_4_ = 0x80000000;
                auVar245._8_4_ = 0x80000000;
                auVar245._12_4_ = 0x80000000;
                fVar265 = auVar117._0_4_ * fVar277 * fVar274;
                auVar273 = ZEXT464((uint)fVar265);
                auVar147 = vinsertps_avx(auVar245,ZEXT416((uint)(fVar277 * fVar274)),0x1c);
                auVar116 = vmovsldup_avx(ZEXT416((uint)(fVar265 - auVar116._0_4_ * fVar236)));
                auVar147 = vdivps_avx(auVar147,auVar116);
                auVar117 = vinsertps_avx(auVar117,auVar221,0x10);
                auVar117 = vdivps_avx(auVar117,auVar116);
                auVar116 = vmovsldup_avx(auVar31);
                auVar119 = ZEXT416((uint)(fVar237 - auVar32._0_4_));
                auVar32 = vmovsldup_avx(auVar119);
                auVar179._0_4_ = auVar116._0_4_ * auVar147._0_4_ + auVar32._0_4_ * auVar117._0_4_;
                auVar179._4_4_ = auVar116._4_4_ * auVar147._4_4_ + auVar32._4_4_ * auVar117._4_4_;
                auVar179._8_4_ = auVar116._8_4_ * auVar147._8_4_ + auVar32._8_4_ * auVar117._8_4_;
                auVar179._12_4_ =
                     auVar116._12_4_ * auVar147._12_4_ + auVar32._12_4_ * auVar117._12_4_;
                auVar117 = vsubps_avx(auVar201,auVar179);
                auVar347 = ZEXT1664(auVar117);
                auVar180._8_4_ = 0x7fffffff;
                auVar180._0_8_ = 0x7fffffff7fffffff;
                auVar180._12_4_ = 0x7fffffff;
                auVar201 = vandps_avx(auVar31,auVar180);
              } while (fVar217 <= auVar201._0_4_);
              auVar200._8_4_ = 0x7fffffff;
              auVar200._0_8_ = 0x7fffffff7fffffff;
              auVar200._12_4_ = 0x7fffffff;
              auVar201 = vandps_avx(auVar119,auVar200);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar359._0_4_ + fVar217 <=
                     auVar201._0_4_);
            fVar265 = auVar117._0_4_ + (float)local_880._0_4_;
            if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar265) {
              fVar274 = (ray->super_RayK<1>).tfar;
              auVar273 = ZEXT464((uint)fVar274);
              if (fVar265 <= fVar274) {
                auVar201 = vmovshdup_avx(auVar117);
                fVar236 = auVar201._0_4_;
                if ((0.0 <= fVar236) && (fVar236 <= 1.0)) {
                  auVar201 = vrsqrtss_avx(auVar30,auVar30);
                  fVar277 = auVar201._0_4_;
                  pGVar20 = (context->scene->geometries).items[uVar106].ptr;
                  if ((pGVar20->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar201 = ZEXT416((uint)(fVar277 * 1.5 +
                                             fVar235 * -0.5 * fVar277 * fVar277 * fVar277));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar202._0_4_ = auVar201._0_4_ * (float)local_ae0._0_4_;
                    auVar202._4_4_ = auVar201._4_4_ * (float)local_ae0._4_4_;
                    auVar202._8_4_ = auVar201._8_4_ * fStack_ad8;
                    auVar202._12_4_ = auVar201._12_4_ * fStack_ad4;
                    auVar150._0_4_ = auVar311._0_4_ + auVar368._0_4_ * auVar202._0_4_;
                    auVar150._4_4_ = auVar311._4_4_ + auVar368._4_4_ * auVar202._4_4_;
                    auVar150._8_4_ = auVar311._8_4_ + auVar368._8_4_ * auVar202._8_4_;
                    auVar150._12_4_ = auVar311._12_4_ + auVar368._12_4_ * auVar202._12_4_;
                    auVar201 = vshufps_avx(auVar202,auVar202,0xc9);
                    auVar30 = vshufps_avx(auVar311,auVar311,0xc9);
                    auVar203._0_4_ = auVar30._0_4_ * auVar202._0_4_;
                    auVar203._4_4_ = auVar30._4_4_ * auVar202._4_4_;
                    auVar203._8_4_ = auVar30._8_4_ * auVar202._8_4_;
                    auVar203._12_4_ = auVar30._12_4_ * auVar202._12_4_;
                    auVar222._0_4_ = auVar311._0_4_ * auVar201._0_4_;
                    auVar222._4_4_ = auVar311._4_4_ * auVar201._4_4_;
                    auVar222._8_4_ = auVar311._8_4_ * auVar201._8_4_;
                    auVar222._12_4_ = auVar311._12_4_ * auVar201._12_4_;
                    auVar147 = vsubps_avx(auVar222,auVar203);
                    auVar201 = vshufps_avx(auVar147,auVar147,0xc9);
                    auVar30 = vshufps_avx(auVar150,auVar150,0xc9);
                    auVar223._0_4_ = auVar30._0_4_ * auVar201._0_4_;
                    auVar223._4_4_ = auVar30._4_4_ * auVar201._4_4_;
                    auVar223._8_4_ = auVar30._8_4_ * auVar201._8_4_;
                    auVar223._12_4_ = auVar30._12_4_ * auVar201._12_4_;
                    auVar201 = vshufps_avx(auVar147,auVar147,0xd2);
                    auVar151._0_4_ = auVar150._0_4_ * auVar201._0_4_;
                    auVar151._4_4_ = auVar150._4_4_ * auVar201._4_4_;
                    auVar151._8_4_ = auVar150._8_4_ * auVar201._8_4_;
                    auVar151._12_4_ = auVar150._12_4_ * auVar201._12_4_;
                    auVar30 = vsubps_avx(auVar223,auVar151);
                    auVar201 = vshufps_avx(auVar30,auVar30,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar265;
                      uVar8 = vmovlps_avx(auVar201);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                      (ray->Ng).field_0.field_0.z = auVar30._0_4_;
                      ray->u = fVar236;
                      ray->v = 0.0;
                      ray->primID = local_960._0_4_;
                      ray->geomID = uVar106;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_a10 = vmovlps_avx(auVar201);
                      local_a08 = auVar30._0_4_;
                      local_a04 = fVar236;
                      local_a00 = 0;
                      local_9fc = local_960._0_4_;
                      local_9f8 = uVar106;
                      local_9f4 = context->user->instID[0];
                      local_9f0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar265;
                      local_720._0_4_ = 0xffffffff;
                      local_b18.valid = (int *)local_720;
                      local_b18.geometryUserPtr = pGVar20->userPtr;
                      local_b18.context = context->user;
                      local_b18.hit = (RTCHitN *)&local_a10;
                      local_b18.N = 1;
                      local_b18.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00aca486:
                        p_Var25 = context->args->filter;
                        if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar273 = ZEXT1664(auVar273._0_16_);
                          auVar347 = ZEXT1664(auVar347._0_16_);
                          auVar359 = ZEXT1664(auVar359._0_16_);
                          auVar372 = ZEXT1664(auVar372._0_16_);
                          auVar394 = ZEXT1664(auVar394._0_16_);
                          (*p_Var25)(&local_b18);
                          auVar416 = ZEXT3264(local_a60);
                          if (*local_b18.valid == 0) goto LAB_00aca526;
                        }
                        (((Vec3f *)((long)local_b18.ray + 0x30))->field_0).components[0] =
                             *(float *)local_b18.hit;
                        (((Vec3f *)((long)local_b18.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_b18.hit + 4);
                        (((Vec3f *)((long)local_b18.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_b18.hit + 8);
                        *(float *)((long)local_b18.ray + 0x3c) = *(float *)(local_b18.hit + 0xc);
                        *(float *)((long)local_b18.ray + 0x40) = *(float *)(local_b18.hit + 0x10);
                        *(float *)((long)local_b18.ray + 0x44) = *(float *)(local_b18.hit + 0x14);
                        *(float *)((long)local_b18.ray + 0x48) = *(float *)(local_b18.hit + 0x18);
                        *(float *)((long)local_b18.ray + 0x4c) = *(float *)(local_b18.hit + 0x1c);
                        *(float *)((long)local_b18.ray + 0x50) = *(float *)(local_b18.hit + 0x20);
                      }
                      else {
                        auVar273 = ZEXT464((uint)fVar274);
                        auVar347 = ZEXT1664(auVar117);
                        auVar359 = ZEXT1664(auVar359._0_16_);
                        auVar372 = ZEXT464((uint)fVar217);
                        auVar394 = ZEXT1664(auVar31);
                        (*pGVar20->intersectionFilterN)(&local_b18);
                        auVar416 = ZEXT3264(local_a60);
                        if (*local_b18.valid != 0) goto LAB_00aca486;
LAB_00aca526:
                        (ray->super_RayK<1>).tfar = fVar274;
                      }
                    }
                  }
                }
              }
            }
LAB_00aca370:
            fVar217 = (ray->super_RayK<1>).tfar;
            auVar138._4_4_ = fVar217;
            auVar138._0_4_ = fVar217;
            auVar138._8_4_ = fVar217;
            auVar138._12_4_ = fVar217;
            auVar138._16_4_ = fVar217;
            auVar138._20_4_ = fVar217;
            auVar138._24_4_ = fVar217;
            auVar138._28_4_ = fVar217;
            auVar124 = vcmpps_avx(_local_840,auVar138,2);
            auVar124 = vandps_avx(auVar124,local_3e0);
          }
          auVar167._0_4_ = local_940._0_4_ + (float)local_820._0_4_;
          auVar167._4_4_ = local_940._4_4_ + (float)local_820._4_4_;
          auVar167._8_4_ = local_940._8_4_ + fStack_818;
          auVar167._12_4_ = local_940._12_4_ + fStack_814;
          auVar167._16_4_ = local_940._16_4_ + fStack_810;
          auVar167._20_4_ = local_940._20_4_ + fStack_80c;
          auVar167._24_4_ = local_940._24_4_ + fStack_808;
          auVar167._28_4_ = local_940._28_4_ + fStack_804;
          auVar124 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
          fVar217 = (ray->super_RayK<1>).tfar;
          auVar188._4_4_ = fVar217;
          auVar188._0_4_ = fVar217;
          auVar188._8_4_ = fVar217;
          auVar188._12_4_ = fVar217;
          auVar188._16_4_ = fVar217;
          auVar188._20_4_ = fVar217;
          auVar188._24_4_ = fVar217;
          auVar188._28_4_ = fVar217;
          auVar163 = vcmpps_avx(auVar167,auVar188,2);
          _local_840 = vandps_avx(auVar163,_local_860);
          auVar168._8_4_ = 3;
          auVar168._0_8_ = 0x300000003;
          auVar168._12_4_ = 3;
          auVar168._16_4_ = 3;
          auVar168._20_4_ = 3;
          auVar168._24_4_ = 3;
          auVar168._28_4_ = 3;
          auVar189._8_4_ = 2;
          auVar189._0_8_ = 0x200000002;
          auVar189._12_4_ = 2;
          auVar189._16_4_ = 2;
          auVar189._20_4_ = 2;
          auVar189._24_4_ = 2;
          auVar189._28_4_ = 2;
          auVar163 = vblendvps_avx(auVar189,auVar168,local_6e0);
          auVar201 = vpcmpgtd_avx(auVar163._16_16_,local_700._0_16_);
          auVar30 = vpshufd_avx(local_760._0_16_,0);
          auVar30 = vpcmpgtd_avx(auVar163._0_16_,auVar30);
          auVar190._16_16_ = auVar201;
          auVar190._0_16_ = auVar124._0_16_;
          _local_860 = vblendps_avx(ZEXT1632(auVar30),auVar190,0xf0);
          auVar163 = vandnps_avx(_local_860,_local_840);
          local_740 = _local_620;
          local_820._4_4_ = local_940._4_4_ + (float)local_620._4_4_;
          local_820._0_4_ = local_940._0_4_ + (float)local_620._0_4_;
          fStack_818 = local_940._8_4_ + fStack_618;
          fStack_814 = local_940._12_4_ + fStack_614;
          fStack_810 = local_940._16_4_ + fStack_610;
          fStack_80c = local_940._20_4_ + fStack_60c;
          fStack_808 = local_940._24_4_ + fStack_608;
          fStack_804 = local_940._28_4_ + fStack_604;
          while( true ) {
            auVar301 = ZEXT3264(local_940);
            local_720 = auVar163;
            if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar163 >> 0x7f,0) == '\0') &&
                  (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar163 >> 0xbf,0) == '\0') &&
                (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar163[0x1f]) break;
            auVar139._8_4_ = 0x7f800000;
            auVar139._0_8_ = 0x7f8000007f800000;
            auVar139._12_4_ = 0x7f800000;
            auVar139._16_4_ = 0x7f800000;
            auVar139._20_4_ = 0x7f800000;
            auVar139._24_4_ = 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar124 = vblendvps_avx(auVar139,local_740,auVar163);
            auVar26 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar26 = vminps_avx(auVar124,auVar26);
            auVar356 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar356);
            auVar356 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar356);
            auVar124 = vcmpps_avx(auVar124,auVar26,0);
            auVar26 = auVar163 & auVar124;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar163 = vandps_avx(auVar124,auVar163);
            }
            uVar101 = vmovmskps_avx(auVar163);
            uVar107 = 0;
            if (uVar101 != 0) {
              for (; (uVar101 >> uVar107 & 1) == 0; uVar107 = uVar107 + 1) {
              }
            }
            uVar103 = (ulong)uVar107;
            *(undefined4 *)(local_720 + uVar103 * 4) = 0;
            aVar9 = (ray->super_RayK<1>).dir.field_0.field_1;
            local_8e0 = aVar9.x;
            fStack_8dc = aVar9.y;
            fStack_8d8 = aVar9.z;
            aStack_8d4 = aVar9.field_3;
            auVar201 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
            fVar217 = local_1c0[uVar103];
            uVar107 = *(uint *)(local_600 + uVar103 * 4);
            if (auVar201._0_4_ < 0.0) {
              auVar347 = ZEXT1664(auVar347._0_16_);
              auVar372 = ZEXT1664(auVar372._0_16_);
              auVar394 = ZEXT1664(auVar394._0_16_);
              fVar265 = sqrtf(auVar201._0_4_);
              auVar416 = ZEXT3264(local_a60);
            }
            else {
              auVar201 = vsqrtss_avx(auVar201,auVar201);
              fVar265 = auVar201._0_4_;
            }
            auVar273 = ZEXT464((uint)fVar217);
            auVar30 = vminps_avx(_local_9c0,_local_9e0);
            auVar201 = vmaxps_avx(_local_9c0,_local_9e0);
            auVar31 = vminps_avx(_local_8a0,_local_8c0);
            auVar117 = vminps_avx(auVar30,auVar31);
            auVar30 = vmaxps_avx(_local_8a0,_local_8c0);
            auVar31 = vmaxps_avx(auVar201,auVar30);
            auVar204._8_4_ = 0x7fffffff;
            auVar204._0_8_ = 0x7fffffff7fffffff;
            auVar204._12_4_ = 0x7fffffff;
            auVar201 = vandps_avx(auVar117,auVar204);
            auVar30 = vandps_avx(auVar31,auVar204);
            auVar201 = vmaxps_avx(auVar201,auVar30);
            auVar30 = vmovshdup_avx(auVar201);
            auVar30 = vmaxss_avx(auVar30,auVar201);
            auVar201 = vshufpd_avx(auVar201,auVar201,1);
            auVar201 = vmaxss_avx(auVar201,auVar30);
            local_900 = auVar201._0_4_ * 1.9073486e-06;
            local_980._0_4_ = fVar265 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar31,auVar31,0xff);
            auVar201 = vinsertps_avx(ZEXT416(uVar107),ZEXT416((uint)fVar217),0x10);
            auVar359 = ZEXT1664(auVar201);
            lVar110 = 5;
            do {
              do {
                auVar201 = auVar359._0_16_;
                bVar111 = lVar110 == 0;
                lVar110 = lVar110 + -1;
                if (bVar111) goto LAB_00acae15;
                auVar31 = vmovshdup_avx(auVar201);
                fVar217 = auVar31._0_4_;
                fVar237 = 1.0 - fVar217;
                fVar265 = fVar237 * fVar237;
                fVar235 = fVar237 * fVar265;
                fVar274 = fVar217 * fVar217;
                fVar236 = fVar217 * fVar274;
                fVar277 = fVar217 * fVar237;
                auVar30 = vshufps_avx(ZEXT416((uint)(fVar236 * 0.16666667)),
                                      ZEXT416((uint)(fVar236 * 0.16666667)),0);
                auVar117 = ZEXT416((uint)((fVar236 * 4.0 + fVar235 +
                                          fVar217 * fVar277 * 12.0 + fVar237 * fVar277 * 6.0) *
                                         0.16666667));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar147 = ZEXT416((uint)((fVar235 * 4.0 + fVar236 +
                                          fVar237 * fVar277 * 12.0 + fVar217 * fVar277 * 6.0) *
                                         0.16666667));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar116 = vshufps_avx(auVar201,auVar201,0);
                auVar181._0_4_ = auVar116._0_4_ * local_8e0 + 0.0;
                auVar181._4_4_ = auVar116._4_4_ * fStack_8dc + 0.0;
                auVar181._8_4_ = auVar116._8_4_ * fStack_8d8 + 0.0;
                auVar181._12_4_ = auVar116._12_4_ * aStack_8d4.w + 0.0;
                auVar116 = vshufps_avx(ZEXT416((uint)(fVar235 * 0.16666667)),
                                       ZEXT416((uint)(fVar235 * 0.16666667)),0);
                auVar120._0_4_ =
                     auVar116._0_4_ * (float)local_9c0._0_4_ +
                     auVar147._0_4_ * (float)local_9e0._0_4_ +
                     auVar30._0_4_ * (float)local_8c0._0_4_ +
                     auVar117._0_4_ * (float)local_8a0._0_4_;
                auVar120._4_4_ =
                     auVar116._4_4_ * (float)local_9c0._4_4_ +
                     auVar147._4_4_ * (float)local_9e0._4_4_ +
                     auVar30._4_4_ * (float)local_8c0._4_4_ +
                     auVar117._4_4_ * (float)local_8a0._4_4_;
                auVar120._8_4_ =
                     auVar116._8_4_ * fStack_9b8 +
                     auVar147._8_4_ * fStack_9d8 +
                     auVar30._8_4_ * fStack_8b8 + auVar117._8_4_ * fStack_898;
                auVar120._12_4_ =
                     auVar116._12_4_ * fStack_9b4 +
                     auVar147._12_4_ * fStack_9d4 +
                     auVar30._12_4_ * fStack_8b4 + auVar117._12_4_ * fStack_894;
                local_920._0_16_ = auVar120;
                auVar30 = vsubps_avx(auVar181,auVar120);
                _local_ae0 = auVar30;
                auVar30 = vdpps_avx(auVar30,auVar30,0x7f);
                fVar235 = auVar30._0_4_;
                if (fVar235 < 0.0) {
                  local_a80._0_16_ = auVar31;
                  local_a40._0_4_ = fVar274;
                  local_aa0._0_4_ = fVar265;
                  local_ac0._0_4_ = fVar277;
                  fVar236 = sqrtf(fVar235);
                  fVar265 = (float)local_aa0._0_4_;
                  fVar274 = (float)local_a40._0_4_;
                  fVar277 = (float)local_ac0._0_4_;
                  fVar217 = (float)local_a80._0_4_;
                }
                else {
                  auVar31 = vsqrtss_avx(auVar30,auVar30);
                  fVar236 = auVar31._0_4_;
                }
                auVar372 = ZEXT464((uint)fVar237);
                auVar31 = vshufps_avx(ZEXT416((uint)(fVar274 * 0.5)),ZEXT416((uint)(fVar274 * 0.5)),
                                      0);
                auVar117 = ZEXT416((uint)((fVar265 + fVar277 * 4.0) * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar147 = ZEXT416((uint)((fVar217 * -fVar217 - fVar277 * 4.0) * 0.5));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar116 = ZEXT416((uint)(fVar237 * -fVar237 * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar312._0_4_ =
                     (float)local_9c0._0_4_ * auVar116._0_4_ +
                     (float)local_9e0._0_4_ * auVar147._0_4_ +
                     (float)local_8c0._0_4_ * auVar31._0_4_ +
                     (float)local_8a0._0_4_ * auVar117._0_4_;
                auVar312._4_4_ =
                     (float)local_9c0._4_4_ * auVar116._4_4_ +
                     (float)local_9e0._4_4_ * auVar147._4_4_ +
                     (float)local_8c0._4_4_ * auVar31._4_4_ +
                     (float)local_8a0._4_4_ * auVar117._4_4_;
                auVar312._8_4_ =
                     fStack_9b8 * auVar116._8_4_ +
                     fStack_9d8 * auVar147._8_4_ +
                     fStack_8b8 * auVar31._8_4_ + fStack_898 * auVar117._8_4_;
                auVar312._12_4_ =
                     fStack_9b4 * auVar116._12_4_ +
                     fStack_9d4 * auVar147._12_4_ +
                     fStack_8b4 * auVar31._12_4_ + fStack_894 * auVar117._12_4_;
                auVar31 = vshufps_avx(auVar201,auVar201,0x55);
                auVar117 = ZEXT416((uint)(fVar237 - (fVar217 + fVar217)));
                auVar147 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)(fVar217 - (fVar237 + fVar237)));
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar368 = ZEXT416((uint)fVar237);
                auVar32 = vshufps_avx(auVar368,auVar368,0);
                auVar117 = vdpps_avx(auVar312,auVar312,0x7f);
                auVar152._0_4_ =
                     (float)local_9c0._0_4_ * auVar32._0_4_ +
                     (float)local_9e0._0_4_ * auVar116._0_4_ +
                     (float)local_8c0._0_4_ * auVar31._0_4_ +
                     (float)local_8a0._0_4_ * auVar147._0_4_;
                auVar152._4_4_ =
                     (float)local_9c0._4_4_ * auVar32._4_4_ +
                     (float)local_9e0._4_4_ * auVar116._4_4_ +
                     (float)local_8c0._4_4_ * auVar31._4_4_ +
                     (float)local_8a0._4_4_ * auVar147._4_4_;
                auVar152._8_4_ =
                     fStack_9b8 * auVar32._8_4_ +
                     fStack_9d8 * auVar116._8_4_ +
                     fStack_8b8 * auVar31._8_4_ + fStack_898 * auVar147._8_4_;
                auVar152._12_4_ =
                     fStack_9b4 * auVar32._12_4_ +
                     fStack_9d4 * auVar116._12_4_ +
                     fStack_8b4 * auVar31._12_4_ + fStack_894 * auVar147._12_4_;
                auVar31 = vblendps_avx(auVar117,_DAT_01f45a50,0xe);
                auVar147 = vrsqrtss_avx(auVar31,auVar31);
                fVar265 = auVar147._0_4_;
                fVar217 = auVar117._0_4_;
                auVar147 = vdpps_avx(auVar312,auVar152,0x7f);
                auVar116 = vshufps_avx(auVar117,auVar117,0);
                auVar153._0_4_ = auVar152._0_4_ * auVar116._0_4_;
                auVar153._4_4_ = auVar152._4_4_ * auVar116._4_4_;
                auVar153._8_4_ = auVar152._8_4_ * auVar116._8_4_;
                auVar153._12_4_ = auVar152._12_4_ * auVar116._12_4_;
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                auVar224._0_4_ = auVar312._0_4_ * auVar147._0_4_;
                auVar224._4_4_ = auVar312._4_4_ * auVar147._4_4_;
                auVar224._8_4_ = auVar312._8_4_ * auVar147._8_4_;
                auVar224._12_4_ = auVar312._12_4_ * auVar147._12_4_;
                auVar32 = vsubps_avx(auVar153,auVar224);
                auVar147 = vrcpss_avx(auVar31,auVar31);
                auVar31 = vmaxss_avx(ZEXT416((uint)local_900),
                                     ZEXT416((uint)(auVar359._0_4_ * (float)local_980._0_4_)));
                auVar394 = ZEXT1664(auVar31);
                auVar147 = ZEXT416((uint)(auVar147._0_4_ * (2.0 - fVar217 * auVar147._0_4_)));
                auVar147 = vshufps_avx(auVar147,auVar147,0);
                uVar103 = CONCAT44(auVar312._4_4_,auVar312._0_4_);
                auVar246._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar246._8_4_ = -auVar312._8_4_;
                auVar246._12_4_ = -auVar312._12_4_;
                auVar116 = ZEXT416((uint)(fVar265 * 1.5 +
                                         fVar217 * -0.5 * fVar265 * fVar265 * fVar265));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar205._0_4_ = auVar116._0_4_ * auVar32._0_4_ * auVar147._0_4_;
                auVar205._4_4_ = auVar116._4_4_ * auVar32._4_4_ * auVar147._4_4_;
                auVar205._8_4_ = auVar116._8_4_ * auVar32._8_4_ * auVar147._8_4_;
                auVar205._12_4_ = auVar116._12_4_ * auVar32._12_4_ * auVar147._12_4_;
                auVar269._0_4_ = auVar312._0_4_ * auVar116._0_4_;
                auVar269._4_4_ = auVar312._4_4_ * auVar116._4_4_;
                auVar269._8_4_ = auVar312._8_4_ * auVar116._8_4_;
                auVar269._12_4_ = auVar312._12_4_ * auVar116._12_4_;
                local_a80._0_4_ = auVar31._0_4_;
                if (fVar217 < 0.0) {
                  local_a40._0_4_ = fVar236;
                  local_aa0._0_16_ = auVar246;
                  local_ac0._0_16_ = auVar269;
                  local_9a0._0_16_ = auVar205;
                  auVar372 = ZEXT1664(auVar368);
                  fVar217 = sqrtf(fVar217);
                  auVar394 = ZEXT464((uint)local_a80._0_4_);
                  auVar205 = local_9a0._0_16_;
                  auVar246 = local_aa0._0_16_;
                  auVar269 = local_ac0._0_16_;
                }
                else {
                  auVar31 = vsqrtss_avx(auVar117,auVar117);
                  fVar217 = auVar31._0_4_;
                  local_a40._0_4_ = fVar236;
                }
                auVar31 = vdpps_avx(_local_ae0,auVar269,0x7f);
                fVar217 = (local_900 / fVar217) * ((float)local_a40._0_4_ + 1.0) +
                          auVar394._0_4_ + (float)local_a40._0_4_ * local_900;
                auVar117 = vdpps_avx(auVar246,auVar269,0x7f);
                auVar147 = vdpps_avx(_local_ae0,auVar205,0x7f);
                auVar97._4_4_ = fStack_8dc;
                auVar97._0_4_ = local_8e0;
                auVar97._8_4_ = fStack_8d8;
                auVar97._12_4_ = aStack_8d4.a;
                auVar116 = vdpps_avx(auVar97,auVar269,0x7f);
                auVar32 = vdpps_avx(_local_ae0,auVar246,0x7f);
                fVar265 = auVar117._0_4_ + auVar147._0_4_;
                fVar274 = auVar31._0_4_;
                auVar121._0_4_ = fVar274 * fVar274;
                auVar121._4_4_ = auVar31._4_4_ * auVar31._4_4_;
                auVar121._8_4_ = auVar31._8_4_ * auVar31._8_4_;
                auVar121._12_4_ = auVar31._12_4_ * auVar31._12_4_;
                auVar147 = vsubps_avx(auVar30,auVar121);
                local_a40._0_16_ = ZEXT416((uint)fVar265);
                auVar117 = vdpps_avx(_local_ae0,auVar97,0x7f);
                fVar236 = auVar32._0_4_ - fVar274 * fVar265;
                fVar274 = auVar117._0_4_ - fVar274 * auVar116._0_4_;
                auVar117 = vrsqrtss_avx(auVar147,auVar147);
                fVar277 = auVar147._0_4_;
                fVar265 = auVar117._0_4_;
                fVar265 = fVar265 * 1.5 + fVar277 * -0.5 * fVar265 * fVar265 * fVar265;
                if (fVar277 < 0.0) {
                  local_aa0._0_16_ = auVar31;
                  local_ac0._0_4_ = fVar217;
                  local_9a0._0_16_ = auVar116;
                  local_780._0_4_ = fVar236;
                  local_7a0._0_4_ = fVar274;
                  local_7c0._0_4_ = fVar265;
                  auVar372 = ZEXT1664(auVar372._0_16_);
                  fVar277 = sqrtf(fVar277);
                  auVar394 = ZEXT464((uint)local_a80._0_4_);
                  fVar265 = (float)local_7c0._0_4_;
                  fVar236 = (float)local_780._0_4_;
                  fVar274 = (float)local_7a0._0_4_;
                  auVar116 = local_9a0._0_16_;
                  auVar31 = local_aa0._0_16_;
                  fVar217 = (float)local_ac0._0_4_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar147,auVar147);
                  fVar277 = auVar117._0_4_;
                }
                auVar416 = ZEXT3264(local_a60);
                auVar32 = vpermilps_avx(local_920._0_16_,0xff);
                auVar368 = vshufps_avx(auVar312,auVar312,0xff);
                fVar237 = fVar236 * fVar265 - auVar368._0_4_;
                auVar225._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar225._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar225._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar247._0_4_ = -fVar237;
                auVar247._4_4_ = 0x80000000;
                auVar247._8_4_ = 0x80000000;
                auVar247._12_4_ = 0x80000000;
                auVar347 = ZEXT1664(local_a40._0_16_);
                fVar236 = local_a40._0_4_ * fVar274 * fVar265;
                auVar273 = ZEXT464((uint)fVar236);
                auVar117 = vinsertps_avx(auVar247,ZEXT416((uint)(fVar274 * fVar265)),0x1c);
                auVar116 = vmovsldup_avx(ZEXT416((uint)(fVar236 - auVar116._0_4_ * fVar237)));
                auVar117 = vdivps_avx(auVar117,auVar116);
                auVar147 = vinsertps_avx(local_a40._0_16_,auVar225,0x10);
                auVar147 = vdivps_avx(auVar147,auVar116);
                auVar116 = vmovsldup_avx(auVar31);
                auVar119 = ZEXT416((uint)(fVar277 - auVar32._0_4_));
                auVar32 = vmovsldup_avx(auVar119);
                auVar182._0_4_ = auVar116._0_4_ * auVar117._0_4_ + auVar32._0_4_ * auVar147._0_4_;
                auVar182._4_4_ = auVar116._4_4_ * auVar117._4_4_ + auVar32._4_4_ * auVar147._4_4_;
                auVar182._8_4_ = auVar116._8_4_ * auVar117._8_4_ + auVar32._8_4_ * auVar147._8_4_;
                auVar182._12_4_ =
                     auVar116._12_4_ * auVar117._12_4_ + auVar32._12_4_ * auVar147._12_4_;
                auVar117 = vsubps_avx(auVar201,auVar182);
                auVar359 = ZEXT1664(auVar117);
                auVar183._8_4_ = 0x7fffffff;
                auVar183._0_8_ = 0x7fffffff7fffffff;
                auVar183._12_4_ = 0x7fffffff;
                auVar201 = vandps_avx(auVar31,auVar183);
              } while (fVar217 <= auVar201._0_4_);
              auVar206._8_4_ = 0x7fffffff;
              auVar206._0_8_ = 0x7fffffff7fffffff;
              auVar206._12_4_ = 0x7fffffff;
              auVar201 = vandps_avx(auVar119,auVar206);
            } while ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar394._0_4_ + fVar217 <=
                     auVar201._0_4_);
            fVar217 = auVar117._0_4_ + (float)local_880._0_4_;
            if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar217) {
              fVar265 = (ray->super_RayK<1>).tfar;
              auVar273 = ZEXT464((uint)fVar265);
              if (fVar217 <= fVar265) {
                auVar201 = vmovshdup_avx(auVar117);
                fVar274 = auVar201._0_4_;
                if ((0.0 <= fVar274) && (fVar274 <= 1.0)) {
                  auVar201 = vrsqrtss_avx(auVar30,auVar30);
                  fVar236 = auVar201._0_4_;
                  pGVar20 = (context->scene->geometries).items[uVar106].ptr;
                  if ((pGVar20->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar201 = ZEXT416((uint)(fVar236 * 1.5 +
                                             fVar235 * -0.5 * fVar236 * fVar236 * fVar236));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar207._0_4_ = auVar201._0_4_ * (float)local_ae0._0_4_;
                    auVar207._4_4_ = auVar201._4_4_ * (float)local_ae0._4_4_;
                    auVar207._8_4_ = auVar201._8_4_ * fStack_ad8;
                    auVar207._12_4_ = auVar201._12_4_ * fStack_ad4;
                    auVar154._0_4_ = auVar312._0_4_ + auVar368._0_4_ * auVar207._0_4_;
                    auVar154._4_4_ = auVar312._4_4_ + auVar368._4_4_ * auVar207._4_4_;
                    auVar154._8_4_ = auVar312._8_4_ + auVar368._8_4_ * auVar207._8_4_;
                    auVar154._12_4_ = auVar312._12_4_ + auVar368._12_4_ * auVar207._12_4_;
                    auVar201 = vshufps_avx(auVar207,auVar207,0xc9);
                    auVar30 = vshufps_avx(auVar312,auVar312,0xc9);
                    auVar208._0_4_ = auVar30._0_4_ * auVar207._0_4_;
                    auVar208._4_4_ = auVar30._4_4_ * auVar207._4_4_;
                    auVar208._8_4_ = auVar30._8_4_ * auVar207._8_4_;
                    auVar208._12_4_ = auVar30._12_4_ * auVar207._12_4_;
                    auVar226._0_4_ = auVar312._0_4_ * auVar201._0_4_;
                    auVar226._4_4_ = auVar312._4_4_ * auVar201._4_4_;
                    auVar226._8_4_ = auVar312._8_4_ * auVar201._8_4_;
                    auVar226._12_4_ = auVar312._12_4_ * auVar201._12_4_;
                    auVar31 = vsubps_avx(auVar226,auVar208);
                    auVar201 = vshufps_avx(auVar31,auVar31,0xc9);
                    auVar30 = vshufps_avx(auVar154,auVar154,0xc9);
                    auVar227._0_4_ = auVar30._0_4_ * auVar201._0_4_;
                    auVar227._4_4_ = auVar30._4_4_ * auVar201._4_4_;
                    auVar227._8_4_ = auVar30._8_4_ * auVar201._8_4_;
                    auVar227._12_4_ = auVar30._12_4_ * auVar201._12_4_;
                    auVar201 = vshufps_avx(auVar31,auVar31,0xd2);
                    auVar155._0_4_ = auVar154._0_4_ * auVar201._0_4_;
                    auVar155._4_4_ = auVar154._4_4_ * auVar201._4_4_;
                    auVar155._8_4_ = auVar154._8_4_ * auVar201._8_4_;
                    auVar155._12_4_ = auVar154._12_4_ * auVar201._12_4_;
                    auVar30 = vsubps_avx(auVar227,auVar155);
                    auVar201 = vshufps_avx(auVar30,auVar30,0xe9);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar217;
                      uVar8 = vmovlps_avx(auVar201);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar8;
                      (ray->Ng).field_0.field_0.z = auVar30._0_4_;
                      ray->u = fVar274;
                      ray->v = 0.0;
                      ray->primID = local_960._0_4_;
                      ray->geomID = uVar106;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                    }
                    else {
                      local_a10 = vmovlps_avx(auVar201);
                      local_a08 = auVar30._0_4_;
                      local_a04 = fVar274;
                      local_a00 = 0;
                      local_9fc = local_960._0_4_;
                      local_9f8 = uVar106;
                      local_9f4 = context->user->instID[0];
                      local_9f0 = context->user->instPrimID[0];
                      (ray->super_RayK<1>).tfar = fVar217;
                      local_ae4 = -1;
                      local_b18.valid = &local_ae4;
                      local_b18.geometryUserPtr = pGVar20->userPtr;
                      local_b18.context = context->user;
                      local_b18.hit = (RTCHitN *)&local_a10;
                      local_b18.N = 1;
                      local_b18.ray = (RTCRayN *)ray;
                      if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00acaf31:
                        p_Var25 = context->args->filter;
                        if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar273 = ZEXT1664(auVar273._0_16_);
                          auVar347 = ZEXT1664(auVar347._0_16_);
                          auVar359 = ZEXT1664(auVar359._0_16_);
                          auVar372 = ZEXT1664(auVar372._0_16_);
                          auVar394 = ZEXT1664(auVar394._0_16_);
                          (*p_Var25)(&local_b18);
                          auVar416 = ZEXT3264(local_a60);
                          if (*local_b18.valid == 0) goto LAB_00acafd1;
                        }
                        (((Vec3f *)((long)local_b18.ray + 0x30))->field_0).components[0] =
                             *(float *)local_b18.hit;
                        (((Vec3f *)((long)local_b18.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_b18.hit + 4);
                        (((Vec3f *)((long)local_b18.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_b18.hit + 8);
                        *(float *)((long)local_b18.ray + 0x3c) = *(float *)(local_b18.hit + 0xc);
                        *(float *)((long)local_b18.ray + 0x40) = *(float *)(local_b18.hit + 0x10);
                        *(float *)((long)local_b18.ray + 0x44) = *(float *)(local_b18.hit + 0x14);
                        *(float *)((long)local_b18.ray + 0x48) = *(float *)(local_b18.hit + 0x18);
                        *(float *)((long)local_b18.ray + 0x4c) = *(float *)(local_b18.hit + 0x1c);
                        *(float *)((long)local_b18.ray + 0x50) = *(float *)(local_b18.hit + 0x20);
                      }
                      else {
                        auVar273 = ZEXT464((uint)fVar265);
                        auVar347 = ZEXT1664(local_a40._0_16_);
                        auVar359 = ZEXT1664(auVar117);
                        auVar372 = ZEXT1664(auVar372._0_16_);
                        auVar394 = ZEXT1664(auVar394._0_16_);
                        (*pGVar20->intersectionFilterN)(&local_b18);
                        auVar416 = ZEXT3264(local_a60);
                        if (*local_b18.valid != 0) goto LAB_00acaf31;
LAB_00acafd1:
                        (ray->super_RayK<1>).tfar = fVar265;
                      }
                    }
                  }
                }
              }
            }
LAB_00acae15:
            fVar217 = (ray->super_RayK<1>).tfar;
            auVar169._4_4_ = fVar217;
            auVar169._0_4_ = fVar217;
            auVar169._8_4_ = fVar217;
            auVar169._12_4_ = fVar217;
            auVar169._16_4_ = fVar217;
            auVar169._20_4_ = fVar217;
            auVar169._24_4_ = fVar217;
            auVar169._28_4_ = fVar217;
            auVar124 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
            auVar163 = vcmpps_avx(_local_820,auVar169,2);
            auVar163 = vandps_avx(auVar163,local_720);
          }
          auVar163 = vandps_avx(local_6c0,local_6a0);
          auVar26 = vandps_avx(_local_860,_local_840);
          auVar232._0_4_ = local_940._0_4_ + local_5e0._0_4_;
          auVar232._4_4_ = local_940._4_4_ + local_5e0._4_4_;
          auVar232._8_4_ = local_940._8_4_ + local_5e0._8_4_;
          auVar232._12_4_ = local_940._12_4_ + local_5e0._12_4_;
          auVar232._16_4_ = local_940._16_4_ + local_5e0._16_4_;
          auVar232._20_4_ = local_940._20_4_ + local_5e0._20_4_;
          auVar232._24_4_ = local_940._24_4_ + local_5e0._24_4_;
          auVar232._28_4_ = local_940._28_4_ + local_5e0._28_4_;
          auVar201 = vshufps_avx(auVar124._0_16_,auVar124._0_16_,0);
          auVar255._16_16_ = auVar201;
          auVar255._0_16_ = auVar201;
          auVar257 = ZEXT3264(auVar255);
          auVar124 = vcmpps_avx(auVar232,auVar255,2);
          auVar124 = vandps_avx(auVar124,auVar163);
          auVar233._0_4_ = local_940._0_4_ + local_620._0_4_;
          auVar233._4_4_ = local_940._4_4_ + local_620._4_4_;
          auVar233._8_4_ = local_940._8_4_ + local_620._8_4_;
          auVar233._12_4_ = local_940._12_4_ + local_620._12_4_;
          auVar233._16_4_ = local_940._16_4_ + local_620._16_4_;
          auVar233._20_4_ = local_940._20_4_ + local_620._20_4_;
          auVar233._24_4_ = local_940._24_4_ + local_620._24_4_;
          auVar233._28_4_ = local_940._28_4_ + local_620._28_4_;
          auVar163 = vcmpps_avx(auVar233,auVar255,2);
          auVar163 = vandps_avx(auVar163,auVar26);
          auVar163 = vorps_avx(auVar124,auVar163);
          if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar163 >> 0x7f,0) != '\0') ||
                (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar163 >> 0xbf,0) != '\0') ||
              (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar163[0x1f] < '\0') {
            uVar104 = (ulong)uVar105;
            *(undefined1 (*) [32])(auStack_180 + uVar104 * 0x60) = auVar163;
            auVar124 = vblendvps_avx(_local_620,local_5e0,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar104 * 0x60) = auVar124;
            uVar103 = vmovlps_avx(local_630);
            (&uStack_140)[uVar104 * 0xc] = uVar103;
            auStack_138[uVar104 * 0x18] = local_b8c + 1;
            uVar105 = uVar105 + 1;
          }
          goto LAB_00ac991e;
        }
      }
      auVar416 = ZEXT3264(local_a60);
      auVar301 = ZEXT3264(local_940);
    }
LAB_00ac991e:
    fVar217 = (ray->super_RayK<1>).tfar;
    auVar134._4_4_ = fVar217;
    auVar134._0_4_ = fVar217;
    auVar134._8_4_ = fVar217;
    auVar134._12_4_ = fVar217;
    auVar134._16_4_ = fVar217;
    auVar134._20_4_ = fVar217;
    auVar134._24_4_ = fVar217;
    auVar134._28_4_ = fVar217;
    do {
      uVar107 = uVar105;
      if (uVar107 == 0) {
        auVar124 = vcmpps_avx(local_360,auVar134,2);
        uVar106 = vmovmskps_avx(auVar124);
        uVar102 = (ulong)((uint)uVar102 - 1 & (uint)uVar102 & uVar106);
        goto LAB_00ac87d5;
      }
      uVar103 = (ulong)(uVar107 - 1);
      lVar110 = uVar103 * 0x60;
      auVar124 = *(undefined1 (*) [32])(auStack_160 + lVar110);
      auVar162._0_4_ = auVar301._0_4_ + auVar124._0_4_;
      auVar162._4_4_ = auVar301._4_4_ + auVar124._4_4_;
      auVar162._8_4_ = auVar301._8_4_ + auVar124._8_4_;
      auVar162._12_4_ = auVar301._12_4_ + auVar124._12_4_;
      auVar162._16_4_ = auVar301._16_4_ + auVar124._16_4_;
      auVar162._20_4_ = auVar301._20_4_ + auVar124._20_4_;
      auVar162._24_4_ = auVar301._24_4_ + auVar124._24_4_;
      auVar162._28_4_ = auVar301._28_4_ + auVar124._28_4_;
      auVar26 = vcmpps_avx(auVar162,auVar134,2);
      auVar163 = vandps_avx(auVar26,*(undefined1 (*) [32])(auStack_180 + lVar110));
      local_5e0 = auVar163;
      auVar26 = *(undefined1 (*) [32])(auStack_180 + lVar110) & auVar26;
      uVar105 = uVar107 - 1;
    } while ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar26 >> 0x7f,0) == '\0') &&
               (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar26 >> 0xbf,0) == '\0') &&
             (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar26[0x1f]);
    auVar135._8_4_ = 0x7f800000;
    auVar135._0_8_ = 0x7f8000007f800000;
    auVar135._12_4_ = 0x7f800000;
    auVar135._16_4_ = 0x7f800000;
    auVar135._20_4_ = 0x7f800000;
    auVar135._24_4_ = 0x7f800000;
    auVar135._28_4_ = 0x7f800000;
    auVar124 = vblendvps_avx(auVar135,auVar124,auVar163);
    auVar26 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar26 = vminps_avx(auVar124,auVar26);
    auVar356 = vshufpd_avx(auVar26,auVar26,5);
    auVar26 = vminps_avx(auVar26,auVar356);
    auVar356 = vperm2f128_avx(auVar26,auVar26,1);
    auVar26 = vminps_avx(auVar26,auVar356);
    auVar124 = vcmpps_avx(auVar124,auVar26,0);
    auVar26 = auVar163 & auVar124;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar163 = vandps_avx(auVar124,auVar163);
    }
    auVar114._8_8_ = 0;
    auVar114._0_8_ = (&uStack_140)[uVar103 * 0xc];
    local_b8c = auStack_138[uVar103 * 0x18];
    uVar105 = vmovmskps_avx(auVar163);
    uVar101 = 0;
    if (uVar105 != 0) {
      for (; (uVar105 >> uVar101 & 1) == 0; uVar101 = uVar101 + 1) {
      }
    }
    *(undefined4 *)(local_5e0 + (ulong)uVar101 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar110) = local_5e0;
    uVar105 = uVar107 - 1;
    if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5e0 >> 0x7f,0) != '\0') ||
          (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5e0 >> 0xbf,0) != '\0') ||
        (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5e0[0x1f] < '\0') {
      uVar105 = uVar107;
    }
    auVar201 = vshufps_avx(auVar114,auVar114,0);
    auVar30 = vshufps_avx(auVar114,auVar114,0x55);
    auVar30 = vsubps_avx(auVar30,auVar201);
    local_620._4_4_ = auVar201._4_4_ + auVar30._4_4_ * 0.14285715;
    local_620._0_4_ = auVar201._0_4_ + auVar30._0_4_ * 0.0;
    fStack_618 = auVar201._8_4_ + auVar30._8_4_ * 0.2857143;
    fStack_614 = auVar201._12_4_ + auVar30._12_4_ * 0.42857146;
    fStack_610 = auVar201._0_4_ + auVar30._0_4_ * 0.5714286;
    fStack_60c = auVar201._4_4_ + auVar30._4_4_ * 0.71428573;
    fStack_608 = auVar201._8_4_ + auVar30._8_4_ * 0.8571429;
    fStack_604 = auVar201._12_4_ + auVar30._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_620 + (ulong)uVar101 * 4);
    uVar103 = local_960._0_8_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }